

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined1 (*pauVar4) [28];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  Primitive PVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  RTCFilterFunctionN p_Var13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined8 uVar99;
  undefined8 uVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [28];
  undefined1 auVar105 [28];
  undefined1 auVar106 [28];
  undefined1 auVar107 [28];
  undefined1 auVar108 [28];
  undefined1 auVar109 [28];
  undefined1 auVar110 [24];
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  uint uVar115;
  uint uVar116;
  ulong uVar117;
  Geometry *pGVar118;
  long lVar119;
  ulong uVar120;
  float fVar121;
  float fVar140;
  float fVar141;
  vint4 bi_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar143;
  float fVar145;
  float fVar147;
  float fVar150;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar122;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar148;
  float fVar151;
  float fVar153;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar149;
  float fVar152;
  float fVar154;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar155;
  float fVar167;
  float fVar168;
  vint4 bi_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar192 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  undefined1 auVar185 [32];
  float fVar188;
  undefined1 auVar186 [32];
  float fVar189;
  float fVar200;
  float fVar201;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar193 [32];
  float fVar203;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  float fVar207;
  float fVar217;
  float fVar218;
  vint4 bi;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar210 [16];
  float fVar219;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar220;
  float fVar229;
  float fVar231;
  vint4 ai_2;
  undefined1 auVar222 [16];
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar221;
  undefined1 auVar225 [16];
  float fVar230;
  float fVar232;
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar235;
  float fVar236;
  float fVar242;
  float fVar244;
  undefined1 auVar237 [16];
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar248;
  undefined1 auVar241 [32];
  float fVar249;
  float fVar256;
  float fVar257;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [64];
  float fVar268;
  vint4 ai_1;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar272;
  undefined1 auVar264 [32];
  float fVar270;
  undefined1 auVar265 [32];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  float fVar274;
  float fVar275;
  float fVar281;
  float fVar283;
  undefined1 auVar276 [16];
  float fVar282;
  float fVar284;
  float fVar285;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar286;
  float fVar287;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar298;
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  float fVar300;
  undefined1 auVar299 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  float fVar313;
  float fVar314;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar315;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar316;
  undefined1 auVar317 [32];
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar318 [64];
  float fVar322;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [16];
  Precalculations *local_830;
  Primitive *local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [8];
  float fStack_788;
  float fStack_784;
  RayQueryContext *local_778;
  undefined1 (*local_770) [16];
  RayHitK<4> *local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  undefined1 auStack_730 [8];
  float fStack_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  float fStack_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  LinearSpace3fa *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 auStack_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  PVar9 = prim[1];
  uVar117 = (ulong)(byte)PVar9;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar225 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar225 = vinsertps_avx(auVar225,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar220 = *(float *)(prim + uVar117 * 0x19 + 0x12);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar117 * 0x19 + 6));
  auVar174._0_4_ = fVar220 * auVar16._0_4_;
  auVar174._4_4_ = fVar220 * auVar16._4_4_;
  auVar174._8_4_ = fVar220 * auVar16._8_4_;
  auVar174._12_4_ = fVar220 * auVar16._12_4_;
  auVar250._0_4_ = fVar220 * auVar225._0_4_;
  auVar250._4_4_ = fVar220 * auVar225._4_4_;
  auVar250._8_4_ = fVar220 * auVar225._8_4_;
  auVar250._12_4_ = fVar220 * auVar225._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 4 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 5 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 6 + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0xb + 6)));
  auVar211 = vcvtdq2ps_avx(auVar211);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar117 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar120 = (ulong)(uint)((int)(uVar117 * 9) * 2);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 + uVar117 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  uVar120 = (ulong)(uint)((int)(uVar117 * 5) << 2);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar123 = vshufps_avx(auVar250,auVar250,0);
  auVar156 = vshufps_avx(auVar250,auVar250,0x55);
  auVar175 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar220 = auVar175._0_4_;
  fVar189 = auVar175._4_4_;
  fVar229 = auVar175._8_4_;
  fVar200 = auVar175._12_4_;
  fVar235 = auVar156._0_4_;
  fVar242 = auVar156._4_4_;
  fVar244 = auVar156._8_4_;
  fVar246 = auVar156._12_4_;
  fVar231 = auVar123._0_4_;
  fVar201 = auVar123._4_4_;
  fVar233 = auVar123._8_4_;
  fVar202 = auVar123._12_4_;
  auVar301._0_4_ = fVar231 * auVar16._0_4_ + fVar235 * auVar225._0_4_ + fVar220 * auVar181._0_4_;
  auVar301._4_4_ = fVar201 * auVar16._4_4_ + fVar242 * auVar225._4_4_ + fVar189 * auVar181._4_4_;
  auVar301._8_4_ = fVar233 * auVar16._8_4_ + fVar244 * auVar225._8_4_ + fVar229 * auVar181._8_4_;
  auVar301._12_4_ = fVar202 * auVar16._12_4_ + fVar246 * auVar225._12_4_ + fVar200 * auVar181._12_4_
  ;
  auVar308._0_4_ = fVar231 * auVar211._0_4_ + fVar235 * auVar192._0_4_ + auVar18._0_4_ * fVar220;
  auVar308._4_4_ = fVar201 * auVar211._4_4_ + fVar242 * auVar192._4_4_ + auVar18._4_4_ * fVar189;
  auVar308._8_4_ = fVar233 * auVar211._8_4_ + fVar244 * auVar192._8_4_ + auVar18._8_4_ * fVar229;
  auVar308._12_4_ = fVar202 * auVar211._12_4_ + fVar246 * auVar192._12_4_ + auVar18._12_4_ * fVar200
  ;
  auVar251._0_4_ = fVar231 * auVar124._0_4_ + fVar235 * auVar125._0_4_ + auVar157._0_4_ * fVar220;
  auVar251._4_4_ = fVar201 * auVar124._4_4_ + fVar242 * auVar125._4_4_ + auVar157._4_4_ * fVar189;
  auVar251._8_4_ = fVar233 * auVar124._8_4_ + fVar244 * auVar125._8_4_ + auVar157._8_4_ * fVar229;
  auVar251._12_4_ =
       fVar202 * auVar124._12_4_ + fVar246 * auVar125._12_4_ + auVar157._12_4_ * fVar200;
  auVar123 = vshufps_avx(auVar174,auVar174,0);
  auVar156 = vshufps_avx(auVar174,auVar174,0x55);
  auVar318 = ZEXT1664(auVar156);
  auVar175 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar220 = auVar175._0_4_;
  fVar189 = auVar175._4_4_;
  fVar229 = auVar175._8_4_;
  fVar200 = auVar175._12_4_;
  fVar235 = auVar156._0_4_;
  fVar242 = auVar156._4_4_;
  fVar244 = auVar156._8_4_;
  fVar246 = auVar156._12_4_;
  fVar231 = auVar123._0_4_;
  fVar201 = auVar123._4_4_;
  fVar233 = auVar123._8_4_;
  fVar202 = auVar123._12_4_;
  auVar208._0_4_ = fVar231 * auVar16._0_4_ + fVar235 * auVar225._0_4_ + fVar220 * auVar181._0_4_;
  auVar208._4_4_ = fVar201 * auVar16._4_4_ + fVar242 * auVar225._4_4_ + fVar189 * auVar181._4_4_;
  auVar208._8_4_ = fVar233 * auVar16._8_4_ + fVar244 * auVar225._8_4_ + fVar229 * auVar181._8_4_;
  auVar208._12_4_ = fVar202 * auVar16._12_4_ + fVar246 * auVar225._12_4_ + fVar200 * auVar181._12_4_
  ;
  auVar156._0_4_ = fVar231 * auVar211._0_4_ + auVar18._0_4_ * fVar220 + fVar235 * auVar192._0_4_;
  auVar156._4_4_ = fVar201 * auVar211._4_4_ + auVar18._4_4_ * fVar189 + fVar242 * auVar192._4_4_;
  auVar156._8_4_ = fVar233 * auVar211._8_4_ + auVar18._8_4_ * fVar229 + fVar244 * auVar192._8_4_;
  auVar156._12_4_ = fVar202 * auVar211._12_4_ + auVar18._12_4_ * fVar200 + fVar246 * auVar192._12_4_
  ;
  auVar123._0_4_ = fVar231 * auVar124._0_4_ + fVar235 * auVar125._0_4_ + auVar157._0_4_ * fVar220;
  auVar123._4_4_ = fVar201 * auVar124._4_4_ + fVar242 * auVar125._4_4_ + auVar157._4_4_ * fVar189;
  auVar123._8_4_ = fVar233 * auVar124._8_4_ + fVar244 * auVar125._8_4_ + auVar157._8_4_ * fVar229;
  auVar123._12_4_ =
       fVar202 * auVar124._12_4_ + fVar246 * auVar125._12_4_ + auVar157._12_4_ * fVar200;
  auVar237._8_4_ = 0x7fffffff;
  auVar237._0_8_ = 0x7fffffff7fffffff;
  auVar237._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar301,auVar237);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar190,1);
  auVar225 = vblendvps_avx(auVar301,auVar190,auVar16);
  auVar16 = vandps_avx(auVar308,auVar237);
  auVar16 = vcmpps_avx(auVar16,auVar190,1);
  auVar181 = vblendvps_avx(auVar308,auVar190,auVar16);
  auVar16 = vandps_avx(auVar251,auVar237);
  auVar16 = vcmpps_avx(auVar16,auVar190,1);
  auVar16 = vblendvps_avx(auVar251,auVar190,auVar16);
  auVar211 = vrcpps_avx(auVar225);
  fVar235 = auVar211._0_4_;
  auVar175._0_4_ = fVar235 * auVar225._0_4_;
  fVar242 = auVar211._4_4_;
  auVar175._4_4_ = fVar242 * auVar225._4_4_;
  fVar244 = auVar211._8_4_;
  auVar175._8_4_ = fVar244 * auVar225._8_4_;
  fVar246 = auVar211._12_4_;
  auVar175._12_4_ = fVar246 * auVar225._12_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar225 = vsubps_avx(auVar252,auVar175);
  fVar235 = fVar235 + fVar235 * auVar225._0_4_;
  fVar242 = fVar242 + fVar242 * auVar225._4_4_;
  fVar244 = fVar244 + fVar244 * auVar225._8_4_;
  fVar246 = fVar246 + fVar246 * auVar225._12_4_;
  auVar225 = vrcpps_avx(auVar181);
  fVar220 = auVar225._0_4_;
  auVar222._0_4_ = fVar220 * auVar181._0_4_;
  fVar229 = auVar225._4_4_;
  auVar222._4_4_ = fVar229 * auVar181._4_4_;
  fVar231 = auVar225._8_4_;
  auVar222._8_4_ = fVar231 * auVar181._8_4_;
  fVar233 = auVar225._12_4_;
  auVar222._12_4_ = fVar233 * auVar181._12_4_;
  auVar225 = vsubps_avx(auVar252,auVar222);
  fVar220 = fVar220 + fVar220 * auVar225._0_4_;
  fVar229 = fVar229 + fVar229 * auVar225._4_4_;
  fVar231 = fVar231 + fVar231 * auVar225._8_4_;
  fVar233 = fVar233 + fVar233 * auVar225._12_4_;
  auVar225 = vrcpps_avx(auVar16);
  fVar189 = auVar225._0_4_;
  auVar191._0_4_ = fVar189 * auVar16._0_4_;
  fVar200 = auVar225._4_4_;
  auVar191._4_4_ = fVar200 * auVar16._4_4_;
  fVar201 = auVar225._8_4_;
  auVar191._8_4_ = fVar201 * auVar16._8_4_;
  fVar202 = auVar225._12_4_;
  auVar191._12_4_ = fVar202 * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar252,auVar191);
  fVar189 = fVar189 + fVar189 * auVar16._0_4_;
  fVar200 = fVar200 + fVar200 * auVar16._4_4_;
  fVar201 = fVar201 + fVar201 * auVar16._8_4_;
  fVar202 = fVar202 + fVar202 * auVar16._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar117 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar208);
  auVar176._0_4_ = fVar235 * auVar16._0_4_;
  auVar176._4_4_ = fVar242 * auVar16._4_4_;
  auVar176._8_4_ = fVar244 * auVar16._8_4_;
  auVar176._12_4_ = fVar246 * auVar16._12_4_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar117 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar225);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar208);
  auVar209._0_4_ = fVar235 * auVar16._0_4_;
  auVar209._4_4_ = fVar242 * auVar16._4_4_;
  auVar209._8_4_ = fVar244 * auVar16._8_4_;
  auVar209._12_4_ = fVar246 * auVar16._12_4_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar225 = vpmovsxwd_avx(auVar181);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar117 * -2 + 6);
  auVar16 = vpmovsxwd_avx(auVar211);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar156);
  auVar262._0_4_ = auVar16._0_4_ * fVar220;
  auVar262._4_4_ = auVar16._4_4_ * fVar229;
  auVar262._8_4_ = auVar16._8_4_ * fVar231;
  auVar262._12_4_ = auVar16._12_4_ * fVar233;
  auVar16 = vcvtdq2ps_avx(auVar225);
  auVar16 = vsubps_avx(auVar16,auVar156);
  auVar157._0_4_ = fVar220 * auVar16._0_4_;
  auVar157._4_4_ = fVar229 * auVar16._4_4_;
  auVar157._8_4_ = fVar231 * auVar16._8_4_;
  auVar157._12_4_ = fVar233 * auVar16._12_4_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar120 + uVar117 + 6);
  auVar16 = vpmovsxwd_avx(auVar192);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar123);
  auVar223._0_4_ = auVar16._0_4_ * fVar189;
  auVar223._4_4_ = auVar16._4_4_ * fVar200;
  auVar223._8_4_ = auVar16._8_4_ * fVar201;
  auVar223._12_4_ = auVar16._12_4_ * fVar202;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar117 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar123);
  auVar124._0_4_ = auVar16._0_4_ * fVar189;
  auVar124._4_4_ = auVar16._4_4_ * fVar200;
  auVar124._8_4_ = auVar16._8_4_ * fVar201;
  auVar124._12_4_ = auVar16._12_4_ * fVar202;
  auVar16 = vpminsd_avx(auVar176,auVar209);
  auVar225 = vpminsd_avx(auVar262,auVar157);
  auVar16 = vmaxps_avx(auVar16,auVar225);
  auVar225 = vpminsd_avx(auVar223,auVar124);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar276._4_4_ = uVar8;
  auVar276._0_4_ = uVar8;
  auVar276._8_4_ = uVar8;
  auVar276._12_4_ = uVar8;
  auVar225 = vmaxps_avx(auVar225,auVar276);
  auVar16 = vmaxps_avx(auVar16,auVar225);
  local_2f0._0_4_ = auVar16._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar16._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar16._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar176,auVar209);
  auVar225 = vpmaxsd_avx(auVar262,auVar157);
  auVar16 = vminps_avx(auVar16,auVar225);
  auVar225 = vpmaxsd_avx(auVar223,auVar124);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar177._4_4_ = uVar8;
  auVar177._0_4_ = uVar8;
  auVar177._8_4_ = uVar8;
  auVar177._12_4_ = uVar8;
  auVar225 = vminps_avx(auVar225,auVar177);
  auVar16 = vminps_avx(auVar16,auVar225);
  auVar125._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar125._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar125._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar125._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar225 = vpcmpgtd_avx(auVar16,_DAT_01f7fcf0);
  auVar16 = vcmpps_avx(local_2f0,auVar125,2);
  auVar16 = vandps_avx(auVar16,auVar225);
  uVar115 = vmovmskps_avx(auVar16);
  if (uVar115 != 0) {
    uVar115 = uVar115 & 0xff;
    local_5a0 = mm_lookupmask_ps._16_8_;
    uStack_598 = mm_lookupmask_ps._24_8_;
    uStack_590 = mm_lookupmask_ps._16_8_;
    uStack_588 = mm_lookupmask_ps._24_8_;
    local_5a8 = pre->ray_space + k;
    local_770 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_830 = pre;
    local_828 = prim;
    do {
      uVar120 = (ulong)uVar115;
      auVar132 = auVar318._0_32_;
      lVar15 = 0;
      if (uVar120 != 0) {
        for (; (uVar115 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      uVar120 = uVar120 - 1 & uVar120;
      uVar115 = *(uint *)(prim + 2);
      uVar10 = *(uint *)(prim + lVar15 * 4 + 6);
      pGVar118 = (context->scene->geometries).items[uVar115].ptr;
      uVar117 = (ulong)*(uint *)(*(long *)&pGVar118->field_0x58 +
                                pGVar118[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar10);
      p_Var13 = pGVar118[1].intersectionFilterN;
      lVar15 = *(long *)&pGVar118[1].time_range.upper;
      auVar16 = *(undefined1 (*) [16])(lVar15 + (long)p_Var13 * uVar117);
      pauVar1 = (undefined1 (*) [12])(lVar15 + (uVar117 + 1) * (long)p_Var13);
      uVar99 = *(undefined8 *)*pauVar1;
      uVar100 = *(undefined8 *)(*pauVar1 + 8);
      local_850 = (float)uVar99;
      fStack_84c = (float)((ulong)uVar99 >> 0x20);
      fStack_848 = (float)uVar100;
      fStack_844 = (float)((ulong)uVar100 >> 0x20);
      auVar225 = *(undefined1 (*) [16])(lVar15 + (uVar117 + 2) * (long)p_Var13);
      lVar119 = 0;
      if (uVar120 != 0) {
        for (; (uVar120 >> lVar119 & 1) == 0; lVar119 = lVar119 + 1) {
        }
      }
      auVar181 = *(undefined1 (*) [16])(lVar15 + (uVar117 + 3) * (long)p_Var13);
      if (((uVar120 != 0) && (uVar117 = uVar120 - 1 & uVar120, uVar117 != 0)) &&
         (lVar15 = 0, uVar117 != 0)) {
        for (; (uVar117 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      uVar11 = (uint)pGVar118[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar211 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar124 = vinsertps_avx(auVar211,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar18 = vsubps_avx(auVar16,auVar124);
      auVar211 = vshufps_avx(auVar18,auVar18,0);
      auVar192 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      fVar220 = (local_5a8->vx).field_0.m128[0];
      fVar189 = (local_5a8->vx).field_0.m128[1];
      fVar229 = (local_5a8->vx).field_0.m128[2];
      fVar200 = (local_5a8->vx).field_0.m128[3];
      fVar231 = (local_5a8->vy).field_0.m128[0];
      fVar201 = (local_5a8->vy).field_0.m128[1];
      fVar233 = (local_5a8->vy).field_0.m128[2];
      fVar202 = (local_5a8->vy).field_0.m128[3];
      fVar235 = (local_5a8->vz).field_0.m128[0];
      fVar242 = (local_5a8->vz).field_0.m128[1];
      fVar244 = (local_5a8->vz).field_0.m128[2];
      fVar246 = (local_5a8->vz).field_0.m128[3];
      auVar158._0_4_ = auVar211._0_4_ * fVar220 + auVar192._0_4_ * fVar231 + fVar235 * auVar18._0_4_
      ;
      auVar158._4_4_ = auVar211._4_4_ * fVar189 + auVar192._4_4_ * fVar201 + fVar242 * auVar18._4_4_
      ;
      auVar158._8_4_ = auVar211._8_4_ * fVar229 + auVar192._8_4_ * fVar233 + fVar244 * auVar18._8_4_
      ;
      auVar158._12_4_ =
           auVar211._12_4_ * fVar200 + auVar192._12_4_ * fVar202 + fVar246 * auVar18._12_4_;
      auVar211 = vblendps_avx(auVar158,auVar16,8);
      auVar102._12_4_ = fStack_844;
      auVar102._0_12_ = *pauVar1;
      auVar125 = vsubps_avx(auVar102,auVar124);
      auVar192 = vshufps_avx(auVar125,auVar125,0);
      auVar18 = vshufps_avx(auVar125,auVar125,0x55);
      auVar125 = vshufps_avx(auVar125,auVar125,0xaa);
      auVar309._0_4_ = auVar192._0_4_ * fVar220 + auVar18._0_4_ * fVar231 + fVar235 * auVar125._0_4_
      ;
      auVar309._4_4_ = auVar192._4_4_ * fVar189 + auVar18._4_4_ * fVar201 + fVar242 * auVar125._4_4_
      ;
      auVar309._8_4_ = auVar192._8_4_ * fVar229 + auVar18._8_4_ * fVar233 + fVar244 * auVar125._8_4_
      ;
      auVar309._12_4_ =
           auVar192._12_4_ * fVar200 + auVar18._12_4_ * fVar202 + fVar246 * auVar125._12_4_;
      auVar192 = vblendps_avx(auVar309,auVar102,8);
      auVar157 = vsubps_avx(auVar225,auVar124);
      auVar18 = vshufps_avx(auVar157,auVar157,0);
      auVar125 = vshufps_avx(auVar157,auVar157,0x55);
      auVar157 = vshufps_avx(auVar157,auVar157,0xaa);
      auVar224._0_4_ = auVar18._0_4_ * fVar220 + auVar125._0_4_ * fVar231 + fVar235 * auVar157._0_4_
      ;
      auVar224._4_4_ = auVar18._4_4_ * fVar189 + auVar125._4_4_ * fVar201 + fVar242 * auVar157._4_4_
      ;
      auVar224._8_4_ = auVar18._8_4_ * fVar229 + auVar125._8_4_ * fVar233 + fVar244 * auVar157._8_4_
      ;
      auVar224._12_4_ =
           auVar18._12_4_ * fVar200 + auVar125._12_4_ * fVar202 + fVar246 * auVar157._12_4_;
      auVar157 = vshufps_avx(auVar225,auVar225,0xff);
      auVar18 = vblendps_avx(auVar224,auVar225,8);
      auVar123 = vsubps_avx(auVar181,auVar124);
      auVar124 = vshufps_avx(auVar123,auVar123,0);
      auVar125 = vshufps_avx(auVar123,auVar123,0x55);
      auVar123 = vshufps_avx(auVar123,auVar123,0xaa);
      auVar263._0_4_ =
           auVar124._0_4_ * fVar220 + auVar125._0_4_ * fVar231 + fVar235 * auVar123._0_4_;
      auVar263._4_4_ =
           auVar124._4_4_ * fVar189 + auVar125._4_4_ * fVar201 + fVar242 * auVar123._4_4_;
      auVar263._8_4_ =
           auVar124._8_4_ * fVar229 + auVar125._8_4_ * fVar233 + fVar244 * auVar123._8_4_;
      auVar263._12_4_ =
           auVar124._12_4_ * fVar200 + auVar125._12_4_ * fVar202 + fVar246 * auVar123._12_4_;
      auVar123 = vshufps_avx(auVar181,auVar181,0xff);
      auVar124 = vblendps_avx(auVar263,auVar181,8);
      auVar210._8_4_ = 0x7fffffff;
      auVar210._0_8_ = 0x7fffffff7fffffff;
      auVar210._12_4_ = 0x7fffffff;
      auVar211 = vandps_avx(auVar211,auVar210);
      auVar192 = vandps_avx(auVar192,auVar210);
      auVar125 = vmaxps_avx(auVar211,auVar192);
      auVar211 = vandps_avx(auVar18,auVar210);
      auVar192 = vandps_avx(auVar124,auVar210);
      auVar211 = vmaxps_avx(auVar211,auVar192);
      auVar211 = vmaxps_avx(auVar125,auVar211);
      auVar192 = vmovshdup_avx(auVar211);
      auVar192 = vmaxss_avx(auVar192,auVar211);
      auVar211 = vshufpd_avx(auVar211,auVar211,1);
      auVar211 = vmaxss_avx(auVar211,auVar192);
      lVar15 = (long)(int)uVar11 * 0x44;
      fVar189 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar15 + 0x908);
      fVar229 = *(float *)(bspline_basis0 + lVar15 + 0x90c);
      fVar231 = *(float *)(bspline_basis0 + lVar15 + 0x910);
      fVar201 = *(float *)(bspline_basis0 + lVar15 + 0x914);
      fVar202 = *(float *)(bspline_basis0 + lVar15 + 0x918);
      fVar235 = *(float *)(bspline_basis0 + lVar15 + 0x91c);
      fVar244 = *(float *)(bspline_basis0 + lVar15 + 0x920);
      auVar105 = *(undefined1 (*) [28])(bspline_basis0 + lVar15 + 0x908);
      auVar192 = vshufps_avx(auVar224,auVar224,0);
      register0x00001450 = auVar192;
      _local_540 = auVar192;
      auVar18 = vshufps_avx(auVar224,auVar224,0x55);
      register0x00001390 = auVar18;
      _local_6c0 = auVar18;
      register0x00001490 = auVar157;
      _local_120 = auVar157;
      fVar246 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar15 + 0xd8c);
      fVar300 = *(float *)(bspline_basis0 + lVar15 + 0xd90);
      fVar149 = *(float *)(bspline_basis0 + lVar15 + 0xd94);
      fVar152 = *(float *)(bspline_basis0 + lVar15 + 0xd98);
      fVar154 = *(float *)(bspline_basis0 + lVar15 + 0xd9c);
      fVar268 = *(float *)(bspline_basis0 + lVar15 + 0xda0);
      fVar269 = *(float *)(bspline_basis0 + lVar15 + 0xda4);
      auVar104 = *(undefined1 (*) [28])(bspline_basis0 + lVar15 + 0xd8c);
      auVar124 = vshufps_avx(auVar263,auVar263,0);
      register0x00001310 = auVar124;
      _local_480 = auVar124;
      auVar125 = vshufps_avx(auVar263,auVar263,0x55);
      register0x000015d0 = auVar125;
      _local_600 = auVar125;
      register0x000013d0 = auVar123;
      _local_180 = auVar123;
      fVar207 = auVar124._0_4_;
      fVar217 = auVar124._4_4_;
      fVar218 = auVar124._8_4_;
      fVar219 = auVar124._12_4_;
      fVar322 = auVar125._0_4_;
      fVar326 = auVar125._4_4_;
      fVar327 = auVar125._8_4_;
      fVar328 = auVar125._12_4_;
      fVar274 = auVar192._0_4_;
      fVar281 = auVar192._4_4_;
      fVar283 = auVar192._8_4_;
      fVar285 = auVar192._12_4_;
      fVar236 = auVar18._0_4_;
      fVar243 = auVar18._4_4_;
      fVar245 = auVar18._8_4_;
      fVar247 = auVar18._12_4_;
      fVar249 = auVar123._0_4_;
      fVar256 = auVar123._4_4_;
      fVar257 = auVar123._8_4_;
      fVar258 = auVar123._12_4_;
      fVar286 = auVar157._0_4_;
      fVar293 = auVar157._4_4_;
      fVar295 = auVar157._8_4_;
      auVar192 = vshufps_avx(auVar309,auVar309,0);
      register0x00001350 = auVar192;
      _local_6a0 = auVar192;
      fVar203 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar15 + 0x484);
      fVar259 = *(float *)(bspline_basis0 + lVar15 + 0x488);
      fVar270 = *(float *)(bspline_basis0 + lVar15 + 0x48c);
      fVar271 = *(float *)(bspline_basis0 + lVar15 + 0x490);
      fVar204 = *(float *)(bspline_basis0 + lVar15 + 0x494);
      fVar260 = *(float *)(bspline_basis0 + lVar15 + 0x498);
      fVar272 = *(float *)(bspline_basis0 + lVar15 + 0x49c);
      auVar106 = *(undefined1 (*) [28])(bspline_basis0 + lVar15 + 0x484);
      fVar273 = *(float *)(bspline_basis0 + lVar15 + 0x4a0);
      fVar221 = auVar192._0_4_;
      fVar230 = auVar192._4_4_;
      fVar232 = auVar192._8_4_;
      fVar234 = auVar192._12_4_;
      auVar192 = vshufps_avx(auVar309,auVar309,0x55);
      register0x00001550 = auVar192;
      _local_6e0 = auVar192;
      fVar307 = auVar192._0_4_;
      fVar313 = auVar192._4_4_;
      fVar314 = auVar192._8_4_;
      fVar315 = auVar192._12_4_;
      auVar192 = vshufps_avx(auVar102,auVar102,0xff);
      register0x00001590 = auVar192;
      _local_80 = auVar192;
      fVar316 = auVar192._0_4_;
      fVar319 = auVar192._4_4_;
      fVar320 = auVar192._8_4_;
      fVar321 = auVar192._12_4_;
      fVar187 = *(float *)(bspline_basis0 + lVar15 + 0x924) + 0.0 + 0.0;
      auVar192 = vshufps_avx(auVar158,auVar158,0);
      local_140._16_16_ = auVar192;
      local_140._0_16_ = auVar192;
      fVar205 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar15);
      fVar261 = *(float *)(bspline_basis0 + lVar15 + 4);
      fVar153 = *(float *)(bspline_basis0 + lVar15 + 8);
      fVar248 = *(float *)(bspline_basis0 + lVar15 + 0xc);
      fVar206 = *(float *)(bspline_basis0 + lVar15 + 0x10);
      fVar298 = *(float *)(bspline_basis0 + lVar15 + 0x14);
      fVar121 = *(float *)(bspline_basis0 + lVar15 + 0x18);
      auVar107 = *(undefined1 (*) [28])(bspline_basis0 + lVar15);
      fVar220 = auVar192._0_4_;
      fVar200 = auVar192._4_4_;
      fVar233 = auVar192._8_4_;
      fVar242 = auVar192._12_4_;
      auVar302._0_4_ = fVar205 * fVar220 + fVar221 * fVar203 + fVar274 * fVar189 + fVar207 * fVar246
      ;
      auVar302._4_4_ = fVar261 * fVar200 + fVar230 * fVar259 + fVar281 * fVar229 + fVar217 * fVar300
      ;
      auVar302._8_4_ = fVar153 * fVar233 + fVar232 * fVar270 + fVar283 * fVar231 + fVar218 * fVar149
      ;
      auVar302._12_4_ =
           fVar248 * fVar242 + fVar234 * fVar271 + fVar285 * fVar201 + fVar219 * fVar152;
      auVar302._16_4_ =
           fVar206 * fVar220 + fVar221 * fVar204 + fVar274 * fVar202 + fVar207 * fVar154;
      auVar302._20_4_ =
           fVar298 * fVar200 + fVar230 * fVar260 + fVar281 * fVar235 + fVar217 * fVar268;
      auVar302._24_4_ =
           fVar121 * fVar233 + fVar232 * fVar272 + fVar283 * fVar244 + fVar218 * fVar269;
      auVar302._28_4_ = fVar273 + 0.0;
      auVar192 = vshufps_avx(auVar158,auVar158,0x55);
      register0x00001490 = auVar192;
      _local_160 = auVar192;
      fVar287 = auVar192._0_4_;
      fVar294 = auVar192._4_4_;
      fVar296 = auVar192._8_4_;
      fVar297 = auVar192._12_4_;
      auVar264._0_4_ = fVar287 * fVar205 + fVar307 * fVar203 + fVar236 * fVar189 + fVar322 * fVar246
      ;
      auVar264._4_4_ = fVar294 * fVar261 + fVar313 * fVar259 + fVar243 * fVar229 + fVar326 * fVar300
      ;
      auVar264._8_4_ = fVar296 * fVar153 + fVar314 * fVar270 + fVar245 * fVar231 + fVar327 * fVar149
      ;
      auVar264._12_4_ =
           fVar297 * fVar248 + fVar315 * fVar271 + fVar247 * fVar201 + fVar328 * fVar152;
      auVar264._16_4_ =
           fVar287 * fVar206 + fVar307 * fVar204 + fVar236 * fVar202 + fVar322 * fVar154;
      auVar264._20_4_ =
           fVar294 * fVar298 + fVar313 * fVar260 + fVar243 * fVar235 + fVar326 * fVar268;
      auVar264._24_4_ =
           fVar296 * fVar121 + fVar314 * fVar272 + fVar245 * fVar244 + fVar327 * fVar269;
      auVar264._28_4_ = 0;
      auVar192 = vpermilps_avx(auVar16,0xff);
      register0x00001450 = auVar192;
      _local_1a0 = auVar192;
      fVar275 = auVar192._0_4_;
      fVar282 = auVar192._4_4_;
      fVar284 = auVar192._8_4_;
      fVar155 = fVar275 * fVar205 + fVar316 * fVar203 + fVar286 * fVar189 + fVar249 * fVar246;
      fVar167 = fVar282 * fVar261 + fVar319 * fVar259 + fVar293 * fVar229 + fVar256 * fVar300;
      fVar168 = fVar284 * fVar153 + fVar320 * fVar270 + fVar295 * fVar231 + fVar257 * fVar149;
      fVar169 = auVar192._12_4_ * fVar248 +
                fVar321 * fVar271 + auVar157._12_4_ * fVar201 + fVar258 * fVar152;
      fVar170 = fVar275 * fVar206 + fVar316 * fVar204 + fVar286 * fVar202 + fVar249 * fVar154;
      fVar171 = fVar282 * fVar298 + fVar319 * fVar260 + fVar293 * fVar235 + fVar256 * fVar268;
      fVar172 = fVar284 * fVar121 + fVar320 * fVar272 + fVar295 * fVar244 + fVar257 * fVar269;
      fVar173 = fVar187 + 0.0;
      fVar203 = *(float *)(bspline_basis1 + lVar15 + 0x908);
      fVar259 = *(float *)(bspline_basis1 + lVar15 + 0x90c);
      fVar270 = *(float *)(bspline_basis1 + lVar15 + 0x910);
      fVar271 = *(float *)(bspline_basis1 + lVar15 + 0x914);
      fVar204 = *(float *)(bspline_basis1 + lVar15 + 0x918);
      fVar260 = *(float *)(bspline_basis1 + lVar15 + 0x91c);
      fVar272 = *(float *)(bspline_basis1 + lVar15 + 0x920);
      fVar205 = *(float *)(bspline_basis1 + lVar15 + 0xd8c);
      fVar261 = *(float *)(bspline_basis1 + lVar15 + 0xd90);
      fVar153 = *(float *)(bspline_basis1 + lVar15 + 0xd94);
      fVar248 = *(float *)(bspline_basis1 + lVar15 + 0xd98);
      fVar206 = *(float *)(bspline_basis1 + lVar15 + 0xd9c);
      fVar298 = *(float *)(bspline_basis1 + lVar15 + 0xda0);
      fVar121 = *(float *)(bspline_basis1 + lVar15 + 0xda4);
      fVar140 = *(float *)(bspline_basis1 + lVar15 + 0x484);
      fVar141 = *(float *)(bspline_basis1 + lVar15 + 0x488);
      fVar143 = *(float *)(bspline_basis1 + lVar15 + 0x48c);
      fVar145 = *(float *)(bspline_basis1 + lVar15 + 0x490);
      fVar147 = *(float *)(bspline_basis1 + lVar15 + 0x494);
      fVar150 = *(float *)(bspline_basis1 + lVar15 + 0x498);
      fVar122 = *(float *)(bspline_basis1 + lVar15 + 0x49c);
      fVar229 = fVar315 + fVar187 + 0.0;
      fVar187 = *(float *)(bspline_basis1 + lVar15);
      fVar142 = *(float *)(bspline_basis1 + lVar15 + 4);
      fVar144 = *(float *)(bspline_basis1 + lVar15 + 8);
      fVar146 = *(float *)(bspline_basis1 + lVar15 + 0xc);
      fVar148 = *(float *)(bspline_basis1 + lVar15 + 0x10);
      fVar151 = *(float *)(bspline_basis1 + lVar15 + 0x14);
      fVar188 = *(float *)(bspline_basis1 + lVar15 + 0x18);
      auVar212._0_4_ = fVar220 * fVar187 + fVar221 * fVar140 + fVar203 * fVar274 + fVar205 * fVar207
      ;
      auVar212._4_4_ = fVar200 * fVar142 + fVar230 * fVar141 + fVar259 * fVar281 + fVar261 * fVar217
      ;
      auVar212._8_4_ = fVar233 * fVar144 + fVar232 * fVar143 + fVar270 * fVar283 + fVar153 * fVar218
      ;
      auVar212._12_4_ =
           fVar242 * fVar146 + fVar234 * fVar145 + fVar271 * fVar285 + fVar248 * fVar219;
      auVar212._16_4_ =
           fVar220 * fVar148 + fVar221 * fVar147 + fVar204 * fVar274 + fVar206 * fVar207;
      auVar212._20_4_ =
           fVar200 * fVar151 + fVar230 * fVar150 + fVar260 * fVar281 + fVar298 * fVar217;
      auVar212._24_4_ =
           fVar233 * fVar188 + fVar232 * fVar122 + fVar272 * fVar283 + fVar121 * fVar218;
      auVar212._28_4_ = fVar321 + fVar229;
      local_620._0_4_ =
           fVar287 * fVar187 + fVar307 * fVar140 + fVar203 * fVar236 + fVar322 * fVar205;
      local_620._4_4_ =
           fVar294 * fVar142 + fVar313 * fVar141 + fVar259 * fVar243 + fVar326 * fVar261;
      fStack_618 = fVar296 * fVar144 + fVar314 * fVar143 + fVar270 * fVar245 + fVar327 * fVar153;
      fStack_614 = fVar297 * fVar146 + fVar315 * fVar145 + fVar271 * fVar247 + fVar328 * fVar248;
      fStack_610 = fVar287 * fVar148 + fVar307 * fVar147 + fVar204 * fVar236 + fVar322 * fVar206;
      fStack_60c = fVar294 * fVar151 + fVar313 * fVar150 + fVar260 * fVar243 + fVar326 * fVar298;
      fStack_608 = fVar296 * fVar188 + fVar314 * fVar122 + fVar272 * fVar245 + fVar327 * fVar121;
      fStack_604 = fVar229 + fVar315 + fVar273 + 0.0;
      auVar226._0_4_ = fVar316 * fVar140 + fVar203 * fVar286 + fVar205 * fVar249 + fVar275 * fVar187
      ;
      auVar226._4_4_ = fVar319 * fVar141 + fVar259 * fVar293 + fVar261 * fVar256 + fVar282 * fVar142
      ;
      auVar226._8_4_ = fVar320 * fVar143 + fVar270 * fVar295 + fVar153 * fVar257 + fVar284 * fVar144
      ;
      auVar226._12_4_ =
           fVar321 * fVar145 + fVar271 * auVar157._12_4_ + fVar248 * fVar258 +
           auVar192._12_4_ * fVar146;
      auVar226._16_4_ =
           fVar316 * fVar147 + fVar204 * fVar286 + fVar206 * fVar249 + fVar275 * fVar148;
      auVar226._20_4_ =
           fVar319 * fVar150 + fVar260 * fVar293 + fVar298 * fVar256 + fVar282 * fVar151;
      auVar226._24_4_ =
           fVar320 * fVar122 + fVar272 * fVar295 + fVar121 * fVar257 + fVar284 * fVar188;
      auVar226._28_4_ = fVar315 + fVar258 + fVar273 + fVar229;
      auVar19 = vsubps_avx(auVar212,auVar302);
      auVar289 = vsubps_avx(_local_620,auVar264);
      _auStack_4d0 = auVar289._16_16_;
      fVar189 = auVar19._0_4_;
      fVar231 = auVar19._4_4_;
      auVar137._4_4_ = auVar264._4_4_ * fVar231;
      auVar137._0_4_ = auVar264._0_4_ * fVar189;
      fVar202 = auVar19._8_4_;
      auVar137._8_4_ = auVar264._8_4_ * fVar202;
      fVar244 = auVar19._12_4_;
      auVar137._12_4_ = auVar264._12_4_ * fVar244;
      fVar300 = auVar19._16_4_;
      auVar137._16_4_ = auVar264._16_4_ * fVar300;
      fVar152 = auVar19._20_4_;
      auVar137._20_4_ = auVar264._20_4_ * fVar152;
      fVar268 = auVar19._24_4_;
      auVar137._24_4_ = auVar264._24_4_ * fVar268;
      auVar137._28_4_ = fVar229;
      fVar229 = auVar289._0_4_;
      fVar201 = auVar289._4_4_;
      auVar198._4_4_ = auVar302._4_4_ * fVar201;
      auVar198._0_4_ = auVar302._0_4_ * fVar229;
      fVar235 = auVar289._8_4_;
      auVar198._8_4_ = auVar302._8_4_ * fVar235;
      fVar246 = auVar289._12_4_;
      auVar198._12_4_ = auVar302._12_4_ * fVar246;
      fVar149 = auVar289._16_4_;
      auVar198._16_4_ = auVar302._16_4_ * fVar149;
      fVar154 = auVar289._20_4_;
      auVar198._20_4_ = auVar302._20_4_ * fVar154;
      fVar269 = auVar289._24_4_;
      auVar198._24_4_ = auVar302._24_4_ * fVar269;
      auVar198._28_4_ = fStack_604;
      auVar198 = vsubps_avx(auVar137,auVar198);
      auVar17._4_4_ = fVar167;
      auVar17._0_4_ = fVar155;
      auVar17._8_4_ = fVar168;
      auVar17._12_4_ = fVar169;
      auVar17._16_4_ = fVar170;
      auVar17._20_4_ = fVar171;
      auVar17._24_4_ = fVar172;
      auVar17._28_4_ = fVar173;
      auVar137 = vmaxps_avx(auVar17,auVar226);
      auVar24._4_4_ = auVar137._4_4_ * auVar137._4_4_ * (fVar231 * fVar231 + fVar201 * fVar201);
      auVar24._0_4_ = auVar137._0_4_ * auVar137._0_4_ * (fVar189 * fVar189 + fVar229 * fVar229);
      auVar24._8_4_ = auVar137._8_4_ * auVar137._8_4_ * (fVar202 * fVar202 + fVar235 * fVar235);
      auVar24._12_4_ = auVar137._12_4_ * auVar137._12_4_ * (fVar244 * fVar244 + fVar246 * fVar246);
      auVar24._16_4_ = auVar137._16_4_ * auVar137._16_4_ * (fVar300 * fVar300 + fVar149 * fVar149);
      auVar24._20_4_ = auVar137._20_4_ * auVar137._20_4_ * (fVar152 * fVar152 + fVar154 * fVar154);
      auVar24._24_4_ = auVar137._24_4_ * auVar137._24_4_ * (fVar268 * fVar268 + fVar269 * fVar269);
      auVar24._28_4_ = auVar289._28_4_ + fStack_604;
      auVar325._4_4_ = auVar198._4_4_ * auVar198._4_4_;
      auVar325._0_4_ = auVar198._0_4_ * auVar198._0_4_;
      auVar325._8_4_ = auVar198._8_4_ * auVar198._8_4_;
      auVar325._12_4_ = auVar198._12_4_ * auVar198._12_4_;
      auVar325._16_4_ = auVar198._16_4_ * auVar198._16_4_;
      auVar325._20_4_ = auVar198._20_4_ * auVar198._20_4_;
      auVar325._24_4_ = auVar198._24_4_ * auVar198._24_4_;
      auVar325._28_4_ = auVar198._28_4_;
      auVar137 = vcmpps_avx(auVar325,auVar24,2);
      fVar189 = auVar211._0_4_ * 4.7683716e-07;
      auVar267 = ZEXT464((uint)fVar189);
      local_4a0 = (float)(int)uVar11;
      fStack_49c = 0.0;
      fStack_498 = 0.0;
      fStack_494 = 0.0;
      auVar211 = vshufps_avx(ZEXT416((uint)local_4a0),ZEXT416((uint)local_4a0),0);
      auVar193._16_16_ = auVar211;
      auVar193._0_16_ = auVar211;
      auVar198 = vcmpps_avx(_DAT_01faff40,auVar193,1);
      auVar199 = ZEXT3264(auVar198);
      auVar211 = vpermilps_avx(auVar158,0xaa);
      register0x00001450 = auVar211;
      _local_560 = auVar211;
      auVar192 = vpermilps_avx(auVar309,0xaa);
      register0x00001550 = auVar192;
      _local_460 = auVar192;
      auVar18 = vpermilps_avx(auVar224,0xaa);
      register0x00001590 = auVar18;
      _local_a0 = auVar18;
      auVar124 = vpermilps_avx(auVar263,0xaa);
      register0x00001310 = auVar124;
      _local_820 = auVar124;
      auVar24 = auVar198 & auVar137;
      local_680._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
      _local_7a0 = ZEXT416((uint)fVar189);
      local_860 = auVar225._0_4_;
      fStack_85c = auVar225._4_4_;
      fStack_858 = auVar225._8_4_;
      fStack_854 = auVar225._12_4_;
      local_250 = auVar225._0_8_;
      uVar111 = local_250;
      uStack_248 = auVar225._8_8_;
      uVar112 = uStack_248;
      local_870 = auVar181._0_4_;
      fStack_86c = auVar181._4_4_;
      fStack_868 = auVar181._8_4_;
      fStack_864 = auVar181._12_4_;
      local_240 = auVar181._0_8_;
      uVar113 = local_240;
      uStack_238 = auVar181._8_8_;
      uVar114 = uStack_238;
      local_8c0 = auVar16._0_4_;
      fStack_8bc = auVar16._4_4_;
      fStack_8b8 = auVar16._8_4_;
      fStack_8b4 = auVar16._12_4_;
      fVar229 = fVar307;
      fVar231 = fVar313;
      fVar201 = fVar314;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        auVar318 = ZEXT3264(auVar132);
        auVar255 = ZEXT3264(_local_6a0);
      }
      else {
        _local_340 = vandps_avx(auVar137,auVar198);
        fVar249 = auVar211._0_4_;
        fVar256 = auVar211._4_4_;
        fVar257 = auVar211._8_4_;
        fVar258 = auVar211._12_4_;
        fVar275 = auVar192._0_4_;
        fVar282 = auVar192._4_4_;
        fVar284 = auVar192._8_4_;
        fVar286 = auVar192._12_4_;
        fVar293 = auVar18._0_4_;
        fVar295 = auVar18._4_4_;
        fVar316 = auVar18._8_4_;
        fVar319 = auVar18._12_4_;
        fVar202 = auVar124._0_4_;
        fVar235 = auVar124._4_4_;
        fVar244 = auVar124._8_4_;
        fVar246 = auVar124._12_4_;
        local_360._0_4_ =
             fVar249 * fVar187 + fVar275 * fVar140 + fVar293 * fVar203 + fVar205 * fVar202;
        local_360._4_4_ =
             fVar256 * fVar142 + fVar282 * fVar141 + fVar295 * fVar259 + fVar261 * fVar235;
        fStack_358 = fVar257 * fVar144 + fVar284 * fVar143 + fVar316 * fVar270 + fVar153 * fVar244;
        fStack_354 = fVar258 * fVar146 + fVar286 * fVar145 + fVar319 * fVar271 + fVar248 * fVar246;
        fStack_350 = fVar249 * fVar148 + fVar275 * fVar147 + fVar293 * fVar204 + fVar206 * fVar202;
        fStack_34c = fVar256 * fVar151 + fVar282 * fVar150 + fVar295 * fVar260 + fVar298 * fVar235;
        fStack_348 = fVar257 * fVar188 + fVar284 * fVar122 + fVar316 * fVar272 + fVar121 * fVar244;
        fStack_344 = local_340._28_4_ +
                     auVar198._28_4_ + *(float *)(bspline_basis1 + lVar15 + 0x924) + 0.0;
        local_500._0_4_ = auVar107._0_4_;
        local_500._4_4_ = auVar107._4_4_;
        fStack_4f8 = auVar107._8_4_;
        fStack_4f4 = auVar107._12_4_;
        fStack_4f0 = auVar107._16_4_;
        fStack_4ec = auVar107._20_4_;
        fStack_4e8 = auVar107._24_4_;
        local_580._0_4_ = auVar106._0_4_;
        local_580._4_4_ = auVar106._4_4_;
        fStack_578 = auVar106._8_4_;
        fStack_574 = auVar106._12_4_;
        fStack_570 = auVar106._16_4_;
        fStack_56c = auVar106._20_4_;
        fStack_568 = auVar106._24_4_;
        local_640._0_4_ = auVar105._0_4_;
        local_640._4_4_ = auVar105._4_4_;
        fStack_638 = auVar105._8_4_;
        fStack_634 = auVar105._12_4_;
        fStack_630 = auVar105._16_4_;
        fStack_62c = auVar105._20_4_;
        fStack_628 = auVar105._24_4_;
        local_760._0_4_ = auVar104._0_4_;
        local_760._4_4_ = auVar104._4_4_;
        fStack_758 = auVar104._8_4_;
        fStack_754 = auVar104._12_4_;
        fStack_750 = auVar104._16_4_;
        fStack_74c = auVar104._20_4_;
        fStack_748 = auVar104._24_4_;
        local_640._0_4_ =
             fVar249 * (float)local_500._0_4_ +
             fVar275 * (float)local_580._0_4_ +
             fVar293 * (float)local_640._0_4_ + fVar202 * (float)local_760._0_4_;
        local_640._4_4_ =
             fVar256 * (float)local_500._4_4_ +
             fVar282 * (float)local_580._4_4_ +
             fVar295 * (float)local_640._4_4_ + fVar235 * (float)local_760._4_4_;
        fStack_638 = fVar257 * fStack_4f8 +
                     fVar284 * fStack_578 + fVar316 * fStack_638 + fVar244 * fStack_758;
        fStack_634 = fVar258 * fStack_4f4 +
                     fVar286 * fStack_574 + fVar319 * fStack_634 + fVar246 * fStack_754;
        fStack_630 = fVar249 * fStack_4f0 +
                     fVar275 * fStack_570 + fVar293 * fStack_630 + fVar202 * fStack_750;
        fStack_62c = fVar256 * fStack_4ec +
                     fVar282 * fStack_56c + fVar295 * fStack_62c + fVar235 * fStack_74c;
        fStack_628 = fVar257 * fStack_4e8 +
                     fVar284 * fStack_568 + fVar316 * fStack_628 + fVar244 * fStack_748;
        fStack_624 = fVar297 + fStack_344 + local_340._28_4_ + auVar198._28_4_;
        fVar300 = *(float *)(bspline_basis0 + lVar15 + 0x1210);
        fVar149 = *(float *)(bspline_basis0 + lVar15 + 0x1214);
        fVar152 = *(float *)(bspline_basis0 + lVar15 + 0x1218);
        fVar154 = *(float *)(bspline_basis0 + lVar15 + 0x121c);
        fVar268 = *(float *)(bspline_basis0 + lVar15 + 0x1220);
        fVar269 = *(float *)(bspline_basis0 + lVar15 + 0x1224);
        fVar203 = *(float *)(bspline_basis0 + lVar15 + 0x1228);
        fVar259 = *(float *)(bspline_basis0 + lVar15 + 0x1694);
        fVar270 = *(float *)(bspline_basis0 + lVar15 + 0x1698);
        fVar271 = *(float *)(bspline_basis0 + lVar15 + 0x169c);
        fVar204 = *(float *)(bspline_basis0 + lVar15 + 0x16a0);
        fVar260 = *(float *)(bspline_basis0 + lVar15 + 0x16a4);
        fVar272 = *(float *)(bspline_basis0 + lVar15 + 0x16a8);
        fVar273 = *(float *)(bspline_basis0 + lVar15 + 0x16ac);
        fVar205 = *(float *)(bspline_basis0 + lVar15 + 0x1b18);
        fVar261 = *(float *)(bspline_basis0 + lVar15 + 0x1b1c);
        fVar153 = *(float *)(bspline_basis0 + lVar15 + 0x1b20);
        fVar248 = *(float *)(bspline_basis0 + lVar15 + 0x1b24);
        fVar206 = *(float *)(bspline_basis0 + lVar15 + 0x1b28);
        fVar298 = *(float *)(bspline_basis0 + lVar15 + 0x1b2c);
        fVar121 = *(float *)(bspline_basis0 + lVar15 + 0x1b30);
        fVar140 = *(float *)(bspline_basis0 + lVar15 + 0x1f9c);
        fVar141 = *(float *)(bspline_basis0 + lVar15 + 0x1fa0);
        fVar143 = *(float *)(bspline_basis0 + lVar15 + 0x1fa4);
        fVar145 = *(float *)(bspline_basis0 + lVar15 + 0x1fa8);
        fVar147 = *(float *)(bspline_basis0 + lVar15 + 0x1fac);
        fVar150 = *(float *)(bspline_basis0 + lVar15 + 0x1fb0);
        fVar122 = *(float *)(bspline_basis0 + lVar15 + 0x1fb4);
        fVar187 = *(float *)(bspline_basis0 + lVar15 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar15 + 0x1fb8);
        fVar142 = *(float *)(bspline_basis0 + lVar15 + 0x16b0) + fVar187;
        local_580._4_4_ =
             fVar200 * fVar149 + fVar230 * fVar270 + fVar281 * fVar261 + fVar217 * fVar141;
        local_580._0_4_ =
             fVar220 * fVar300 + fVar221 * fVar259 + fVar274 * fVar205 + fVar207 * fVar140;
        fStack_578 = fVar233 * fVar152 + fVar232 * fVar271 + fVar283 * fVar153 + fVar218 * fVar143;
        fStack_574 = fVar242 * fVar154 + fVar234 * fVar204 + fVar285 * fVar248 + fVar219 * fVar145;
        fStack_570 = fVar220 * fVar268 + fVar221 * fVar260 + fVar274 * fVar206 + fVar207 * fVar147;
        fStack_56c = fVar200 * fVar269 + fVar230 * fVar272 + fVar281 * fVar298 + fVar217 * fVar150;
        fStack_568 = fVar233 * fVar203 + fVar232 * fVar273 + fVar283 * fVar121 + fVar218 * fVar122;
        fStack_564 = *(float *)(bspline_basis0 + lVar15 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar15 + 0x1fb8) +
                     fVar258 + *(float *)(bspline_basis1 + lVar15 + 0x4a0);
        auVar238._0_4_ =
             fVar287 * fVar300 + fVar307 * fVar259 + fVar236 * fVar205 + fVar322 * fVar140;
        auVar238._4_4_ =
             fVar294 * fVar149 + fVar313 * fVar270 + fVar243 * fVar261 + fVar326 * fVar141;
        auVar238._8_4_ =
             fVar296 * fVar152 + fVar314 * fVar271 + fVar245 * fVar153 + fVar327 * fVar143;
        auVar238._12_4_ =
             fVar297 * fVar154 + fVar315 * fVar204 + fVar247 * fVar248 + fVar328 * fVar145;
        auVar238._16_4_ =
             fVar287 * fVar268 + fVar307 * fVar260 + fVar236 * fVar206 + fVar322 * fVar147;
        auVar238._20_4_ =
             fVar294 * fVar269 + fVar313 * fVar272 + fVar243 * fVar298 + fVar326 * fVar150;
        auVar238._24_4_ =
             fVar296 * fVar203 + fVar314 * fVar273 + fVar245 * fVar121 + fVar327 * fVar122;
        auVar238._28_4_ =
             fVar187 + fVar258 + *(float *)(bspline_basis1 + lVar15 + 0x4a0) +
                       fVar258 + *(float *)(bspline_basis1 + lVar15 + 0x1c);
        local_500._4_4_ =
             fVar256 * fVar149 + fVar282 * fVar270 + fVar295 * fVar261 + fVar235 * fVar141;
        local_500._0_4_ =
             fVar249 * fVar300 + fVar275 * fVar259 + fVar293 * fVar205 + fVar202 * fVar140;
        fStack_4f8 = fVar257 * fVar152 + fVar284 * fVar271 + fVar316 * fVar153 + fVar244 * fVar143;
        fStack_4f4 = fVar258 * fVar154 + fVar286 * fVar204 + fVar319 * fVar248 + fVar246 * fVar145;
        fStack_4f0 = fVar249 * fVar268 + fVar275 * fVar260 + fVar293 * fVar206 + fVar202 * fVar147;
        fStack_4ec = fVar256 * fVar269 + fVar282 * fVar272 + fVar295 * fVar298 + fVar235 * fVar150;
        fStack_4e8 = fVar257 * fVar203 + fVar284 * fVar273 + fVar316 * fVar121 + fVar244 * fVar122;
        fStack_4e4 = *(float *)(bspline_basis0 + lVar15 + 0x122c) + fVar142;
        fVar300 = *(float *)(bspline_basis1 + lVar15 + 0x1b18);
        fVar149 = *(float *)(bspline_basis1 + lVar15 + 0x1b1c);
        fVar152 = *(float *)(bspline_basis1 + lVar15 + 0x1b20);
        fVar154 = *(float *)(bspline_basis1 + lVar15 + 0x1b24);
        fVar268 = *(float *)(bspline_basis1 + lVar15 + 0x1b28);
        fVar269 = *(float *)(bspline_basis1 + lVar15 + 0x1b2c);
        fVar203 = *(float *)(bspline_basis1 + lVar15 + 0x1b30);
        fVar259 = *(float *)(bspline_basis1 + lVar15 + 0x1f9c);
        fVar270 = *(float *)(bspline_basis1 + lVar15 + 0x1fa0);
        fVar271 = *(float *)(bspline_basis1 + lVar15 + 0x1fa4);
        fVar204 = *(float *)(bspline_basis1 + lVar15 + 0x1fa8);
        fVar260 = *(float *)(bspline_basis1 + lVar15 + 0x1fac);
        fVar272 = *(float *)(bspline_basis1 + lVar15 + 0x1fb0);
        fVar273 = *(float *)(bspline_basis1 + lVar15 + 0x1fb4);
        fVar205 = *(float *)(bspline_basis1 + lVar15 + 0x1694);
        fVar261 = *(float *)(bspline_basis1 + lVar15 + 0x1698);
        fVar153 = *(float *)(bspline_basis1 + lVar15 + 0x169c);
        fVar248 = *(float *)(bspline_basis1 + lVar15 + 0x16a0);
        fVar206 = *(float *)(bspline_basis1 + lVar15 + 0x16a4);
        fVar298 = *(float *)(bspline_basis1 + lVar15 + 0x16a8);
        fVar121 = *(float *)(bspline_basis1 + lVar15 + 0x16ac);
        fVar140 = *(float *)(bspline_basis1 + lVar15 + 0x1210);
        fVar141 = *(float *)(bspline_basis1 + lVar15 + 0x1214);
        fVar143 = *(float *)(bspline_basis1 + lVar15 + 0x1218);
        fVar145 = *(float *)(bspline_basis1 + lVar15 + 0x121c);
        fVar147 = *(float *)(bspline_basis1 + lVar15 + 0x1220);
        fVar150 = *(float *)(bspline_basis1 + lVar15 + 0x1224);
        fVar122 = *(float *)(bspline_basis1 + lVar15 + 0x1228);
        auVar253._0_4_ =
             fVar220 * fVar140 + fVar221 * fVar205 + fVar274 * fVar300 + fVar207 * fVar259;
        auVar253._4_4_ =
             fVar200 * fVar141 + fVar230 * fVar261 + fVar281 * fVar149 + fVar217 * fVar270;
        auVar253._8_4_ =
             fVar233 * fVar143 + fVar232 * fVar153 + fVar283 * fVar152 + fVar218 * fVar271;
        auVar253._12_4_ =
             fVar242 * fVar145 + fVar234 * fVar248 + fVar285 * fVar154 + fVar219 * fVar204;
        auVar253._16_4_ =
             fVar220 * fVar147 + fVar221 * fVar206 + fVar274 * fVar268 + fVar207 * fVar260;
        auVar253._20_4_ =
             fVar200 * fVar150 + fVar230 * fVar298 + fVar281 * fVar269 + fVar217 * fVar272;
        auVar253._24_4_ =
             fVar233 * fVar122 + fVar232 * fVar121 + fVar283 * fVar203 + fVar218 * fVar273;
        auVar253._28_4_ = fVar285 + fVar285 + fVar258 + fVar142;
        auVar277._0_4_ =
             fVar287 * fVar140 + fVar307 * fVar205 + fVar236 * fVar300 + fVar322 * fVar259;
        auVar277._4_4_ =
             fVar294 * fVar141 + fVar313 * fVar261 + fVar243 * fVar149 + fVar326 * fVar270;
        auVar277._8_4_ =
             fVar296 * fVar143 + fVar314 * fVar153 + fVar245 * fVar152 + fVar327 * fVar271;
        auVar277._12_4_ =
             fVar297 * fVar145 + fVar315 * fVar248 + fVar247 * fVar154 + fVar328 * fVar204;
        auVar277._16_4_ =
             fVar287 * fVar147 + fVar307 * fVar206 + fVar236 * fVar268 + fVar322 * fVar260;
        auVar277._20_4_ =
             fVar294 * fVar150 + fVar313 * fVar298 + fVar243 * fVar269 + fVar326 * fVar272;
        auVar277._24_4_ =
             fVar296 * fVar122 + fVar314 * fVar121 + fVar245 * fVar203 + fVar327 * fVar273;
        auVar277._28_4_ = fVar285 + fVar285 + fVar285 + fVar258;
        auVar185._0_4_ =
             fVar249 * fVar140 + fVar275 * fVar205 + fVar293 * fVar300 + fVar259 * fVar202;
        auVar185._4_4_ =
             fVar256 * fVar141 + fVar282 * fVar261 + fVar295 * fVar149 + fVar270 * fVar235;
        auVar185._8_4_ =
             fVar257 * fVar143 + fVar284 * fVar153 + fVar316 * fVar152 + fVar271 * fVar244;
        auVar185._12_4_ =
             fVar258 * fVar145 + fVar286 * fVar248 + fVar319 * fVar154 + fVar204 * fVar246;
        auVar185._16_4_ =
             fVar249 * fVar147 + fVar275 * fVar206 + fVar293 * fVar268 + fVar260 * fVar202;
        auVar185._20_4_ =
             fVar256 * fVar150 + fVar282 * fVar298 + fVar295 * fVar269 + fVar272 * fVar235;
        auVar185._24_4_ =
             fVar257 * fVar122 + fVar284 * fVar121 + fVar316 * fVar203 + fVar273 * fVar244;
        auVar185._28_4_ =
             *(float *)(bspline_basis1 + lVar15 + 0x122c) +
             *(float *)(bspline_basis1 + lVar15 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar15 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar15 + 0x1fb8);
        auVar213._8_4_ = 0x7fffffff;
        auVar213._0_8_ = 0x7fffffff7fffffff;
        auVar213._12_4_ = 0x7fffffff;
        auVar213._16_4_ = 0x7fffffff;
        auVar213._20_4_ = 0x7fffffff;
        auVar213._24_4_ = 0x7fffffff;
        auVar213._28_4_ = 0x7fffffff;
        auVar137 = vandps_avx(_local_580,auVar213);
        auVar198 = vandps_avx(auVar238,auVar213);
        auVar198 = vmaxps_avx(auVar137,auVar198);
        auVar137 = vandps_avx(auVar213,_local_500);
        auVar137 = vmaxps_avx(auVar198,auVar137);
        auVar225 = vpermilps_avx(ZEXT416((uint)fVar189),0);
        auVar239._16_16_ = auVar225;
        auVar239._0_16_ = auVar225;
        auVar137 = vcmpps_avx(auVar137,auVar239,1);
        auVar24 = vblendvps_avx(_local_580,auVar19,auVar137);
        auVar325 = vblendvps_avx(auVar238,auVar289,auVar137);
        auVar137 = vandps_avx(auVar253,auVar213);
        auVar198 = vandps_avx(auVar277,auVar213);
        auVar17 = vmaxps_avx(auVar137,auVar198);
        auVar137 = vandps_avx(auVar185,auVar213);
        auVar137 = vmaxps_avx(auVar17,auVar137);
        auVar17 = vcmpps_avx(auVar137,auVar239,1);
        auVar137 = vblendvps_avx(auVar253,auVar19,auVar17);
        auVar19 = vblendvps_avx(auVar277,auVar289,auVar17);
        fVar121 = auVar24._0_4_;
        fVar140 = auVar24._4_4_;
        fVar141 = auVar24._8_4_;
        fVar143 = auVar24._12_4_;
        fVar145 = auVar24._16_4_;
        fVar147 = auVar24._20_4_;
        fVar150 = auVar24._24_4_;
        fVar122 = auVar137._0_4_;
        fVar187 = auVar137._4_4_;
        fVar142 = auVar137._8_4_;
        fVar144 = auVar137._12_4_;
        fVar146 = auVar137._16_4_;
        fVar148 = auVar137._20_4_;
        fVar151 = auVar137._24_4_;
        fVar188 = -auVar137._28_4_;
        fVar220 = auVar325._0_4_;
        fVar202 = auVar325._4_4_;
        fVar246 = auVar325._8_4_;
        fVar154 = auVar325._12_4_;
        fVar259 = auVar325._16_4_;
        fVar260 = auVar325._20_4_;
        fVar261 = auVar325._24_4_;
        auVar128._0_4_ = fVar220 * fVar220 + fVar121 * fVar121;
        auVar128._4_4_ = fVar202 * fVar202 + fVar140 * fVar140;
        auVar128._8_4_ = fVar246 * fVar246 + fVar141 * fVar141;
        auVar128._12_4_ = fVar154 * fVar154 + fVar143 * fVar143;
        auVar128._16_4_ = fVar259 * fVar259 + fVar145 * fVar145;
        auVar128._20_4_ = fVar260 * fVar260 + fVar147 * fVar147;
        auVar128._24_4_ = fVar261 * fVar261 + fVar150 * fVar150;
        auVar128._28_4_ = auVar277._28_4_ + auVar24._28_4_;
        auVar289 = vrsqrtps_avx(auVar128);
        fVar189 = auVar289._0_4_;
        fVar200 = auVar289._4_4_;
        auVar21._4_4_ = fVar200 * 1.5;
        auVar21._0_4_ = fVar189 * 1.5;
        fVar233 = auVar289._8_4_;
        auVar21._8_4_ = fVar233 * 1.5;
        fVar235 = auVar289._12_4_;
        auVar21._12_4_ = fVar235 * 1.5;
        fVar242 = auVar289._16_4_;
        auVar21._16_4_ = fVar242 * 1.5;
        fVar244 = auVar289._20_4_;
        auVar21._20_4_ = fVar244 * 1.5;
        fVar300 = auVar289._24_4_;
        fVar298 = auVar198._28_4_;
        auVar21._24_4_ = fVar300 * 1.5;
        auVar21._28_4_ = fVar298;
        auVar289._4_4_ = fVar200 * fVar200 * fVar200 * auVar128._4_4_ * 0.5;
        auVar289._0_4_ = fVar189 * fVar189 * fVar189 * auVar128._0_4_ * 0.5;
        auVar289._8_4_ = fVar233 * fVar233 * fVar233 * auVar128._8_4_ * 0.5;
        auVar289._12_4_ = fVar235 * fVar235 * fVar235 * auVar128._12_4_ * 0.5;
        auVar289._16_4_ = fVar242 * fVar242 * fVar242 * auVar128._16_4_ * 0.5;
        auVar289._20_4_ = fVar244 * fVar244 * fVar244 * auVar128._20_4_ * 0.5;
        auVar289._24_4_ = fVar300 * fVar300 * fVar300 * auVar128._24_4_ * 0.5;
        auVar289._28_4_ = auVar128._28_4_;
        auVar198 = vsubps_avx(auVar21,auVar289);
        fVar189 = auVar198._0_4_;
        fVar235 = auVar198._4_4_;
        fVar300 = auVar198._8_4_;
        fVar268 = auVar198._12_4_;
        fVar270 = auVar198._16_4_;
        fVar272 = auVar198._20_4_;
        fVar153 = auVar198._24_4_;
        fVar200 = auVar19._0_4_;
        fVar242 = auVar19._4_4_;
        fVar149 = auVar19._8_4_;
        fVar269 = auVar19._12_4_;
        fVar271 = auVar19._16_4_;
        fVar273 = auVar19._20_4_;
        fVar248 = auVar19._24_4_;
        auVar129._0_4_ = fVar200 * fVar200 + fVar122 * fVar122;
        auVar129._4_4_ = fVar242 * fVar242 + fVar187 * fVar187;
        auVar129._8_4_ = fVar149 * fVar149 + fVar142 * fVar142;
        auVar129._12_4_ = fVar269 * fVar269 + fVar144 * fVar144;
        auVar129._16_4_ = fVar271 * fVar271 + fVar146 * fVar146;
        auVar129._20_4_ = fVar273 * fVar273 + fVar148 * fVar148;
        auVar129._24_4_ = fVar248 * fVar248 + fVar151 * fVar151;
        auVar129._28_4_ = auVar137._28_4_ + auVar198._28_4_;
        auVar137 = vrsqrtps_avx(auVar129);
        fVar233 = auVar137._0_4_;
        fVar244 = auVar137._4_4_;
        auVar22._4_4_ = fVar244 * 1.5;
        auVar22._0_4_ = fVar233 * 1.5;
        fVar152 = auVar137._8_4_;
        auVar22._8_4_ = fVar152 * 1.5;
        fVar203 = auVar137._12_4_;
        auVar22._12_4_ = fVar203 * 1.5;
        fVar204 = auVar137._16_4_;
        auVar22._16_4_ = fVar204 * 1.5;
        fVar205 = auVar137._20_4_;
        auVar22._20_4_ = fVar205 * 1.5;
        fVar206 = auVar137._24_4_;
        auVar22._24_4_ = fVar206 * 1.5;
        auVar22._28_4_ = fVar298;
        auVar23._4_4_ = fVar244 * fVar244 * fVar244 * auVar129._4_4_ * 0.5;
        auVar23._0_4_ = fVar233 * fVar233 * fVar233 * auVar129._0_4_ * 0.5;
        auVar23._8_4_ = fVar152 * fVar152 * fVar152 * auVar129._8_4_ * 0.5;
        auVar23._12_4_ = fVar203 * fVar203 * fVar203 * auVar129._12_4_ * 0.5;
        auVar23._16_4_ = fVar204 * fVar204 * fVar204 * auVar129._16_4_ * 0.5;
        auVar23._20_4_ = fVar205 * fVar205 * fVar205 * auVar129._20_4_ * 0.5;
        auVar23._24_4_ = fVar206 * fVar206 * fVar206 * auVar129._24_4_ * 0.5;
        auVar23._28_4_ = auVar129._28_4_;
        auVar137 = vsubps_avx(auVar22,auVar23);
        fVar233 = auVar137._0_4_;
        fVar244 = auVar137._4_4_;
        fVar152 = auVar137._8_4_;
        fVar203 = auVar137._12_4_;
        fVar204 = auVar137._16_4_;
        fVar205 = auVar137._20_4_;
        fVar206 = auVar137._24_4_;
        fVar220 = fVar155 * fVar220 * fVar189;
        fVar202 = fVar167 * fVar202 * fVar235;
        auVar20._4_4_ = fVar202;
        auVar20._0_4_ = fVar220;
        fVar246 = fVar168 * fVar246 * fVar300;
        auVar20._8_4_ = fVar246;
        fVar154 = fVar169 * fVar154 * fVar268;
        auVar20._12_4_ = fVar154;
        fVar259 = fVar170 * fVar259 * fVar270;
        auVar20._16_4_ = fVar259;
        fVar260 = fVar171 * fVar260 * fVar272;
        auVar20._20_4_ = fVar260;
        fVar261 = fVar172 * fVar261 * fVar153;
        auVar20._24_4_ = fVar261;
        auVar20._28_4_ = fVar188;
        local_760._4_4_ = auVar302._4_4_ + fVar202;
        local_760._0_4_ = auVar302._0_4_ + fVar220;
        fStack_758 = auVar302._8_4_ + fVar246;
        fStack_754 = auVar302._12_4_ + fVar154;
        fStack_750 = auVar302._16_4_ + fVar259;
        fStack_74c = auVar302._20_4_ + fVar260;
        fStack_748 = auVar302._24_4_ + fVar261;
        fStack_744 = auVar302._28_4_ + fVar188;
        fVar220 = fVar155 * fVar189 * -fVar121;
        fVar202 = fVar167 * fVar235 * -fVar140;
        auVar25._4_4_ = fVar202;
        auVar25._0_4_ = fVar220;
        fVar246 = fVar168 * fVar300 * -fVar141;
        auVar25._8_4_ = fVar246;
        fVar154 = fVar169 * fVar268 * -fVar143;
        auVar25._12_4_ = fVar154;
        fVar259 = fVar170 * fVar270 * -fVar145;
        auVar25._16_4_ = fVar259;
        fVar260 = fVar171 * fVar272 * -fVar147;
        auVar25._20_4_ = fVar260;
        fVar261 = fVar172 * fVar153 * -fVar150;
        auVar25._24_4_ = fVar261;
        auVar25._28_4_ = fVar298;
        local_4e0._4_4_ = fVar202 + auVar264._4_4_;
        local_4e0._0_4_ = fVar220 + auVar264._0_4_;
        fStack_4d8 = fVar246 + auVar264._8_4_;
        fStack_4d4 = fVar154 + auVar264._12_4_;
        auStack_4d0._0_4_ = fVar259 + auVar264._16_4_;
        auStack_4d0._4_4_ = fVar260 + auVar264._20_4_;
        fStack_4c8 = fVar261 + auVar264._24_4_;
        fStack_4c4 = fVar298 + 0.0;
        fVar220 = fVar155 * fVar189 * 0.0;
        fVar189 = fVar167 * fVar235 * 0.0;
        auVar26._4_4_ = fVar189;
        auVar26._0_4_ = fVar220;
        fVar202 = fVar168 * fVar300 * 0.0;
        auVar26._8_4_ = fVar202;
        fVar235 = fVar169 * fVar268 * 0.0;
        auVar26._12_4_ = fVar235;
        fVar246 = fVar170 * fVar270 * 0.0;
        auVar26._16_4_ = fVar246;
        fVar300 = fVar171 * fVar272 * 0.0;
        auVar26._20_4_ = fVar300;
        fVar154 = fVar172 * fVar153 * 0.0;
        auVar26._24_4_ = fVar154;
        auVar26._28_4_ = fVar234;
        auVar240._0_4_ = fVar220 + (float)local_640._0_4_;
        auVar240._4_4_ = fVar189 + (float)local_640._4_4_;
        auVar240._8_4_ = fVar202 + fStack_638;
        auVar240._12_4_ = fVar235 + fStack_634;
        auVar240._16_4_ = fVar246 + fStack_630;
        auVar240._20_4_ = fVar300 + fStack_62c;
        auVar240._24_4_ = fVar154 + fStack_628;
        auVar240._28_4_ = fVar234 + fStack_624;
        fVar220 = auVar226._0_4_ * fVar200 * fVar233;
        fVar189 = auVar226._4_4_ * fVar242 * fVar244;
        auVar27._4_4_ = fVar189;
        auVar27._0_4_ = fVar220;
        fVar200 = auVar226._8_4_ * fVar149 * fVar152;
        auVar27._8_4_ = fVar200;
        fVar202 = auVar226._12_4_ * fVar269 * fVar203;
        auVar27._12_4_ = fVar202;
        fVar235 = auVar226._16_4_ * fVar271 * fVar204;
        auVar27._16_4_ = fVar235;
        fVar242 = auVar226._20_4_ * fVar273 * fVar205;
        auVar27._20_4_ = fVar242;
        fVar246 = auVar226._24_4_ * fVar248 * fVar206;
        auVar27._24_4_ = fVar246;
        auVar27._28_4_ = auVar19._28_4_;
        auVar17 = vsubps_avx(auVar302,auVar20);
        auVar278._0_4_ = auVar212._0_4_ + fVar220;
        auVar278._4_4_ = auVar212._4_4_ + fVar189;
        auVar278._8_4_ = auVar212._8_4_ + fVar200;
        auVar278._12_4_ = auVar212._12_4_ + fVar202;
        auVar278._16_4_ = auVar212._16_4_ + fVar235;
        auVar278._20_4_ = auVar212._20_4_ + fVar242;
        auVar278._24_4_ = auVar212._24_4_ + fVar246;
        auVar278._28_4_ = auVar212._28_4_ + auVar19._28_4_;
        fVar220 = auVar226._0_4_ * fVar233 * -fVar122;
        fVar189 = auVar226._4_4_ * fVar244 * -fVar187;
        auVar19._4_4_ = fVar189;
        auVar19._0_4_ = fVar220;
        fVar200 = auVar226._8_4_ * fVar152 * -fVar142;
        auVar19._8_4_ = fVar200;
        fVar202 = auVar226._12_4_ * fVar203 * -fVar144;
        auVar19._12_4_ = fVar202;
        fVar235 = auVar226._16_4_ * fVar204 * -fVar146;
        auVar19._16_4_ = fVar235;
        fVar242 = auVar226._20_4_ * fVar205 * -fVar148;
        auVar19._20_4_ = fVar242;
        fVar246 = auVar226._24_4_ * fVar206 * -fVar151;
        auVar19._24_4_ = fVar246;
        auVar19._28_4_ = fVar286;
        auVar193 = vsubps_avx(auVar264,auVar25);
        auVar288._0_4_ = fVar220 + (float)local_620._0_4_;
        auVar288._4_4_ = fVar189 + (float)local_620._4_4_;
        auVar288._8_4_ = fVar200 + fStack_618;
        auVar288._12_4_ = fVar202 + fStack_614;
        auVar288._16_4_ = fVar235 + fStack_610;
        auVar288._20_4_ = fVar242 + fStack_60c;
        auVar288._24_4_ = fVar246 + fStack_608;
        auVar288._28_4_ = fVar286 + fStack_604;
        fVar220 = auVar226._0_4_ * fVar233 * 0.0;
        fVar189 = auVar226._4_4_ * fVar244 * 0.0;
        auVar28._4_4_ = fVar189;
        auVar28._0_4_ = fVar220;
        fVar200 = auVar226._8_4_ * fVar152 * 0.0;
        auVar28._8_4_ = fVar200;
        fVar233 = auVar226._12_4_ * fVar203 * 0.0;
        auVar28._12_4_ = fVar233;
        fVar202 = auVar226._16_4_ * fVar204 * 0.0;
        auVar28._16_4_ = fVar202;
        fVar235 = auVar226._20_4_ * fVar205 * 0.0;
        auVar28._20_4_ = fVar235;
        fVar242 = auVar226._24_4_ * fVar206 * 0.0;
        auVar28._24_4_ = fVar242;
        auVar28._28_4_ = 0x3f000000;
        auVar21 = vsubps_avx(_local_640,auVar26);
        auVar317._0_4_ = fVar220 + (float)local_360._0_4_;
        auVar317._4_4_ = fVar189 + (float)local_360._4_4_;
        auVar317._8_4_ = fVar200 + fStack_358;
        auVar317._12_4_ = fVar233 + fStack_354;
        auVar317._16_4_ = fVar202 + fStack_350;
        auVar317._20_4_ = fVar235 + fStack_34c;
        auVar317._24_4_ = fVar242 + fStack_348;
        auVar317._28_4_ = fStack_344 + 0.5;
        auVar137 = vsubps_avx(auVar212,auVar27);
        auVar198 = vsubps_avx(_local_620,auVar19);
        auVar22 = vsubps_avx(_local_360,auVar28);
        auVar19 = vsubps_avx(auVar288,auVar193);
        auVar289 = vsubps_avx(auVar317,auVar21);
        auVar29._4_4_ = auVar21._4_4_ * auVar19._4_4_;
        auVar29._0_4_ = auVar21._0_4_ * auVar19._0_4_;
        auVar29._8_4_ = auVar21._8_4_ * auVar19._8_4_;
        auVar29._12_4_ = auVar21._12_4_ * auVar19._12_4_;
        auVar29._16_4_ = auVar21._16_4_ * auVar19._16_4_;
        auVar29._20_4_ = auVar21._20_4_ * auVar19._20_4_;
        auVar29._24_4_ = auVar21._24_4_ * auVar19._24_4_;
        auVar29._28_4_ = fVar219;
        auVar30._4_4_ = auVar193._4_4_ * auVar289._4_4_;
        auVar30._0_4_ = auVar193._0_4_ * auVar289._0_4_;
        auVar30._8_4_ = auVar193._8_4_ * auVar289._8_4_;
        auVar30._12_4_ = auVar193._12_4_ * auVar289._12_4_;
        auVar30._16_4_ = auVar193._16_4_ * auVar289._16_4_;
        auVar30._20_4_ = auVar193._20_4_ * auVar289._20_4_;
        auVar30._24_4_ = auVar193._24_4_ * auVar289._24_4_;
        auVar30._28_4_ = fStack_604;
        auVar24 = vsubps_avx(auVar30,auVar29);
        auVar31._4_4_ = auVar17._4_4_ * auVar289._4_4_;
        auVar31._0_4_ = auVar17._0_4_ * auVar289._0_4_;
        auVar31._8_4_ = auVar17._8_4_ * auVar289._8_4_;
        auVar31._12_4_ = auVar17._12_4_ * auVar289._12_4_;
        auVar31._16_4_ = auVar17._16_4_ * auVar289._16_4_;
        auVar31._20_4_ = auVar17._20_4_ * auVar289._20_4_;
        auVar31._24_4_ = auVar17._24_4_ * auVar289._24_4_;
        auVar31._28_4_ = auVar289._28_4_;
        auVar325 = vsubps_avx(auVar278,auVar17);
        auVar32._4_4_ = auVar21._4_4_ * auVar325._4_4_;
        auVar32._0_4_ = auVar21._0_4_ * auVar325._0_4_;
        auVar32._8_4_ = auVar21._8_4_ * auVar325._8_4_;
        auVar32._12_4_ = auVar21._12_4_ * auVar325._12_4_;
        auVar32._16_4_ = auVar21._16_4_ * auVar325._16_4_;
        auVar32._20_4_ = auVar21._20_4_ * auVar325._20_4_;
        auVar32._24_4_ = auVar21._24_4_ * auVar325._24_4_;
        auVar32._28_4_ = auVar212._28_4_;
        auVar212 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = auVar325._4_4_ * auVar193._4_4_;
        auVar33._0_4_ = auVar325._0_4_ * auVar193._0_4_;
        auVar33._8_4_ = auVar325._8_4_ * auVar193._8_4_;
        auVar33._12_4_ = auVar325._12_4_ * auVar193._12_4_;
        auVar33._16_4_ = auVar325._16_4_ * auVar193._16_4_;
        auVar33._20_4_ = auVar325._20_4_ * auVar193._20_4_;
        auVar33._24_4_ = auVar325._24_4_ * auVar193._24_4_;
        auVar33._28_4_ = auVar289._28_4_;
        auVar34._4_4_ = auVar17._4_4_ * auVar19._4_4_;
        auVar34._0_4_ = auVar17._0_4_ * auVar19._0_4_;
        auVar34._8_4_ = auVar17._8_4_ * auVar19._8_4_;
        auVar34._12_4_ = auVar17._12_4_ * auVar19._12_4_;
        auVar34._16_4_ = auVar17._16_4_ * auVar19._16_4_;
        auVar34._20_4_ = auVar17._20_4_ * auVar19._20_4_;
        auVar34._24_4_ = auVar17._24_4_ * auVar19._24_4_;
        auVar34._28_4_ = auVar19._28_4_;
        auVar19 = vsubps_avx(auVar34,auVar33);
        auVar130._0_4_ = auVar24._0_4_ * 0.0 + auVar19._0_4_ + auVar212._0_4_ * 0.0;
        auVar130._4_4_ = auVar24._4_4_ * 0.0 + auVar19._4_4_ + auVar212._4_4_ * 0.0;
        auVar130._8_4_ = auVar24._8_4_ * 0.0 + auVar19._8_4_ + auVar212._8_4_ * 0.0;
        auVar130._12_4_ = auVar24._12_4_ * 0.0 + auVar19._12_4_ + auVar212._12_4_ * 0.0;
        auVar130._16_4_ = auVar24._16_4_ * 0.0 + auVar19._16_4_ + auVar212._16_4_ * 0.0;
        auVar130._20_4_ = auVar24._20_4_ * 0.0 + auVar19._20_4_ + auVar212._20_4_ * 0.0;
        auVar130._24_4_ = auVar24._24_4_ * 0.0 + auVar19._24_4_ + auVar212._24_4_ * 0.0;
        auVar130._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar212._28_4_;
        auVar264 = vcmpps_avx(auVar130,ZEXT432(0) << 0x20,2);
        auVar137 = vblendvps_avx(auVar137,_local_760,auVar264);
        auVar198 = vblendvps_avx(auVar198,_local_4e0,auVar264);
        auVar19 = vblendvps_avx(auVar22,auVar240,auVar264);
        auVar289 = vblendvps_avx(auVar17,auVar278,auVar264);
        auVar24 = vblendvps_avx(auVar193,auVar288,auVar264);
        auVar325 = vblendvps_avx(auVar21,auVar317,auVar264);
        auVar17 = vblendvps_avx(auVar278,auVar17,auVar264);
        auVar193 = vblendvps_avx(auVar288,auVar193,auVar264);
        auVar225 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        _auStack_6f0 = auVar302._16_16_;
        auVar212 = vblendvps_avx(auVar317,auVar21,auVar264);
        auVar17 = vsubps_avx(auVar17,auVar137);
        auVar302 = vsubps_avx(auVar193,auVar198);
        auVar212 = vsubps_avx(auVar212,auVar19);
        auVar21 = vsubps_avx(auVar198,auVar24);
        fVar220 = auVar302._0_4_;
        fVar150 = auVar19._0_4_;
        fVar235 = auVar302._4_4_;
        fVar122 = auVar19._4_4_;
        auVar35._4_4_ = fVar122 * fVar235;
        auVar35._0_4_ = fVar150 * fVar220;
        fVar149 = auVar302._8_4_;
        fVar187 = auVar19._8_4_;
        auVar35._8_4_ = fVar187 * fVar149;
        fVar203 = auVar302._12_4_;
        fVar142 = auVar19._12_4_;
        auVar35._12_4_ = fVar142 * fVar203;
        fVar260 = auVar302._16_4_;
        fVar144 = auVar19._16_4_;
        auVar35._16_4_ = fVar144 * fVar260;
        fVar153 = auVar302._20_4_;
        fVar146 = auVar19._20_4_;
        auVar35._20_4_ = fVar146 * fVar153;
        fVar140 = auVar302._24_4_;
        fVar148 = auVar19._24_4_;
        auVar35._24_4_ = fVar148 * fVar140;
        auVar35._28_4_ = auVar193._28_4_;
        fVar189 = auVar198._0_4_;
        fVar230 = auVar212._0_4_;
        fVar242 = auVar198._4_4_;
        fVar232 = auVar212._4_4_;
        auVar36._4_4_ = fVar232 * fVar242;
        auVar36._0_4_ = fVar230 * fVar189;
        fVar152 = auVar198._8_4_;
        fVar234 = auVar212._8_4_;
        auVar36._8_4_ = fVar234 * fVar152;
        fVar259 = auVar198._12_4_;
        fVar236 = auVar212._12_4_;
        auVar36._12_4_ = fVar236 * fVar259;
        fVar272 = auVar198._16_4_;
        fVar243 = auVar212._16_4_;
        auVar36._16_4_ = fVar243 * fVar272;
        fVar248 = auVar198._20_4_;
        fVar245 = auVar212._20_4_;
        auVar36._20_4_ = fVar245 * fVar248;
        fVar141 = auVar198._24_4_;
        fVar247 = auVar212._24_4_;
        uVar8 = auVar22._28_4_;
        auVar36._24_4_ = fVar247 * fVar141;
        auVar36._28_4_ = uVar8;
        auVar193 = vsubps_avx(auVar36,auVar35);
        fVar200 = auVar137._0_4_;
        fVar244 = auVar137._4_4_;
        auVar37._4_4_ = fVar232 * fVar244;
        auVar37._0_4_ = fVar230 * fVar200;
        fVar154 = auVar137._8_4_;
        auVar37._8_4_ = fVar234 * fVar154;
        fVar270 = auVar137._12_4_;
        auVar37._12_4_ = fVar236 * fVar270;
        fVar273 = auVar137._16_4_;
        auVar37._16_4_ = fVar243 * fVar273;
        fVar206 = auVar137._20_4_;
        auVar37._20_4_ = fVar245 * fVar206;
        fVar143 = auVar137._24_4_;
        auVar37._24_4_ = fVar247 * fVar143;
        auVar37._28_4_ = uVar8;
        fVar233 = auVar17._0_4_;
        fVar246 = auVar17._4_4_;
        auVar38._4_4_ = fVar122 * fVar246;
        auVar38._0_4_ = fVar150 * fVar233;
        fVar268 = auVar17._8_4_;
        auVar38._8_4_ = fVar187 * fVar268;
        fVar271 = auVar17._12_4_;
        auVar38._12_4_ = fVar142 * fVar271;
        fVar205 = auVar17._16_4_;
        auVar38._16_4_ = fVar144 * fVar205;
        fVar298 = auVar17._20_4_;
        auVar38._20_4_ = fVar146 * fVar298;
        fVar145 = auVar17._24_4_;
        auVar38._24_4_ = fVar148 * fVar145;
        auVar38._28_4_ = auVar317._28_4_;
        auVar22 = vsubps_avx(auVar38,auVar37);
        auVar39._4_4_ = fVar242 * fVar246;
        auVar39._0_4_ = fVar189 * fVar233;
        auVar39._8_4_ = fVar152 * fVar268;
        auVar39._12_4_ = fVar259 * fVar271;
        auVar39._16_4_ = fVar272 * fVar205;
        auVar39._20_4_ = fVar248 * fVar298;
        auVar39._24_4_ = fVar141 * fVar145;
        auVar39._28_4_ = uVar8;
        auVar323._0_4_ = fVar200 * fVar220;
        auVar323._4_4_ = fVar244 * fVar235;
        auVar323._8_4_ = fVar154 * fVar149;
        auVar323._12_4_ = fVar270 * fVar203;
        auVar323._16_4_ = fVar273 * fVar260;
        auVar323._20_4_ = fVar206 * fVar153;
        auVar323._24_4_ = fVar143 * fVar140;
        auVar323._28_4_ = 0;
        auVar23 = vsubps_avx(auVar323,auVar39);
        auVar20 = vsubps_avx(auVar19,auVar325);
        fVar202 = auVar23._28_4_ + auVar22._28_4_;
        auVar161._0_4_ = auVar23._0_4_ + auVar22._0_4_ * 0.0 + auVar193._0_4_ * 0.0;
        auVar161._4_4_ = auVar23._4_4_ + auVar22._4_4_ * 0.0 + auVar193._4_4_ * 0.0;
        auVar161._8_4_ = auVar23._8_4_ + auVar22._8_4_ * 0.0 + auVar193._8_4_ * 0.0;
        auVar161._12_4_ = auVar23._12_4_ + auVar22._12_4_ * 0.0 + auVar193._12_4_ * 0.0;
        auVar161._16_4_ = auVar23._16_4_ + auVar22._16_4_ * 0.0 + auVar193._16_4_ * 0.0;
        auVar161._20_4_ = auVar23._20_4_ + auVar22._20_4_ * 0.0 + auVar193._20_4_ * 0.0;
        auVar161._24_4_ = auVar23._24_4_ + auVar22._24_4_ * 0.0 + auVar193._24_4_ * 0.0;
        auVar161._28_4_ = fVar202 + auVar193._28_4_;
        fVar151 = auVar21._0_4_;
        fVar188 = auVar21._4_4_;
        auVar40._4_4_ = fVar188 * auVar325._4_4_;
        auVar40._0_4_ = fVar151 * auVar325._0_4_;
        fVar207 = auVar21._8_4_;
        auVar40._8_4_ = fVar207 * auVar325._8_4_;
        fVar217 = auVar21._12_4_;
        auVar40._12_4_ = fVar217 * auVar325._12_4_;
        fVar218 = auVar21._16_4_;
        auVar40._16_4_ = fVar218 * auVar325._16_4_;
        fVar219 = auVar21._20_4_;
        auVar40._20_4_ = fVar219 * auVar325._20_4_;
        fVar221 = auVar21._24_4_;
        auVar40._24_4_ = fVar221 * auVar325._24_4_;
        auVar40._28_4_ = fVar202;
        fVar202 = auVar20._0_4_;
        fVar300 = auVar20._4_4_;
        auVar41._4_4_ = auVar24._4_4_ * fVar300;
        auVar41._0_4_ = auVar24._0_4_ * fVar202;
        fVar269 = auVar20._8_4_;
        auVar41._8_4_ = auVar24._8_4_ * fVar269;
        fVar204 = auVar20._12_4_;
        auVar41._12_4_ = auVar24._12_4_ * fVar204;
        fVar261 = auVar20._16_4_;
        auVar41._16_4_ = auVar24._16_4_ * fVar261;
        fVar121 = auVar20._20_4_;
        auVar41._20_4_ = auVar24._20_4_ * fVar121;
        fVar147 = auVar20._24_4_;
        auVar41._24_4_ = auVar24._24_4_ * fVar147;
        auVar41._28_4_ = auVar23._28_4_;
        auVar21 = vsubps_avx(auVar41,auVar40);
        auVar22 = vsubps_avx(auVar137,auVar289);
        fVar249 = auVar22._0_4_;
        fVar256 = auVar22._4_4_;
        auVar42._4_4_ = fVar256 * auVar325._4_4_;
        auVar42._0_4_ = fVar249 * auVar325._0_4_;
        fVar257 = auVar22._8_4_;
        auVar42._8_4_ = fVar257 * auVar325._8_4_;
        fVar258 = auVar22._12_4_;
        auVar42._12_4_ = fVar258 * auVar325._12_4_;
        fVar274 = auVar22._16_4_;
        auVar42._16_4_ = fVar274 * auVar325._16_4_;
        fVar275 = auVar22._20_4_;
        auVar42._20_4_ = fVar275 * auVar325._20_4_;
        fVar281 = auVar22._24_4_;
        auVar42._24_4_ = fVar281 * auVar325._24_4_;
        auVar42._28_4_ = auVar325._28_4_;
        auVar43._4_4_ = auVar289._4_4_ * fVar300;
        auVar43._0_4_ = auVar289._0_4_ * fVar202;
        auVar43._8_4_ = auVar289._8_4_ * fVar269;
        auVar43._12_4_ = auVar289._12_4_ * fVar204;
        auVar43._16_4_ = auVar289._16_4_ * fVar261;
        auVar43._20_4_ = auVar289._20_4_ * fVar121;
        auVar43._24_4_ = auVar289._24_4_ * fVar147;
        auVar43._28_4_ = auVar193._28_4_;
        auVar193 = vsubps_avx(auVar42,auVar43);
        auVar44._4_4_ = auVar24._4_4_ * fVar256;
        auVar44._0_4_ = auVar24._0_4_ * fVar249;
        auVar44._8_4_ = auVar24._8_4_ * fVar257;
        auVar44._12_4_ = auVar24._12_4_ * fVar258;
        auVar44._16_4_ = auVar24._16_4_ * fVar274;
        auVar44._20_4_ = auVar24._20_4_ * fVar275;
        auVar44._24_4_ = auVar24._24_4_ * fVar281;
        auVar44._28_4_ = auVar325._28_4_;
        auVar45._4_4_ = auVar289._4_4_ * fVar188;
        auVar45._0_4_ = auVar289._0_4_ * fVar151;
        auVar45._8_4_ = auVar289._8_4_ * fVar207;
        auVar45._12_4_ = auVar289._12_4_ * fVar217;
        auVar45._16_4_ = auVar289._16_4_ * fVar218;
        auVar45._20_4_ = auVar289._20_4_ * fVar219;
        auVar45._24_4_ = auVar289._24_4_ * fVar221;
        auVar45._28_4_ = auVar289._28_4_;
        auVar289 = vsubps_avx(auVar45,auVar44);
        auVar292 = ZEXT864(0) << 0x20;
        auVar214._0_4_ = auVar21._0_4_ * 0.0 + auVar289._0_4_ + auVar193._0_4_ * 0.0;
        auVar214._4_4_ = auVar21._4_4_ * 0.0 + auVar289._4_4_ + auVar193._4_4_ * 0.0;
        auVar214._8_4_ = auVar21._8_4_ * 0.0 + auVar289._8_4_ + auVar193._8_4_ * 0.0;
        auVar214._12_4_ = auVar21._12_4_ * 0.0 + auVar289._12_4_ + auVar193._12_4_ * 0.0;
        auVar214._16_4_ = auVar21._16_4_ * 0.0 + auVar289._16_4_ + auVar193._16_4_ * 0.0;
        auVar214._20_4_ = auVar21._20_4_ * 0.0 + auVar289._20_4_ + auVar193._20_4_ * 0.0;
        auVar214._24_4_ = auVar21._24_4_ * 0.0 + auVar289._24_4_ + auVar193._24_4_ * 0.0;
        auVar214._28_4_ = auVar289._28_4_ + auVar289._28_4_ + auVar193._28_4_;
        auVar289 = vmaxps_avx(auVar161,auVar214);
        auVar289 = vcmpps_avx(auVar289,ZEXT832(0) << 0x20,2);
        auVar181 = vpackssdw_avx(auVar289._0_16_,auVar289._16_16_);
        auVar225 = vpand_avx(auVar181,auVar225);
        auVar181 = vpmovsxwd_avx(auVar225);
        auVar211 = vpunpckhwd_avx(auVar225,auVar225);
        auVar194._16_16_ = auVar211;
        auVar194._0_16_ = auVar181;
        if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar194 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar194 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar194 >> 0x7f,0) == '\0') &&
              (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar211 >> 0x3f,0) == '\0') &&
            (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar211[0xf]) {
LAB_00ed553a:
          auVar318 = ZEXT3264(auVar132);
          auVar199 = ZEXT3264(auVar194);
          auVar139 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          auVar267 = ZEXT3264(CONCAT428(fVar173,CONCAT424(fVar172,CONCAT420(fVar171,CONCAT416(
                                                  fVar170,CONCAT412(fVar169,CONCAT48(fVar168,
                                                  CONCAT44(fVar167,fVar155))))))));
        }
        else {
          auVar46._4_4_ = fVar300 * fVar235;
          auVar46._0_4_ = fVar202 * fVar220;
          auVar46._8_4_ = fVar269 * fVar149;
          auVar46._12_4_ = fVar204 * fVar203;
          auVar46._16_4_ = fVar261 * fVar260;
          auVar46._20_4_ = fVar121 * fVar153;
          auVar46._24_4_ = fVar147 * fVar140;
          auVar46._28_4_ = auVar211._12_4_;
          auVar303._0_4_ = fVar151 * fVar230;
          auVar303._4_4_ = fVar188 * fVar232;
          auVar303._8_4_ = fVar207 * fVar234;
          auVar303._12_4_ = fVar217 * fVar236;
          auVar303._16_4_ = fVar218 * fVar243;
          auVar303._20_4_ = fVar219 * fVar245;
          auVar303._24_4_ = fVar221 * fVar247;
          auVar303._28_4_ = 0;
          auVar289 = vsubps_avx(auVar303,auVar46);
          auVar47._4_4_ = fVar256 * fVar232;
          auVar47._0_4_ = fVar249 * fVar230;
          auVar47._8_4_ = fVar257 * fVar234;
          auVar47._12_4_ = fVar258 * fVar236;
          auVar47._16_4_ = fVar274 * fVar243;
          auVar47._20_4_ = fVar275 * fVar245;
          auVar47._24_4_ = fVar281 * fVar247;
          auVar47._28_4_ = auVar212._28_4_;
          auVar48._4_4_ = fVar300 * fVar246;
          auVar48._0_4_ = fVar202 * fVar233;
          auVar48._8_4_ = fVar269 * fVar268;
          auVar48._12_4_ = fVar204 * fVar271;
          auVar48._16_4_ = fVar261 * fVar205;
          auVar48._20_4_ = fVar121 * fVar298;
          auVar48._24_4_ = fVar147 * fVar145;
          auVar48._28_4_ = auVar20._28_4_;
          auVar325 = vsubps_avx(auVar48,auVar47);
          auVar49._4_4_ = fVar188 * fVar246;
          auVar49._0_4_ = fVar151 * fVar233;
          auVar49._8_4_ = fVar207 * fVar268;
          auVar49._12_4_ = fVar217 * fVar271;
          auVar49._16_4_ = fVar218 * fVar205;
          auVar49._20_4_ = fVar219 * fVar298;
          auVar49._24_4_ = fVar221 * fVar145;
          auVar49._28_4_ = auVar161._28_4_;
          auVar50._4_4_ = fVar256 * fVar235;
          auVar50._0_4_ = fVar249 * fVar220;
          auVar50._8_4_ = fVar257 * fVar149;
          auVar50._12_4_ = fVar258 * fVar203;
          auVar50._16_4_ = fVar274 * fVar260;
          auVar50._20_4_ = fVar275 * fVar153;
          auVar50._24_4_ = fVar281 * fVar140;
          auVar50._28_4_ = auVar302._28_4_;
          auVar193 = vsubps_avx(auVar50,auVar49);
          auVar254._0_4_ = auVar289._0_4_ * 0.0 + auVar193._0_4_ + auVar325._0_4_ * 0.0;
          auVar254._4_4_ = auVar289._4_4_ * 0.0 + auVar193._4_4_ + auVar325._4_4_ * 0.0;
          auVar254._8_4_ = auVar289._8_4_ * 0.0 + auVar193._8_4_ + auVar325._8_4_ * 0.0;
          auVar254._12_4_ = auVar289._12_4_ * 0.0 + auVar193._12_4_ + auVar325._12_4_ * 0.0;
          auVar254._16_4_ = auVar289._16_4_ * 0.0 + auVar193._16_4_ + auVar325._16_4_ * 0.0;
          auVar254._20_4_ = auVar289._20_4_ * 0.0 + auVar193._20_4_ + auVar325._20_4_ * 0.0;
          auVar254._24_4_ = auVar289._24_4_ * 0.0 + auVar193._24_4_ + auVar325._24_4_ * 0.0;
          auVar254._28_4_ = auVar302._28_4_ + auVar193._28_4_ + auVar161._28_4_;
          auVar24 = vrcpps_avx(auVar254);
          fVar220 = auVar24._0_4_;
          fVar233 = auVar24._4_4_;
          auVar51._4_4_ = auVar254._4_4_ * fVar233;
          auVar51._0_4_ = auVar254._0_4_ * fVar220;
          fVar202 = auVar24._8_4_;
          auVar51._8_4_ = auVar254._8_4_ * fVar202;
          fVar235 = auVar24._12_4_;
          auVar51._12_4_ = auVar254._12_4_ * fVar235;
          fVar246 = auVar24._16_4_;
          auVar51._16_4_ = auVar254._16_4_ * fVar246;
          fVar300 = auVar24._20_4_;
          auVar51._20_4_ = auVar254._20_4_ * fVar300;
          fVar149 = auVar24._24_4_;
          auVar51._24_4_ = auVar254._24_4_ * fVar149;
          auVar51._28_4_ = auVar20._28_4_;
          auVar304._8_4_ = 0x3f800000;
          auVar304._0_8_ = 0x3f8000003f800000;
          auVar304._12_4_ = 0x3f800000;
          auVar304._16_4_ = 0x3f800000;
          auVar304._20_4_ = 0x3f800000;
          auVar304._24_4_ = 0x3f800000;
          auVar304._28_4_ = 0x3f800000;
          auVar212 = vsubps_avx(auVar304,auVar51);
          fVar220 = auVar212._0_4_ * fVar220 + fVar220;
          fVar233 = auVar212._4_4_ * fVar233 + fVar233;
          fVar202 = auVar212._8_4_ * fVar202 + fVar202;
          fVar235 = auVar212._12_4_ * fVar235 + fVar235;
          fVar246 = auVar212._16_4_ * fVar246 + fVar246;
          fVar300 = auVar212._20_4_ * fVar300 + fVar300;
          fVar149 = auVar212._24_4_ * fVar149 + fVar149;
          auVar52._4_4_ =
               (auVar289._4_4_ * fVar244 + auVar325._4_4_ * fVar242 + auVar193._4_4_ * fVar122) *
               fVar233;
          auVar52._0_4_ =
               (auVar289._0_4_ * fVar200 + auVar325._0_4_ * fVar189 + auVar193._0_4_ * fVar150) *
               fVar220;
          auVar52._8_4_ =
               (auVar289._8_4_ * fVar154 + auVar325._8_4_ * fVar152 + auVar193._8_4_ * fVar187) *
               fVar202;
          auVar52._12_4_ =
               (auVar289._12_4_ * fVar270 + auVar325._12_4_ * fVar259 + auVar193._12_4_ * fVar142) *
               fVar235;
          auVar52._16_4_ =
               (auVar289._16_4_ * fVar273 + auVar325._16_4_ * fVar272 + auVar193._16_4_ * fVar144) *
               fVar246;
          auVar52._20_4_ =
               (auVar289._20_4_ * fVar206 + auVar325._20_4_ * fVar248 + auVar193._20_4_ * fVar146) *
               fVar300;
          auVar52._24_4_ =
               (auVar289._24_4_ * fVar143 + auVar325._24_4_ * fVar141 + auVar193._24_4_ * fVar148) *
               fVar149;
          auVar52._28_4_ = auVar17._28_4_ + auVar19._28_4_;
          auVar181 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
          auVar131._16_16_ = auVar181;
          auVar131._0_16_ = auVar181;
          auVar19 = vcmpps_avx(auVar131,auVar52,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar195._4_4_ = uVar8;
          auVar195._0_4_ = uVar8;
          auVar195._8_4_ = uVar8;
          auVar195._12_4_ = uVar8;
          auVar195._16_4_ = uVar8;
          auVar195._20_4_ = uVar8;
          auVar195._24_4_ = uVar8;
          auVar195._28_4_ = uVar8;
          auVar289 = vcmpps_avx(auVar52,auVar195,2);
          auVar19 = vandps_avx(auVar289,auVar19);
          auVar181 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
          auVar225 = vpand_avx(auVar225,auVar181);
          auVar181 = vpmovsxwd_avx(auVar225);
          auVar211 = vpshufd_avx(auVar225,0xee);
          auVar211 = vpmovsxwd_avx(auVar211);
          auVar194._16_16_ = auVar211;
          auVar194._0_16_ = auVar181;
          auVar318 = ZEXT3264(auVar132);
          if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar194 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar194 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar194 >> 0x7f,0) == '\0') &&
                (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar211 >> 0x3f,0) == '\0') &&
              (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar211[0xf]) goto LAB_00ed553a;
          auVar132 = vcmpps_avx(ZEXT832(0) << 0x20,auVar254,4);
          auVar181 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
          auVar225 = vpand_avx(auVar225,auVar181);
          auVar181 = vpmovsxwd_avx(auVar225);
          auVar199 = ZEXT1664(auVar181);
          auVar225 = vpunpckhwd_avx(auVar225,auVar225);
          auVar132._16_16_ = auVar225;
          auVar132._0_16_ = auVar181;
          auVar139 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          auVar267 = ZEXT3264(CONCAT428(fVar173,CONCAT424(fVar172,CONCAT420(fVar171,CONCAT416(
                                                  fVar170,CONCAT412(fVar169,CONCAT48(fVar168,
                                                  CONCAT44(fVar167,fVar155))))))));
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar132 >> 0x7f,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar225 >> 0x3f,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar225[0xf] < '\0') {
            auVar53._4_4_ = auVar161._4_4_ * fVar233;
            auVar53._0_4_ = auVar161._0_4_ * fVar220;
            auVar53._8_4_ = auVar161._8_4_ * fVar202;
            auVar53._12_4_ = auVar161._12_4_ * fVar235;
            auVar53._16_4_ = auVar161._16_4_ * fVar246;
            auVar53._20_4_ = auVar161._20_4_ * fVar300;
            auVar53._24_4_ = auVar161._24_4_ * fVar149;
            auVar53._28_4_ = SUB84(uStack_588,4);
            auVar54._4_4_ = auVar214._4_4_ * fVar233;
            auVar54._0_4_ = auVar214._0_4_ * fVar220;
            auVar54._8_4_ = auVar214._8_4_ * fVar202;
            auVar54._12_4_ = auVar214._12_4_ * fVar235;
            auVar54._16_4_ = auVar214._16_4_ * fVar246;
            auVar54._20_4_ = auVar214._20_4_ * fVar300;
            auVar54._24_4_ = auVar214._24_4_ * fVar149;
            auVar54._28_4_ = auVar212._28_4_ + auVar24._28_4_;
            auVar215._8_4_ = 0x3f800000;
            auVar215._0_8_ = 0x3f8000003f800000;
            auVar215._12_4_ = 0x3f800000;
            auVar215._16_4_ = 0x3f800000;
            auVar215._20_4_ = 0x3f800000;
            auVar215._24_4_ = 0x3f800000;
            auVar215._28_4_ = 0x3f800000;
            auVar19 = vsubps_avx(auVar215,auVar53);
            auVar199 = ZEXT3264(auVar19);
            auVar19 = vblendvps_avx(auVar19,auVar53,auVar264);
            auVar318 = ZEXT3264(auVar19);
            auVar19 = vsubps_avx(auVar215,auVar54);
            _local_380 = vblendvps_avx(auVar19,auVar54,auVar264);
            auVar139 = ZEXT3264(auVar132);
            local_4c0 = auVar52;
          }
        }
        auVar255 = ZEXT3264(_local_6a0);
        auVar132 = auVar139._0_32_;
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0x7f,0) != '\0') ||
              (auVar139 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar132 >> 0xbf,0) != '\0') ||
            (auVar139 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar139[0x1f] < '\0') {
          auVar19 = vsubps_avx(auVar226,auVar267._0_32_);
          fVar189 = auVar267._0_4_ + auVar318._0_4_ * auVar19._0_4_;
          fVar200 = auVar267._4_4_ + auVar318._4_4_ * auVar19._4_4_;
          fVar233 = auVar267._8_4_ + auVar318._8_4_ * auVar19._8_4_;
          fVar202 = auVar267._12_4_ + auVar318._12_4_ * auVar19._12_4_;
          fVar235 = auVar267._16_4_ + auVar318._16_4_ * auVar19._16_4_;
          fVar242 = auVar267._20_4_ + auVar318._20_4_ * auVar19._20_4_;
          fVar244 = auVar267._24_4_ + auVar318._24_4_ * auVar19._24_4_;
          fVar246 = auVar267._28_4_ + auVar19._28_4_;
          fVar220 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar55._4_4_ = (fVar200 + fVar200) * fVar220;
          auVar55._0_4_ = (fVar189 + fVar189) * fVar220;
          auVar55._8_4_ = (fVar233 + fVar233) * fVar220;
          auVar55._12_4_ = (fVar202 + fVar202) * fVar220;
          auVar55._16_4_ = (fVar235 + fVar235) * fVar220;
          auVar55._20_4_ = (fVar242 + fVar242) * fVar220;
          auVar55._24_4_ = (fVar244 + fVar244) * fVar220;
          auVar55._28_4_ = fVar246 + fVar246;
          auVar19 = vcmpps_avx(local_4c0,auVar55,6);
          auVar289 = auVar132 & auVar19;
          if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar289 >> 0x7f,0) != '\0') ||
                (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar289 >> 0xbf,0) != '\0') ||
              (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar289[0x1f] < '\0') {
            auVar199 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
            uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
            uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
            uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_660 = auVar318._0_32_;
            local_2e0 = local_660;
            auVar110 = _local_380;
            auVar289 = _local_380;
            local_2c0 = (float)local_380._0_4_;
            fStack_2bc = (float)local_380._4_4_;
            fStack_2b8 = (float)uStack_378;
            fStack_2b4 = uStack_378._4_4_;
            fStack_2b0 = (float)uStack_370;
            fStack_2ac = uStack_370._4_4_;
            fStack_2a8 = (float)uStack_368;
            fStack_2a4 = uStack_368._4_4_;
            local_2a0 = local_4c0;
            local_280 = 0;
            local_27c = uVar11;
            local_270 = auVar16;
            local_260 = uVar99;
            uStack_258 = uVar100;
            _local_380 = auVar289;
            if ((pGVar118->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5e0 = vandps_avx(auVar19,auVar132);
              auVar178._0_4_ = 1.0 / local_4a0;
              auVar178._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar225 = vshufps_avx(auVar178,auVar178,0);
              local_200[0] = auVar225._0_4_ * (auVar318._0_4_ + 0.0);
              local_200[1] = auVar225._4_4_ * (auVar318._4_4_ + 1.0);
              local_200[2] = auVar225._8_4_ * (auVar318._8_4_ + 2.0);
              local_200[3] = auVar225._12_4_ * (auVar318._12_4_ + 3.0);
              fStack_1f0 = auVar225._0_4_ * (auVar318._16_4_ + 4.0);
              fStack_1ec = auVar225._4_4_ * (auVar318._20_4_ + 5.0);
              fStack_1e8 = auVar225._8_4_ * (auVar318._24_4_ + 6.0);
              fStack_1e4 = auVar318._28_4_ + 7.0;
              uStack_370 = auVar110._16_8_;
              uStack_368 = auVar289._24_8_;
              local_1e0 = local_380;
              uStack_1d8 = uStack_378;
              uStack_1d0 = uStack_370;
              uStack_1c8 = uStack_368;
              local_1c0 = local_4c0;
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar132 = vblendvps_avx(auVar162,local_4c0,local_5e0);
              auVar19 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar19 = vminps_avx(auVar132,auVar19);
              auVar289 = vshufpd_avx(auVar19,auVar19,5);
              auVar19 = vminps_avx(auVar19,auVar289);
              auVar289 = vperm2f128_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar19,auVar289);
              auVar19 = vcmpps_avx(auVar132,auVar19,0);
              auVar289 = local_5e0 & auVar19;
              auVar132 = local_5e0;
              if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar289 >> 0x7f,0) != '\0') ||
                    (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar289 >> 0xbf,0) != '\0') ||
                  (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar289[0x1f] < '\0') {
                auVar132 = vandps_avx(auVar19,local_5e0);
              }
              uVar116 = vmovmskps_avx(auVar132);
              uVar14 = 0;
              if (uVar116 != 0) {
                for (; (uVar116 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar117 = (ulong)uVar14;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar118->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar220 = local_200[uVar117];
                uVar8 = *(undefined4 *)((long)&local_1e0 + uVar117 * 4);
                fVar200 = 1.0 - fVar220;
                fVar189 = fVar220 * fVar200 * 4.0;
                auVar225 = ZEXT416((uint)(fVar220 * fVar220 * 0.5));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar181 = ZEXT416((uint)((fVar200 * fVar200 + fVar189) * 0.5));
                auVar181 = vshufps_avx(auVar181,auVar181,0);
                auVar211 = ZEXT416((uint)((-fVar220 * fVar220 - fVar189) * 0.5));
                auVar211 = vshufps_avx(auVar211,auVar211,0);
                auVar192 = ZEXT416((uint)(fVar200 * -fVar200 * 0.5));
                auVar192 = vshufps_avx(auVar192,auVar192,0);
                auVar179._0_4_ =
                     auVar192._0_4_ * local_8c0 +
                     auVar211._0_4_ * local_850 +
                     local_870 * auVar225._0_4_ + local_860 * auVar181._0_4_;
                auVar179._4_4_ =
                     auVar192._4_4_ * fStack_8bc +
                     auVar211._4_4_ * fStack_84c +
                     fStack_86c * auVar225._4_4_ + fStack_85c * auVar181._4_4_;
                auVar179._8_4_ =
                     auVar192._8_4_ * fStack_8b8 +
                     auVar211._8_4_ * fStack_848 +
                     fStack_868 * auVar225._8_4_ + fStack_858 * auVar181._8_4_;
                auVar179._12_4_ =
                     auVar192._12_4_ * fStack_8b4 +
                     auVar211._12_4_ * fStack_844 +
                     fStack_864 * auVar225._12_4_ + fStack_854 * auVar181._12_4_;
                auVar199 = ZEXT464(*(uint *)(local_1c0 + uVar117 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1c0 + uVar117 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar179._0_4_;
                uVar12 = vextractps_avx(auVar179,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
                uVar12 = vextractps_avx(auVar179,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
                *(float *)(ray + k * 4 + 0xf0) = fVar220;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                *(uint *)(ray + k * 4 + 0x110) = uVar10;
                *(uint *)(ray + k * 4 + 0x120) = uVar115;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_700 = vshufps_avx(ZEXT416(uVar115),ZEXT416(uVar115),0);
                _local_720 = vshufps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0);
                _auStack_710 = auVar137._16_16_;
                _auStack_730 = auVar198._16_16_;
                _local_740 = *local_770;
                auStack_7b0 = auVar226._16_16_;
                local_7c0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_768 = ray;
                while( true ) {
                  local_400 = local_200[uVar117];
                  local_3f0 = *(undefined4 *)((long)&local_1e0 + uVar117 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar117 * 4);
                  fVar189 = 1.0 - local_400;
                  fVar220 = local_400 * fVar189 * 4.0;
                  auVar225 = ZEXT416((uint)(local_400 * local_400 * 0.5));
                  auVar225 = vshufps_avx(auVar225,auVar225,0);
                  auVar181 = ZEXT416((uint)((fVar189 * fVar189 + fVar220) * 0.5));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar211 = ZEXT416((uint)((-local_400 * local_400 - fVar220) * 0.5));
                  auVar211 = vshufps_avx(auVar211,auVar211,0);
                  local_7f0.context = context->user;
                  auVar192 = ZEXT416((uint)(fVar189 * -fVar189 * 0.5));
                  auVar192 = vshufps_avx(auVar192,auVar192,0);
                  auVar184._0_4_ =
                       auVar192._0_4_ * local_8c0 +
                       auVar211._0_4_ * local_850 +
                       local_870 * auVar225._0_4_ + local_860 * auVar181._0_4_;
                  auVar184._4_4_ =
                       auVar192._4_4_ * fStack_8bc +
                       auVar211._4_4_ * fStack_84c +
                       fStack_86c * auVar225._4_4_ + fStack_85c * auVar181._4_4_;
                  auVar184._8_4_ =
                       auVar192._8_4_ * fStack_8b8 +
                       auVar211._8_4_ * fStack_848 +
                       fStack_868 * auVar225._8_4_ + fStack_858 * auVar181._8_4_;
                  auVar184._12_4_ =
                       auVar192._12_4_ * fStack_8b4 +
                       auVar211._12_4_ * fStack_844 +
                       fStack_864 * auVar225._12_4_ + fStack_854 * auVar181._12_4_;
                  auVar225 = vshufps_avx(auVar184,auVar184,0);
                  local_430[0] = (RTCHitN)auVar225[0];
                  local_430[1] = (RTCHitN)auVar225[1];
                  local_430[2] = (RTCHitN)auVar225[2];
                  local_430[3] = (RTCHitN)auVar225[3];
                  local_430[4] = (RTCHitN)auVar225[4];
                  local_430[5] = (RTCHitN)auVar225[5];
                  local_430[6] = (RTCHitN)auVar225[6];
                  local_430[7] = (RTCHitN)auVar225[7];
                  local_430[8] = (RTCHitN)auVar225[8];
                  local_430[9] = (RTCHitN)auVar225[9];
                  local_430[10] = (RTCHitN)auVar225[10];
                  local_430[0xb] = (RTCHitN)auVar225[0xb];
                  local_430[0xc] = (RTCHitN)auVar225[0xc];
                  local_430[0xd] = (RTCHitN)auVar225[0xd];
                  local_430[0xe] = (RTCHitN)auVar225[0xe];
                  local_430[0xf] = (RTCHitN)auVar225[0xf];
                  auVar225 = vshufps_avx(auVar184,auVar184,0x55);
                  local_420 = auVar225;
                  local_410 = vshufps_avx(auVar184,auVar184,0xaa);
                  fStack_3fc = local_400;
                  fStack_3f8 = local_400;
                  fStack_3f4 = local_400;
                  uStack_3ec = local_3f0;
                  uStack_3e8 = local_3f0;
                  uStack_3e4 = local_3f0;
                  local_3e0 = local_720;
                  uStack_3d8 = uStack_718;
                  local_3d0 = local_700;
                  uStack_3c8 = uStack_6f8;
                  vcmpps_avx(auVar292._0_32_,auVar292._0_32_,0xf);
                  uStack_3bc = (local_7f0.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_7f0.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_840 = _local_740;
                  local_7f0.valid = (int *)local_840;
                  local_7f0.geometryUserPtr = pGVar118->userPtr;
                  local_7f0.hit = local_430;
                  local_7f0.N = 4;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar118->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar267 = ZEXT1664(auVar267._0_16_);
                    (*pGVar118->intersectionFilterN)(&local_7f0);
                    auVar255 = ZEXT3264(_local_6a0);
                    auVar318 = ZEXT3264(local_660);
                    auVar292 = ZEXT1664(ZEXT816(0) << 0x40);
                    ray = local_768;
                    prim = local_828;
                    pre = local_830;
                    fVar307 = (float)local_6e0._0_4_;
                    fVar313 = (float)local_6e0._4_4_;
                    fVar314 = fStack_6d8;
                    fVar315 = fStack_6d4;
                    fVar229 = fStack_6d0;
                    fVar231 = fStack_6cc;
                    fVar201 = fStack_6c8;
                  }
                  if (local_840 == (undefined1  [16])0x0) {
                    auVar225 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar225 = auVar225 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar118->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar267 = ZEXT1664(auVar267._0_16_);
                      (*p_Var13)(&local_7f0);
                      auVar255 = ZEXT3264(_local_6a0);
                      auVar318 = ZEXT3264(local_660);
                      auVar292 = ZEXT1664(ZEXT816(0) << 0x40);
                      ray = local_768;
                      prim = local_828;
                      pre = local_830;
                      fVar307 = (float)local_6e0._0_4_;
                      fVar313 = (float)local_6e0._4_4_;
                      fVar314 = fStack_6d8;
                      fVar315 = fStack_6d4;
                      fVar229 = fStack_6d0;
                      fVar231 = fStack_6cc;
                      fVar201 = fStack_6c8;
                    }
                    auVar181 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                    auVar211 = vpcmpeqd_avx(auVar225,auVar225);
                    auVar225 = auVar181 ^ auVar211;
                    if (local_840 != (undefined1  [16])0x0) {
                      auVar181 = auVar181 ^ auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])local_7f0.hit);
                      *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar211;
                      auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar211;
                      auVar181 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar181;
                    }
                  }
                  auVar132 = local_4c0;
                  auVar160._8_8_ = 0x100000001;
                  auVar160._0_8_ = 0x100000001;
                  if ((auVar160 & auVar225) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_7c0._0_4_;
                    auVar225 = local_7c0;
                  }
                  else {
                    auVar225 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar199 = ZEXT3264(local_4c0);
                  *(undefined4 *)(local_5e0 + uVar117 * 4) = 0;
                  local_7c0 = auVar225;
                  auVar225 = vshufps_avx(auVar225,auVar225,0);
                  auVar138._16_16_ = auVar225;
                  auVar138._0_16_ = auVar225;
                  auVar198 = vcmpps_avx(auVar132,auVar138,2);
                  auVar137 = vandps_avx(auVar198,local_5e0);
                  local_5e0 = local_5e0 & auVar198;
                  if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_5e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_5e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_5e0 >> 0x7f,0) == '\0') &&
                        (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5e0 >> 0xbf,0) == '\0') &&
                      (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5e0[0x1f]) break;
                  auVar166._8_4_ = 0x7f800000;
                  auVar166._0_8_ = 0x7f8000007f800000;
                  auVar166._12_4_ = 0x7f800000;
                  auVar166._16_4_ = 0x7f800000;
                  auVar166._20_4_ = 0x7f800000;
                  auVar166._24_4_ = 0x7f800000;
                  auVar166._28_4_ = 0x7f800000;
                  auVar132 = vblendvps_avx(auVar166,auVar132,auVar137);
                  auVar198 = vshufps_avx(auVar132,auVar132,0xb1);
                  auVar198 = vminps_avx(auVar132,auVar198);
                  auVar19 = vshufpd_avx(auVar198,auVar198,5);
                  auVar198 = vminps_avx(auVar198,auVar19);
                  auVar19 = vperm2f128_avx(auVar198,auVar198,1);
                  auVar198 = vminps_avx(auVar198,auVar19);
                  auVar198 = vcmpps_avx(auVar132,auVar198,0);
                  auVar19 = auVar137 & auVar198;
                  auVar132 = auVar137;
                  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0x7f,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0xbf,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar19[0x1f] < '\0') {
                    auVar132 = vandps_avx(auVar198,auVar137);
                  }
                  uVar116 = vmovmskps_avx(auVar132);
                  uVar14 = 0;
                  if (uVar116 != 0) {
                    for (; (uVar116 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  uVar117 = (ulong)uVar14;
                  local_5e0 = auVar137;
                }
              }
            }
          }
        }
      }
      auVar292 = ZEXT3264(_local_540);
      if (8 < (int)uVar11) {
        _local_4e0 = vpshufd_avx(ZEXT416(uVar11),0);
        auVar225 = vshufps_avx(_local_7a0,_local_7a0,0);
        register0x00001210 = auVar225;
        _local_360 = auVar225;
        auVar225 = vpermilps_avx(local_680._0_16_,0);
        local_e0._16_16_ = auVar225;
        local_e0._0_16_ = auVar225;
        auVar127._0_4_ = 1.0 / local_4a0;
        auVar127._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar225 = vshufps_avx(auVar127,auVar127,0);
        register0x00001210 = auVar225;
        _local_100 = auVar225;
        local_300 = vshufps_avx(ZEXT416(uVar115),ZEXT416(uVar115),0);
        local_310 = vshufps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0);
        auVar139 = ZEXT1664(local_310);
        lVar119 = 8;
        local_660 = auVar318._0_32_;
        _local_6a0 = auVar255._0_32_;
        fVar220 = (float)local_6c0._0_4_;
        fVar189 = (float)local_6c0._4_4_;
        fVar200 = fStack_6b8;
        fVar233 = fStack_6b4;
        fVar202 = fStack_6b0;
        fVar235 = fStack_6ac;
        fVar242 = fStack_6a8;
        do {
          pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar119 * 4 + lVar15);
          fVar246 = *(float *)*pauVar2;
          fVar300 = *(float *)(*pauVar2 + 4);
          fVar149 = *(float *)(*pauVar2 + 8);
          fVar152 = *(float *)(*pauVar2 + 0xc);
          fVar154 = *(float *)(*pauVar2 + 0x10);
          fVar268 = *(float *)(*pauVar2 + 0x14);
          fVar269 = *(float *)(*pauVar2 + 0x18);
          auVar107 = *pauVar2;
          pauVar4 = (undefined1 (*) [28])(lVar15 + 0x21aefac + lVar119 * 4);
          fVar203 = *(float *)*pauVar4;
          fVar259 = *(float *)(*pauVar4 + 4);
          fVar270 = *(float *)(*pauVar4 + 8);
          fVar271 = *(float *)(*pauVar4 + 0xc);
          fVar204 = *(float *)(*pauVar4 + 0x10);
          fVar260 = *(float *)(*pauVar4 + 0x14);
          fVar272 = *(float *)(*pauVar4 + 0x18);
          auVar106 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar15 + 0x21af430 + lVar119 * 4);
          fVar273 = *(float *)*pauVar4;
          fVar205 = *(float *)(*pauVar4 + 4);
          fVar261 = *(float *)(*pauVar4 + 8);
          fVar153 = *(float *)(*pauVar4 + 0xc);
          fVar248 = *(float *)(*pauVar4 + 0x10);
          fVar206 = *(float *)(*pauVar4 + 0x14);
          fVar298 = *(float *)(*pauVar4 + 0x18);
          auVar105 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar15 + 0x21af8b4 + lVar119 * 4);
          fVar121 = *(float *)*pauVar4;
          fVar140 = *(float *)(*pauVar4 + 4);
          fVar141 = *(float *)(*pauVar4 + 8);
          fVar143 = *(float *)(*pauVar4 + 0xc);
          fVar145 = *(float *)(*pauVar4 + 0x10);
          fVar147 = *(float *)(*pauVar4 + 0x14);
          fVar150 = *(float *)(*pauVar4 + 0x18);
          auVar104 = *pauVar4;
          fVar217 = auVar292._0_4_;
          fVar218 = auVar292._4_4_;
          fVar219 = auVar292._8_4_;
          fVar221 = auVar292._12_4_;
          fVar230 = auVar292._16_4_;
          fVar232 = auVar292._20_4_;
          fVar234 = auVar292._24_4_;
          fVar155 = auVar199._28_4_;
          fVar244 = auVar267._28_4_;
          fVar188 = fVar155 + *(float *)pauVar4[1];
          auVar267 = ZEXT3264(local_140);
          fVar168 = local_140._0_4_;
          fVar169 = local_140._4_4_;
          fVar170 = local_140._8_4_;
          fVar171 = local_140._12_4_;
          fVar172 = local_140._16_4_;
          fVar173 = local_140._20_4_;
          fVar207 = local_140._24_4_;
          local_7a0._0_4_ =
               fVar168 * fVar246 +
               auVar255._0_4_ * fVar203 + fVar217 * fVar273 + (float)local_480._0_4_ * fVar121;
          local_7a0._4_4_ =
               fVar169 * fVar300 +
               auVar255._4_4_ * fVar259 + fVar218 * fVar205 + (float)local_480._4_4_ * fVar140;
          fStack_798 = fVar170 * fVar149 +
                       auVar255._8_4_ * fVar270 + fVar219 * fVar261 + fStack_478 * fVar141;
          fStack_794 = fVar171 * fVar152 +
                       auVar255._12_4_ * fVar271 + fVar221 * fVar153 + fStack_474 * fVar143;
          auStack_790._0_4_ =
               fVar172 * fVar154 +
               auVar255._16_4_ * fVar204 + fVar230 * fVar248 + fStack_470 * fVar145;
          auStack_790._4_4_ =
               fVar173 * fVar268 +
               auVar255._20_4_ * fVar260 + fVar232 * fVar206 + fStack_46c * fVar147;
          fStack_788 = fVar207 * fVar269 +
                       auVar255._24_4_ * fVar272 + fVar234 * fVar298 + fStack_468 * fVar150;
          fStack_784 = fVar188 + fVar155 + fVar155 + auVar139._28_4_;
          auVar196._0_4_ =
               (float)local_600._0_4_ * fVar121 + fVar220 * fVar273 + fVar307 * fVar203 +
               (float)local_160._0_4_ * fVar246;
          auVar196._4_4_ =
               (float)local_600._4_4_ * fVar140 + fVar189 * fVar205 + fVar313 * fVar259 +
               (float)local_160._4_4_ * fVar300;
          auVar196._8_4_ =
               fStack_5f8 * fVar141 + fVar200 * fVar261 + fVar314 * fVar270 + fStack_158 * fVar149;
          auVar196._12_4_ =
               fStack_5f4 * fVar143 + fVar233 * fVar153 + fVar315 * fVar271 + fStack_154 * fVar152;
          auVar196._16_4_ =
               fStack_5f0 * fVar145 + fVar202 * fVar248 + fVar229 * fVar204 + fStack_150 * fVar154;
          auVar196._20_4_ =
               fStack_5ec * fVar147 + fVar235 * fVar206 + fVar231 * fVar260 + fStack_14c * fVar268;
          auVar196._24_4_ =
               fStack_5e8 * fVar150 + fVar242 * fVar298 + fVar201 * fVar272 + fStack_148 * fVar269;
          auVar196._28_4_ = fVar244 + fVar155 + fVar155 + fStack_784;
          fVar122 = fVar246 * (float)local_1a0._0_4_ +
                    (float)local_80._0_4_ * fVar203 +
                    (float)local_120._0_4_ * fVar273 + fVar121 * (float)local_180._0_4_;
          fVar187 = fVar300 * (float)local_1a0._4_4_ +
                    (float)local_80._4_4_ * fVar259 +
                    (float)local_120._4_4_ * fVar205 + fVar140 * (float)local_180._4_4_;
          fVar142 = fVar149 * fStack_198 +
                    fStack_78 * fVar270 + fStack_118 * fVar261 + fVar141 * fStack_178;
          fVar144 = fVar152 * fStack_194 +
                    fStack_74 * fVar271 + fStack_114 * fVar153 + fVar143 * fStack_174;
          fVar146 = fVar154 * fStack_190 +
                    fStack_70 * fVar204 + fStack_110 * fVar248 + fVar145 * fStack_170;
          fVar148 = fVar268 * fStack_18c +
                    fStack_6c * fVar260 + fStack_10c * fVar206 + fVar147 * fStack_16c;
          fVar151 = fVar269 * fStack_188 +
                    fStack_68 * fVar272 + fStack_108 * fVar298 + fVar150 * fStack_168;
          fVar188 = fStack_784 + fVar155 + fVar188;
          pfVar3 = (float *)(bspline_basis1 + lVar119 * 4 + lVar15);
          fVar244 = *pfVar3;
          fVar246 = pfVar3[1];
          fVar300 = pfVar3[2];
          fVar149 = pfVar3[3];
          fVar152 = pfVar3[4];
          fVar154 = pfVar3[5];
          fVar268 = pfVar3[6];
          pfVar5 = (float *)(lVar15 + 0x21b13cc + lVar119 * 4);
          fVar269 = *pfVar5;
          fVar203 = pfVar5[1];
          fVar259 = pfVar5[2];
          fVar270 = pfVar5[3];
          fVar271 = pfVar5[4];
          fVar204 = pfVar5[5];
          fVar260 = pfVar5[6];
          pauVar4 = (undefined1 (*) [28])(lVar15 + 0x21b1850 + lVar119 * 4);
          fVar272 = *(float *)*pauVar4;
          fVar273 = *(float *)(*pauVar4 + 4);
          fVar205 = *(float *)(*pauVar4 + 8);
          fVar261 = *(float *)(*pauVar4 + 0xc);
          fVar153 = *(float *)(*pauVar4 + 0x10);
          fVar248 = *(float *)(*pauVar4 + 0x14);
          fVar206 = *(float *)(*pauVar4 + 0x18);
          auVar109 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar15 + 0x21b1cd4 + lVar119 * 4);
          fVar298 = *(float *)*pauVar4;
          fVar121 = *(float *)(*pauVar4 + 4);
          fVar140 = *(float *)(*pauVar4 + 8);
          fVar141 = *(float *)(*pauVar4 + 0xc);
          fVar143 = *(float *)(*pauVar4 + 0x10);
          fVar145 = *(float *)(*pauVar4 + 0x14);
          fVar147 = *(float *)(*pauVar4 + 0x18);
          auVar108 = *pauVar4;
          fVar150 = *(float *)pauVar4[1];
          fVar167 = fVar150 + fStack_5e4;
          fVar155 = fVar150 + fVar150 + fStack_464;
          auVar289 = auVar292._0_32_;
          auVar310._0_4_ =
               fVar168 * fVar244 +
               fVar269 * auVar255._0_4_ + fVar217 * fVar272 + (float)local_480._0_4_ * fVar298;
          auVar310._4_4_ =
               fVar169 * fVar246 +
               fVar203 * auVar255._4_4_ + fVar218 * fVar273 + (float)local_480._4_4_ * fVar121;
          auVar310._8_4_ =
               fVar170 * fVar300 +
               fVar259 * auVar255._8_4_ + fVar219 * fVar205 + fStack_478 * fVar140;
          auVar310._12_4_ =
               fVar171 * fVar149 +
               fVar270 * auVar255._12_4_ + fVar221 * fVar261 + fStack_474 * fVar141;
          auVar310._16_4_ =
               fVar172 * fVar152 +
               fVar271 * auVar255._16_4_ + fVar230 * fVar153 + fStack_470 * fVar143;
          auVar310._20_4_ =
               fVar173 * fVar154 +
               fVar204 * auVar255._20_4_ + fVar232 * fVar248 + fStack_46c * fVar145;
          auVar310._24_4_ =
               fVar207 * fVar268 +
               fVar260 * auVar255._24_4_ + fVar234 * fVar206 + fStack_468 * fVar147;
          auVar310._28_4_ = fVar167 + fVar155;
          auVar227._0_4_ =
               fVar244 * (float)local_160._0_4_ +
               fVar307 * fVar269 + fVar220 * fVar272 + (float)local_600._0_4_ * fVar298;
          auVar227._4_4_ =
               fVar246 * (float)local_160._4_4_ +
               fVar313 * fVar203 + fVar189 * fVar273 + (float)local_600._4_4_ * fVar121;
          auVar227._8_4_ =
               fVar300 * fStack_158 + fVar314 * fVar259 + fVar200 * fVar205 + fStack_5f8 * fVar140;
          auVar227._12_4_ =
               fVar149 * fStack_154 + fVar315 * fVar270 + fVar233 * fVar261 + fStack_5f4 * fVar141;
          auVar227._16_4_ =
               fVar152 * fStack_150 + fVar229 * fVar271 + fVar202 * fVar153 + fStack_5f0 * fVar143;
          auVar227._20_4_ =
               fVar154 * fStack_14c + fVar231 * fVar204 + fVar235 * fVar248 + fStack_5ec * fVar145;
          auVar227._24_4_ =
               fVar268 * fStack_148 + fVar201 * fVar260 + fVar242 * fVar206 + fStack_5e8 * fVar147;
          auVar227._28_4_ = fVar155 + fVar150 + fVar150 + *(float *)pauVar2[1];
          local_580._0_4_ =
               (float)local_80._0_4_ * fVar269 +
               (float)local_120._0_4_ * fVar272 + fVar298 * (float)local_180._0_4_ +
               fVar244 * (float)local_1a0._0_4_;
          local_580._4_4_ =
               (float)local_80._4_4_ * fVar203 +
               (float)local_120._4_4_ * fVar273 + fVar121 * (float)local_180._4_4_ +
               fVar246 * (float)local_1a0._4_4_;
          fStack_578 = fStack_78 * fVar259 + fStack_118 * fVar205 + fVar140 * fStack_178 +
                       fVar300 * fStack_198;
          fStack_574 = fStack_74 * fVar270 + fStack_114 * fVar261 + fVar141 * fStack_174 +
                       fVar149 * fStack_194;
          fStack_570 = fStack_70 * fVar271 + fStack_110 * fVar153 + fVar143 * fStack_170 +
                       fVar152 * fStack_190;
          fStack_56c = fStack_6c * fVar204 + fStack_10c * fVar248 + fVar145 * fStack_16c +
                       fVar154 * fStack_18c;
          fStack_568 = fStack_68 * fVar260 + fStack_108 * fVar206 + fVar147 * fStack_168 +
                       fVar268 * fStack_188;
          fStack_564 = fVar150 + fVar167 + fVar155;
          auVar198 = vsubps_avx(auVar310,_local_7a0);
          auVar132 = vsubps_avx(auVar227,auVar196);
          fVar202 = auVar198._0_4_;
          fVar235 = auVar198._4_4_;
          auVar56._4_4_ = fVar235 * auVar196._4_4_;
          auVar56._0_4_ = fVar202 * auVar196._0_4_;
          fVar242 = auVar198._8_4_;
          auVar56._8_4_ = fVar242 * auVar196._8_4_;
          fVar272 = auVar198._12_4_;
          auVar56._12_4_ = fVar272 * auVar196._12_4_;
          fVar273 = auVar198._16_4_;
          auVar56._16_4_ = fVar273 * auVar196._16_4_;
          fVar205 = auVar198._20_4_;
          auVar56._20_4_ = fVar205 * auVar196._20_4_;
          fVar261 = auVar198._24_4_;
          auVar56._24_4_ = fVar261 * auVar196._24_4_;
          auVar56._28_4_ = fVar155;
          fVar220 = auVar132._0_4_;
          fVar189 = auVar132._4_4_;
          auVar57._4_4_ = (float)local_7a0._4_4_ * fVar189;
          auVar57._0_4_ = (float)local_7a0._0_4_ * fVar220;
          fVar229 = auVar132._8_4_;
          auVar57._8_4_ = fStack_798 * fVar229;
          fVar200 = auVar132._12_4_;
          auVar57._12_4_ = fStack_794 * fVar200;
          fVar231 = auVar132._16_4_;
          auVar57._16_4_ = (float)auStack_790._0_4_ * fVar231;
          fVar201 = auVar132._20_4_;
          auVar57._20_4_ = (float)auStack_790._4_4_ * fVar201;
          fVar233 = auVar132._24_4_;
          auVar57._24_4_ = fStack_788 * fVar233;
          auVar57._28_4_ = auVar227._28_4_;
          auVar19 = vsubps_avx(auVar56,auVar57);
          auVar101._4_4_ = fVar187;
          auVar101._0_4_ = fVar122;
          auVar101._8_4_ = fVar142;
          auVar101._12_4_ = fVar144;
          auVar101._16_4_ = fVar146;
          auVar101._20_4_ = fVar148;
          auVar101._24_4_ = fVar151;
          auVar101._28_4_ = fVar188;
          auVar137 = vmaxps_avx(auVar101,_local_580);
          auVar58._4_4_ = auVar137._4_4_ * auVar137._4_4_ * (fVar235 * fVar235 + fVar189 * fVar189);
          auVar58._0_4_ = auVar137._0_4_ * auVar137._0_4_ * (fVar202 * fVar202 + fVar220 * fVar220);
          auVar58._8_4_ = auVar137._8_4_ * auVar137._8_4_ * (fVar242 * fVar242 + fVar229 * fVar229);
          auVar58._12_4_ =
               auVar137._12_4_ * auVar137._12_4_ * (fVar272 * fVar272 + fVar200 * fVar200);
          auVar58._16_4_ =
               auVar137._16_4_ * auVar137._16_4_ * (fVar273 * fVar273 + fVar231 * fVar231);
          auVar58._20_4_ =
               auVar137._20_4_ * auVar137._20_4_ * (fVar205 * fVar205 + fVar201 * fVar201);
          auVar58._24_4_ =
               auVar137._24_4_ * auVar137._24_4_ * (fVar261 * fVar261 + fVar233 * fVar233);
          auVar58._28_4_ = fVar167 + auVar227._28_4_;
          auVar59._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar59._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar59._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar59._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar59._16_4_ = auVar19._16_4_ * auVar19._16_4_;
          auVar59._20_4_ = auVar19._20_4_ * auVar19._20_4_;
          auVar59._24_4_ = auVar19._24_4_ * auVar19._24_4_;
          auVar59._28_4_ = auVar19._28_4_;
          auVar137 = vcmpps_avx(auVar59,auVar58,2);
          local_280 = (uint)lVar119;
          auVar181 = vpshufd_avx(ZEXT416(local_280),0);
          auVar225 = vpor_avx(auVar181,_DAT_01f7fcf0);
          auVar181 = vpor_avx(auVar181,_DAT_01fafea0);
          auVar225 = vpcmpgtd_avx(_local_4e0,auVar225);
          auVar181 = vpcmpgtd_avx(_local_4e0,auVar181);
          auVar186._16_16_ = auVar181;
          auVar186._0_16_ = auVar225;
          auVar19 = auVar186 & auVar137;
          local_680 = auVar196;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0x7f,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0xbf,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar19[0x1f]) {
LAB_00ed4728:
            auVar139 = ZEXT3264(auVar132);
            auVar199 = ZEXT3264(auVar196);
            auVar292 = ZEXT3264(auVar289);
            fVar220 = (float)local_6c0._0_4_;
            fVar189 = (float)local_6c0._4_4_;
            fVar200 = fStack_6b8;
            fVar233 = fStack_6b4;
            fVar202 = fStack_6b0;
            fVar235 = fStack_6ac;
            fVar242 = fStack_6a8;
          }
          else {
            local_640._0_4_ = auVar109._0_4_;
            local_640._4_4_ = auVar109._4_4_;
            fStack_638 = auVar109._8_4_;
            fStack_634 = auVar109._12_4_;
            fStack_630 = auVar109._16_4_;
            fStack_62c = auVar109._20_4_;
            fStack_628 = auVar109._24_4_;
            local_760._0_4_ = auVar108._0_4_;
            local_760._4_4_ = auVar108._4_4_;
            fStack_758 = auVar108._8_4_;
            fStack_754 = auVar108._12_4_;
            fStack_750 = auVar108._16_4_;
            fStack_74c = auVar108._20_4_;
            fStack_748 = auVar108._24_4_;
            local_760._0_4_ =
                 fVar244 * (float)local_560._0_4_ +
                 fVar269 * (float)local_460._0_4_ +
                 (float)local_a0._0_4_ * (float)local_640._0_4_ +
                 (float)local_820._0_4_ * (float)local_760._0_4_;
            local_760._4_4_ =
                 fVar246 * (float)local_560._4_4_ +
                 fVar203 * (float)local_460._4_4_ +
                 (float)local_a0._4_4_ * (float)local_640._4_4_ +
                 (float)local_820._4_4_ * (float)local_760._4_4_;
            fStack_758 = fVar300 * fStack_558 +
                         fVar259 * fStack_458 + fStack_98 * fStack_638 + fStack_818 * fStack_758;
            fStack_754 = fVar149 * fStack_554 +
                         fVar270 * fStack_454 + fStack_94 * fStack_634 + fStack_814 * fStack_754;
            fStack_750 = fVar152 * fStack_550 +
                         fVar271 * fStack_450 + fStack_90 * fStack_630 + fStack_810 * fStack_750;
            fStack_74c = fVar154 * fStack_54c +
                         fVar204 * fStack_44c + fStack_8c * fStack_62c + fStack_80c * fStack_74c;
            fStack_748 = fVar268 * fStack_548 +
                         fVar260 * fStack_448 + fStack_88 * fStack_628 + fStack_808 * fStack_748;
            fStack_744 = auVar292._28_4_ + auVar132._28_4_ + fVar188 + 0.0;
            local_720._0_4_ = auVar106._0_4_;
            local_720._4_4_ = auVar106._4_4_;
            uStack_718._0_4_ = auVar106._8_4_;
            uStack_718._4_4_ = auVar106._12_4_;
            auStack_710._0_4_ = auVar106._16_4_;
            auStack_710._4_4_ = auVar106._20_4_;
            fStack_708 = auVar106._24_4_;
            local_740._0_4_ = auVar105._0_4_;
            local_740._4_4_ = auVar105._4_4_;
            fStack_738 = auVar105._8_4_;
            fStack_734 = auVar105._12_4_;
            auStack_730._0_4_ = auVar105._16_4_;
            auStack_730._4_4_ = auVar105._20_4_;
            fStack_728 = auVar105._24_4_;
            local_620._0_4_ = auVar104._0_4_;
            local_620._4_4_ = auVar104._4_4_;
            fStack_618 = auVar104._8_4_;
            fStack_614 = auVar104._12_4_;
            fStack_610 = auVar104._16_4_;
            fStack_60c = auVar104._20_4_;
            fStack_608 = auVar104._24_4_;
            pfVar5 = (float *)(lVar15 + 0x21b0640 + lVar119 * 4);
            fVar220 = *pfVar5;
            fVar189 = pfVar5[1];
            fVar229 = pfVar5[2];
            fVar200 = pfVar5[3];
            fVar231 = pfVar5[4];
            fVar201 = pfVar5[5];
            fVar233 = pfVar5[6];
            pfVar6 = (float *)(lVar15 + 0x21b0ac4 + lVar119 * 4);
            fVar202 = *pfVar6;
            fVar235 = pfVar6[1];
            fVar242 = pfVar6[2];
            fVar244 = pfVar6[3];
            fVar246 = pfVar6[4];
            fVar300 = pfVar6[5];
            fVar149 = pfVar6[6];
            fVar248 = pfVar3[7] + 0.0;
            pfVar7 = (float *)(lVar15 + 0x21b01bc + lVar119 * 4);
            fVar152 = *pfVar7;
            fVar154 = pfVar7[1];
            fVar268 = pfVar7[2];
            fVar269 = pfVar7[3];
            fVar203 = pfVar7[4];
            fVar259 = pfVar7[5];
            fVar270 = pfVar7[6];
            fVar153 = pfVar5[7] + pfVar6[7];
            fStack_324 = pfVar6[7] + fVar248;
            fVar248 = pfVar3[7] + auVar310._28_4_ + fVar248;
            pfVar3 = (float *)(lVar15 + 0x21afd38 + lVar119 * 4);
            fVar271 = *pfVar3;
            fVar204 = pfVar3[1];
            fVar260 = pfVar3[2];
            fVar272 = pfVar3[3];
            fVar273 = pfVar3[4];
            fVar205 = pfVar3[5];
            fVar261 = pfVar3[6];
            local_4a0 = fVar168 * fVar271 +
                        fVar152 * (float)local_6a0._0_4_ +
                        fVar217 * fVar220 + (float)local_480._0_4_ * fVar202;
            fStack_49c = fVar169 * fVar204 +
                         fVar154 * (float)local_6a0._4_4_ +
                         fVar218 * fVar189 + (float)local_480._4_4_ * fVar235;
            fStack_498 = fVar170 * fVar260 +
                         fVar268 * fStack_698 + fVar219 * fVar229 + fStack_478 * fVar242;
            fStack_494 = fVar171 * fVar272 +
                         fVar269 * fStack_694 + fVar221 * fVar200 + fStack_474 * fVar244;
            fStack_490 = fVar172 * fVar273 +
                         fVar203 * fStack_690 + fVar230 * fVar231 + fStack_470 * fVar246;
            fStack_48c = fVar173 * fVar205 +
                         fVar259 * fStack_68c + fVar232 * fVar201 + fStack_46c * fVar300;
            fStack_488 = fVar207 * fVar261 +
                         fVar270 * fStack_688 + fVar234 * fVar233 + fStack_468 * fVar149;
            fStack_484 = fVar153 + fStack_324;
            fStack_324 = fStack_324 + fVar248;
            local_340._4_4_ =
                 (float)local_160._4_4_ * fVar204 +
                 (float)local_6c0._4_4_ * fVar189 + (float)local_600._4_4_ * fVar235 +
                 fVar154 * (float)local_6e0._4_4_;
            local_340._0_4_ =
                 (float)local_160._0_4_ * fVar271 +
                 (float)local_6c0._0_4_ * fVar220 + (float)local_600._0_4_ * fVar202 +
                 fVar152 * (float)local_6e0._0_4_;
            fStack_338 = fStack_158 * fVar260 +
                         fStack_6b8 * fVar229 + fStack_5f8 * fVar242 + fVar268 * fStack_6d8;
            fStack_334 = fStack_154 * fVar272 +
                         fStack_6b4 * fVar200 + fStack_5f4 * fVar244 + fVar269 * fStack_6d4;
            fStack_330 = fStack_150 * fVar273 +
                         fStack_6b0 * fVar231 + fStack_5f0 * fVar246 + fVar203 * fStack_6d0;
            fStack_32c = fStack_14c * fVar205 +
                         fStack_6ac * fVar201 + fStack_5ec * fVar300 + fVar259 * fStack_6cc;
            fStack_328 = fStack_148 * fVar261 +
                         fStack_6a8 * fVar233 + fStack_5e8 * fVar149 + fVar270 * fStack_6c8;
            auVar311._0_4_ =
                 (float)local_460._0_4_ * fVar152 +
                 (float)local_a0._0_4_ * fVar220 + (float)local_820._0_4_ * fVar202 +
                 fVar271 * (float)local_560._0_4_;
            auVar311._4_4_ =
                 (float)local_460._4_4_ * fVar154 +
                 (float)local_a0._4_4_ * fVar189 + (float)local_820._4_4_ * fVar235 +
                 fVar204 * (float)local_560._4_4_;
            auVar311._8_4_ =
                 fStack_458 * fVar268 + fStack_98 * fVar229 + fStack_818 * fVar242 +
                 fVar260 * fStack_558;
            auVar311._12_4_ =
                 fStack_454 * fVar269 + fStack_94 * fVar200 + fStack_814 * fVar244 +
                 fVar272 * fStack_554;
            auVar311._16_4_ =
                 fStack_450 * fVar203 + fStack_90 * fVar231 + fStack_810 * fVar246 +
                 fVar273 * fStack_550;
            auVar311._20_4_ =
                 fStack_44c * fVar259 + fStack_8c * fVar201 + fStack_80c * fVar300 +
                 fVar205 * fStack_54c;
            auVar311._24_4_ =
                 fStack_448 * fVar270 + fStack_88 * fVar233 + fStack_808 * fVar149 +
                 fVar261 * fStack_548;
            auVar311._28_4_ = pfVar7[7] + fVar153 + fVar248;
            pfVar3 = (float *)(lVar15 + 0x21b2a60 + lVar119 * 4);
            fVar220 = *pfVar3;
            fVar189 = pfVar3[1];
            fVar229 = pfVar3[2];
            fVar200 = pfVar3[3];
            fVar231 = pfVar3[4];
            fVar201 = pfVar3[5];
            fVar233 = pfVar3[6];
            pfVar5 = (float *)(lVar15 + 0x21b2ee4 + lVar119 * 4);
            fVar202 = *pfVar5;
            fVar235 = pfVar5[1];
            fVar242 = pfVar5[2];
            fVar244 = pfVar5[3];
            fVar246 = pfVar5[4];
            fVar300 = pfVar5[5];
            fVar149 = pfVar5[6];
            pfVar6 = (float *)(lVar15 + 0x21b25dc + lVar119 * 4);
            fVar152 = *pfVar6;
            fVar154 = pfVar6[1];
            fVar268 = pfVar6[2];
            fVar269 = pfVar6[3];
            fVar203 = pfVar6[4];
            fVar259 = pfVar6[5];
            fVar270 = pfVar6[6];
            pfVar7 = (float *)(lVar15 + 0x21b2158 + lVar119 * 4);
            fVar271 = *pfVar7;
            fVar204 = pfVar7[1];
            fVar260 = pfVar7[2];
            fVar272 = pfVar7[3];
            fVar273 = pfVar7[4];
            fVar205 = pfVar7[5];
            fVar261 = pfVar7[6];
            auVar279._0_4_ =
                 fVar168 * fVar271 +
                 fVar152 * (float)local_6a0._0_4_ +
                 fVar220 * (float)local_540._0_4_ + (float)local_480._0_4_ * fVar202;
            auVar279._4_4_ =
                 fVar169 * fVar204 +
                 fVar154 * (float)local_6a0._4_4_ +
                 fVar189 * (float)local_540._4_4_ + (float)local_480._4_4_ * fVar235;
            auVar279._8_4_ =
                 fVar170 * fVar260 +
                 fVar268 * fStack_698 + fVar229 * fStack_538 + fStack_478 * fVar242;
            auVar279._12_4_ =
                 fVar171 * fVar272 +
                 fVar269 * fStack_694 + fVar200 * fStack_534 + fStack_474 * fVar244;
            auVar279._16_4_ =
                 fVar172 * fVar273 +
                 fVar203 * fStack_690 + fVar231 * fStack_530 + fStack_470 * fVar246;
            auVar279._20_4_ =
                 fVar173 * fVar205 +
                 fVar259 * fStack_68c + fVar201 * fStack_52c + fStack_46c * fVar300;
            auVar279._24_4_ =
                 fVar207 * fVar261 +
                 fVar270 * fStack_688 + fVar233 * fStack_528 + fStack_468 * fVar149;
            auVar279._28_4_ = fStack_5e4 + fStack_5e4 + fStack_464 + fStack_324;
            auVar305._0_4_ =
                 (float)local_160._0_4_ * fVar271 +
                 fVar152 * (float)local_6e0._0_4_ +
                 (float)local_6c0._0_4_ * fVar220 + (float)local_600._0_4_ * fVar202;
            auVar305._4_4_ =
                 (float)local_160._4_4_ * fVar204 +
                 fVar154 * (float)local_6e0._4_4_ +
                 (float)local_6c0._4_4_ * fVar189 + (float)local_600._4_4_ * fVar235;
            auVar305._8_4_ =
                 fStack_158 * fVar260 +
                 fVar268 * fStack_6d8 + fStack_6b8 * fVar229 + fStack_5f8 * fVar242;
            auVar305._12_4_ =
                 fStack_154 * fVar272 +
                 fVar269 * fStack_6d4 + fStack_6b4 * fVar200 + fStack_5f4 * fVar244;
            auVar305._16_4_ =
                 fStack_150 * fVar273 +
                 fVar203 * fStack_6d0 + fStack_6b0 * fVar231 + fStack_5f0 * fVar246;
            auVar305._20_4_ =
                 fStack_14c * fVar205 +
                 fVar259 * fStack_6cc + fStack_6ac * fVar201 + fStack_5ec * fVar300;
            auVar305._24_4_ =
                 fStack_148 * fVar261 +
                 fVar270 * fStack_6c8 + fStack_6a8 * fVar233 + fStack_5e8 * fVar149;
            auVar305._28_4_ = fStack_5e4 + fStack_5e4 + fStack_444 + fStack_5e4;
            auVar228._8_4_ = 0x7fffffff;
            auVar228._0_8_ = 0x7fffffff7fffffff;
            auVar228._12_4_ = 0x7fffffff;
            auVar228._16_4_ = 0x7fffffff;
            auVar228._20_4_ = 0x7fffffff;
            auVar228._24_4_ = 0x7fffffff;
            auVar228._28_4_ = 0x7fffffff;
            auVar103._4_4_ = fStack_49c;
            auVar103._0_4_ = local_4a0;
            auVar103._8_4_ = fStack_498;
            auVar103._12_4_ = fStack_494;
            auVar103._16_4_ = fStack_490;
            auVar103._20_4_ = fStack_48c;
            auVar103._24_4_ = fStack_488;
            auVar103._28_4_ = fStack_484;
            auVar19 = vandps_avx(auVar103,auVar228);
            auVar289 = vandps_avx(_local_340,auVar228);
            auVar289 = vmaxps_avx(auVar19,auVar289);
            auVar19 = vandps_avx(auVar311,auVar228);
            auVar289 = vmaxps_avx(auVar289,auVar19);
            auVar289 = vcmpps_avx(auVar289,_local_360,1);
            auVar24 = vblendvps_avx(auVar103,auVar198,auVar289);
            auVar133._0_4_ =
                 fVar271 * (float)local_560._0_4_ +
                 fVar152 * (float)local_460._0_4_ +
                 fVar202 * (float)local_820._0_4_ + (float)local_a0._0_4_ * fVar220;
            auVar133._4_4_ =
                 fVar204 * (float)local_560._4_4_ +
                 fVar154 * (float)local_460._4_4_ +
                 fVar235 * (float)local_820._4_4_ + (float)local_a0._4_4_ * fVar189;
            auVar133._8_4_ =
                 fVar260 * fStack_558 +
                 fVar268 * fStack_458 + fVar242 * fStack_818 + fStack_98 * fVar229;
            auVar133._12_4_ =
                 fVar272 * fStack_554 +
                 fVar269 * fStack_454 + fVar244 * fStack_814 + fStack_94 * fVar200;
            auVar133._16_4_ =
                 fVar273 * fStack_550 +
                 fVar203 * fStack_450 + fVar246 * fStack_810 + fStack_90 * fVar231;
            auVar133._20_4_ =
                 fVar205 * fStack_54c +
                 fVar259 * fStack_44c + fVar300 * fStack_80c + fStack_8c * fVar201;
            auVar133._24_4_ =
                 fVar261 * fStack_548 +
                 fVar270 * fStack_448 + fVar149 * fStack_808 + fStack_88 * fVar233;
            auVar133._28_4_ = auVar19._28_4_ + pfVar6[7] + pfVar5[7] + pfVar3[7];
            auVar325 = vblendvps_avx(_local_340,auVar132,auVar289);
            auVar19 = vandps_avx(auVar279,auVar228);
            auVar289 = vandps_avx(auVar305,auVar228);
            auVar17 = vmaxps_avx(auVar19,auVar289);
            auVar19 = vandps_avx(auVar133,auVar228);
            auVar19 = vmaxps_avx(auVar17,auVar19);
            local_700._0_4_ = auVar107._0_4_;
            local_700._4_4_ = auVar107._4_4_;
            uStack_6f8._0_4_ = auVar107._8_4_;
            uStack_6f8._4_4_ = auVar107._12_4_;
            auStack_6f0._0_4_ = auVar107._16_4_;
            auStack_6f0._4_4_ = auVar107._20_4_;
            fStack_6e8 = auVar107._24_4_;
            auVar289 = vcmpps_avx(auVar19,_local_360,1);
            auVar19 = vblendvps_avx(auVar279,auVar198,auVar289);
            auVar134._0_4_ =
                 (float)local_560._0_4_ * (float)local_700._0_4_ +
                 (float)local_460._0_4_ * (float)local_720._0_4_ +
                 (float)local_a0._0_4_ * (float)local_740._0_4_ +
                 (float)local_820._0_4_ * (float)local_620._0_4_;
            auVar134._4_4_ =
                 (float)local_560._4_4_ * (float)local_700._4_4_ +
                 (float)local_460._4_4_ * (float)local_720._4_4_ +
                 (float)local_a0._4_4_ * (float)local_740._4_4_ +
                 (float)local_820._4_4_ * (float)local_620._4_4_;
            auVar134._8_4_ =
                 fStack_558 * (float)uStack_6f8 +
                 fStack_458 * (float)uStack_718 + fStack_98 * fStack_738 + fStack_818 * fStack_618;
            auVar134._12_4_ =
                 fStack_554 * uStack_6f8._4_4_ +
                 fStack_454 * uStack_718._4_4_ + fStack_94 * fStack_734 + fStack_814 * fStack_614;
            auVar134._16_4_ =
                 fStack_550 * (float)auStack_6f0._0_4_ +
                 fStack_450 * (float)auStack_710._0_4_ +
                 fStack_90 * (float)auStack_730._0_4_ + fStack_810 * fStack_610;
            auVar134._20_4_ =
                 fStack_54c * (float)auStack_6f0._4_4_ +
                 fStack_44c * (float)auStack_710._4_4_ +
                 fStack_8c * (float)auStack_730._4_4_ + fStack_80c * fStack_60c;
            auVar134._24_4_ =
                 fStack_548 * fStack_6e8 +
                 fStack_448 * fStack_708 + fStack_88 * fStack_728 + fStack_808 * fStack_608;
            auVar134._28_4_ = auVar17._28_4_ + fStack_744 + fVar188 + 0.0;
            auVar289 = vblendvps_avx(auVar305,auVar132,auVar289);
            fVar143 = auVar24._0_4_;
            fVar145 = auVar24._4_4_;
            fVar147 = auVar24._8_4_;
            fVar150 = auVar24._12_4_;
            fVar307 = auVar24._16_4_;
            fVar313 = auVar24._20_4_;
            fVar314 = auVar24._24_4_;
            fVar315 = auVar24._28_4_;
            fVar152 = auVar19._0_4_;
            fVar268 = auVar19._4_4_;
            fVar203 = auVar19._8_4_;
            fVar270 = auVar19._12_4_;
            fVar204 = auVar19._16_4_;
            fVar272 = auVar19._20_4_;
            fVar205 = auVar19._24_4_;
            fVar220 = auVar325._0_4_;
            fVar229 = auVar325._4_4_;
            fVar231 = auVar325._8_4_;
            fVar233 = auVar325._12_4_;
            fVar235 = auVar325._16_4_;
            fVar244 = auVar325._20_4_;
            fVar300 = auVar325._24_4_;
            auVar290._0_4_ = fVar220 * fVar220 + fVar143 * fVar143;
            auVar290._4_4_ = fVar229 * fVar229 + fVar145 * fVar145;
            auVar290._8_4_ = fVar231 * fVar231 + fVar147 * fVar147;
            auVar290._12_4_ = fVar233 * fVar233 + fVar150 * fVar150;
            auVar290._16_4_ = fVar235 * fVar235 + fVar307 * fVar307;
            auVar290._20_4_ = fVar244 * fVar244 + fVar313 * fVar313;
            auVar290._24_4_ = fVar300 * fVar300 + fVar314 * fVar314;
            auVar290._28_4_ = fStack_144 + auVar198._28_4_;
            auVar198 = vrsqrtps_avx(auVar290);
            fVar189 = auVar198._0_4_;
            fVar200 = auVar198._4_4_;
            auVar60._4_4_ = fVar200 * 1.5;
            auVar60._0_4_ = fVar189 * 1.5;
            fVar201 = auVar198._8_4_;
            auVar60._8_4_ = fVar201 * 1.5;
            fVar202 = auVar198._12_4_;
            auVar60._12_4_ = fVar202 * 1.5;
            fVar242 = auVar198._16_4_;
            auVar60._16_4_ = fVar242 * 1.5;
            fVar246 = auVar198._20_4_;
            auVar60._20_4_ = fVar246 * 1.5;
            fVar149 = auVar198._24_4_;
            auVar60._24_4_ = fVar149 * 1.5;
            auVar60._28_4_ = auVar305._28_4_;
            auVar61._4_4_ = fVar200 * fVar200 * fVar200 * auVar290._4_4_ * 0.5;
            auVar61._0_4_ = fVar189 * fVar189 * fVar189 * auVar290._0_4_ * 0.5;
            auVar61._8_4_ = fVar201 * fVar201 * fVar201 * auVar290._8_4_ * 0.5;
            auVar61._12_4_ = fVar202 * fVar202 * fVar202 * auVar290._12_4_ * 0.5;
            auVar61._16_4_ = fVar242 * fVar242 * fVar242 * auVar290._16_4_ * 0.5;
            auVar61._20_4_ = fVar246 * fVar246 * fVar246 * auVar290._20_4_ * 0.5;
            auVar61._24_4_ = fVar149 * fVar149 * fVar149 * auVar290._24_4_ * 0.5;
            auVar61._28_4_ = auVar290._28_4_;
            auVar24 = vsubps_avx(auVar60,auVar61);
            fVar153 = auVar24._0_4_;
            fVar248 = auVar24._4_4_;
            fVar206 = auVar24._8_4_;
            fVar298 = auVar24._12_4_;
            fVar121 = auVar24._16_4_;
            fVar140 = auVar24._20_4_;
            fVar141 = auVar24._24_4_;
            fVar189 = auVar289._0_4_;
            fVar200 = auVar289._4_4_;
            fVar201 = auVar289._8_4_;
            fVar202 = auVar289._12_4_;
            fVar242 = auVar289._16_4_;
            fVar246 = auVar289._20_4_;
            fVar149 = auVar289._24_4_;
            auVar265._0_4_ = fVar189 * fVar189 + fVar152 * fVar152;
            auVar265._4_4_ = fVar200 * fVar200 + fVar268 * fVar268;
            auVar265._8_4_ = fVar201 * fVar201 + fVar203 * fVar203;
            auVar265._12_4_ = fVar202 * fVar202 + fVar270 * fVar270;
            auVar265._16_4_ = fVar242 * fVar242 + fVar204 * fVar204;
            auVar265._20_4_ = fVar246 * fVar246 + fVar272 * fVar272;
            auVar265._24_4_ = fVar149 * fVar149 + fVar205 * fVar205;
            auVar265._28_4_ = auVar198._28_4_ + auVar19._28_4_;
            auVar198 = vrsqrtps_avx(auVar265);
            fVar154 = auVar198._0_4_;
            fVar269 = auVar198._4_4_;
            auVar62._4_4_ = fVar269 * 1.5;
            auVar62._0_4_ = fVar154 * 1.5;
            fVar259 = auVar198._8_4_;
            auVar62._8_4_ = fVar259 * 1.5;
            fVar271 = auVar198._12_4_;
            auVar62._12_4_ = fVar271 * 1.5;
            fVar260 = auVar198._16_4_;
            auVar62._16_4_ = fVar260 * 1.5;
            fVar273 = auVar198._20_4_;
            auVar62._20_4_ = fVar273 * 1.5;
            fVar261 = auVar198._24_4_;
            auVar62._24_4_ = fVar261 * 1.5;
            auVar62._28_4_ = auVar305._28_4_;
            auVar63._4_4_ = fVar269 * fVar269 * fVar269 * auVar265._4_4_ * 0.5;
            auVar63._0_4_ = fVar154 * fVar154 * fVar154 * auVar265._0_4_ * 0.5;
            auVar63._8_4_ = fVar259 * fVar259 * fVar259 * auVar265._8_4_ * 0.5;
            auVar63._12_4_ = fVar271 * fVar271 * fVar271 * auVar265._12_4_ * 0.5;
            auVar63._16_4_ = fVar260 * fVar260 * fVar260 * auVar265._16_4_ * 0.5;
            auVar63._20_4_ = fVar273 * fVar273 * fVar273 * auVar265._20_4_ * 0.5;
            auVar63._24_4_ = fVar261 * fVar261 * fVar261 * auVar265._24_4_ * 0.5;
            auVar63._28_4_ = auVar265._28_4_;
            auVar19 = vsubps_avx(auVar62,auVar63);
            fVar154 = auVar19._0_4_;
            fVar269 = auVar19._4_4_;
            fVar259 = auVar19._8_4_;
            fVar271 = auVar19._12_4_;
            fVar260 = auVar19._16_4_;
            fVar273 = auVar19._20_4_;
            fVar261 = auVar19._24_4_;
            fVar220 = fVar122 * fVar153 * fVar220;
            fVar229 = fVar187 * fVar248 * fVar229;
            auVar64._4_4_ = fVar229;
            auVar64._0_4_ = fVar220;
            fVar231 = fVar142 * fVar206 * fVar231;
            auVar64._8_4_ = fVar231;
            fVar233 = fVar144 * fVar298 * fVar233;
            auVar64._12_4_ = fVar233;
            fVar235 = fVar146 * fVar121 * fVar235;
            auVar64._16_4_ = fVar235;
            fVar244 = fVar148 * fVar140 * fVar244;
            auVar64._20_4_ = fVar244;
            fVar300 = fVar151 * fVar141 * fVar300;
            auVar64._24_4_ = fVar300;
            auVar64._28_4_ = auVar198._28_4_;
            local_700._4_4_ = fVar229 + (float)local_7a0._4_4_;
            local_700._0_4_ = fVar220 + (float)local_7a0._0_4_;
            uStack_6f8._0_4_ = fVar231 + fStack_798;
            uStack_6f8._4_4_ = fVar233 + fStack_794;
            auStack_6f0._0_4_ = fVar235 + (float)auStack_790._0_4_;
            auStack_6f0._4_4_ = fVar244 + (float)auStack_790._4_4_;
            fStack_6e8 = fVar300 + fStack_788;
            fStack_6e4 = auVar198._28_4_ + fStack_784;
            fVar220 = fVar122 * fVar153 * -fVar143;
            fVar229 = fVar187 * fVar248 * -fVar145;
            auVar65._4_4_ = fVar229;
            auVar65._0_4_ = fVar220;
            fVar231 = fVar142 * fVar206 * -fVar147;
            auVar65._8_4_ = fVar231;
            fVar233 = fVar144 * fVar298 * -fVar150;
            auVar65._12_4_ = fVar233;
            fVar235 = fVar146 * fVar121 * -fVar307;
            auVar65._16_4_ = fVar235;
            fVar244 = fVar148 * fVar140 * -fVar313;
            auVar65._20_4_ = fVar244;
            fVar300 = fVar151 * fVar141 * -fVar314;
            auVar65._24_4_ = fVar300;
            auVar65._28_4_ = -fVar315;
            local_620._4_4_ = auVar196._4_4_ + fVar229;
            local_620._0_4_ = auVar196._0_4_ + fVar220;
            fStack_618 = auVar196._8_4_ + fVar231;
            fStack_614 = auVar196._12_4_ + fVar233;
            fStack_610 = auVar196._16_4_ + fVar235;
            fStack_60c = auVar196._20_4_ + fVar244;
            fStack_608 = auVar196._24_4_ + fVar300;
            fStack_604 = auVar196._28_4_ + -fVar315;
            fVar220 = fVar153 * 0.0 * fVar122;
            fVar229 = fVar248 * 0.0 * fVar187;
            auVar66._4_4_ = fVar229;
            auVar66._0_4_ = fVar220;
            fVar231 = fVar206 * 0.0 * fVar142;
            auVar66._8_4_ = fVar231;
            fVar233 = fVar298 * 0.0 * fVar144;
            auVar66._12_4_ = fVar233;
            fVar235 = fVar121 * 0.0 * fVar146;
            auVar66._16_4_ = fVar235;
            fVar244 = fVar140 * 0.0 * fVar148;
            auVar66._20_4_ = fVar244;
            fVar300 = fVar141 * 0.0 * fVar151;
            auVar66._24_4_ = fVar300;
            auVar66._28_4_ = fVar315;
            auVar193 = vsubps_avx(_local_7a0,auVar64);
            auVar324._0_4_ = fVar220 + auVar134._0_4_;
            auVar324._4_4_ = fVar229 + auVar134._4_4_;
            auVar324._8_4_ = fVar231 + auVar134._8_4_;
            auVar324._12_4_ = fVar233 + auVar134._12_4_;
            auVar324._16_4_ = fVar235 + auVar134._16_4_;
            auVar324._20_4_ = fVar244 + auVar134._20_4_;
            auVar324._24_4_ = fVar300 + auVar134._24_4_;
            auVar324._28_4_ = fVar315 + auVar134._28_4_;
            fVar220 = (float)local_580._0_4_ * fVar154 * fVar189;
            fVar189 = (float)local_580._4_4_ * fVar269 * fVar200;
            auVar67._4_4_ = fVar189;
            auVar67._0_4_ = fVar220;
            fVar229 = fStack_578 * fVar259 * fVar201;
            auVar67._8_4_ = fVar229;
            fVar200 = fStack_574 * fVar271 * fVar202;
            auVar67._12_4_ = fVar200;
            fVar231 = fStack_570 * fVar260 * fVar242;
            auVar67._16_4_ = fVar231;
            fVar201 = fStack_56c * fVar273 * fVar246;
            auVar67._20_4_ = fVar201;
            fVar233 = fStack_568 * fVar261 * fVar149;
            auVar67._24_4_ = fVar233;
            auVar67._28_4_ = fStack_784;
            auVar302 = vsubps_avx(auVar196,auVar65);
            auVar312._0_4_ = auVar310._0_4_ + fVar220;
            auVar312._4_4_ = auVar310._4_4_ + fVar189;
            auVar312._8_4_ = auVar310._8_4_ + fVar229;
            auVar312._12_4_ = auVar310._12_4_ + fVar200;
            auVar312._16_4_ = auVar310._16_4_ + fVar231;
            auVar312._20_4_ = auVar310._20_4_ + fVar201;
            auVar312._24_4_ = auVar310._24_4_ + fVar233;
            auVar312._28_4_ = auVar310._28_4_ + fStack_784;
            fVar220 = fVar154 * -fVar152 * (float)local_580._0_4_;
            fVar189 = fVar269 * -fVar268 * (float)local_580._4_4_;
            auVar68._4_4_ = fVar189;
            auVar68._0_4_ = fVar220;
            fVar229 = fVar259 * -fVar203 * fStack_578;
            auVar68._8_4_ = fVar229;
            fVar200 = fVar271 * -fVar270 * fStack_574;
            auVar68._12_4_ = fVar200;
            fVar231 = fVar260 * -fVar204 * fStack_570;
            auVar68._16_4_ = fVar231;
            fVar201 = fVar273 * -fVar272 * fStack_56c;
            auVar68._20_4_ = fVar201;
            fVar233 = fVar261 * -fVar205 * fStack_568;
            auVar68._24_4_ = fVar233;
            auVar68._28_4_ = fVar188;
            auVar21 = vsubps_avx(auVar134,auVar66);
            auVar216._0_4_ = auVar227._0_4_ + fVar220;
            auVar216._4_4_ = auVar227._4_4_ + fVar189;
            auVar216._8_4_ = auVar227._8_4_ + fVar229;
            auVar216._12_4_ = auVar227._12_4_ + fVar200;
            auVar216._16_4_ = auVar227._16_4_ + fVar231;
            auVar216._20_4_ = auVar227._20_4_ + fVar201;
            auVar216._24_4_ = auVar227._24_4_ + fVar233;
            auVar216._28_4_ = auVar227._28_4_ + fVar188;
            fVar220 = fVar154 * 0.0 * (float)local_580._0_4_;
            fVar189 = fVar269 * 0.0 * (float)local_580._4_4_;
            auVar69._4_4_ = fVar189;
            auVar69._0_4_ = fVar220;
            fVar229 = fVar259 * 0.0 * fStack_578;
            auVar69._8_4_ = fVar229;
            fVar200 = fVar271 * 0.0 * fStack_574;
            auVar69._12_4_ = fVar200;
            fVar231 = fVar260 * 0.0 * fStack_570;
            auVar69._16_4_ = fVar231;
            fVar201 = fVar273 * 0.0 * fStack_56c;
            auVar69._20_4_ = fVar201;
            fVar233 = fVar261 * 0.0 * fStack_568;
            auVar69._24_4_ = fVar233;
            auVar69._28_4_ = auVar134._28_4_;
            auVar198 = vsubps_avx(auVar310,auVar67);
            auVar280._0_4_ = (float)local_760._0_4_ + fVar220;
            auVar280._4_4_ = (float)local_760._4_4_ + fVar189;
            auVar280._8_4_ = fStack_758 + fVar229;
            auVar280._12_4_ = fStack_754 + fVar200;
            auVar280._16_4_ = fStack_750 + fVar231;
            auVar280._20_4_ = fStack_74c + fVar201;
            auVar280._24_4_ = fStack_748 + fVar233;
            auVar280._28_4_ = fStack_744 + auVar134._28_4_;
            auVar289 = vsubps_avx(auVar227,auVar68);
            auVar24 = vsubps_avx(_local_760,auVar69);
            auVar325 = vsubps_avx(auVar216,auVar302);
            auVar17 = vsubps_avx(auVar280,auVar21);
            auVar70._4_4_ = auVar21._4_4_ * auVar325._4_4_;
            auVar70._0_4_ = auVar21._0_4_ * auVar325._0_4_;
            auVar70._8_4_ = auVar21._8_4_ * auVar325._8_4_;
            auVar70._12_4_ = auVar21._12_4_ * auVar325._12_4_;
            auVar70._16_4_ = auVar21._16_4_ * auVar325._16_4_;
            auVar70._20_4_ = auVar21._20_4_ * auVar325._20_4_;
            auVar70._24_4_ = auVar21._24_4_ * auVar325._24_4_;
            auVar70._28_4_ = auVar305._28_4_;
            auVar71._4_4_ = auVar302._4_4_ * auVar17._4_4_;
            auVar71._0_4_ = auVar302._0_4_ * auVar17._0_4_;
            auVar71._8_4_ = auVar302._8_4_ * auVar17._8_4_;
            auVar71._12_4_ = auVar302._12_4_ * auVar17._12_4_;
            auVar71._16_4_ = auVar302._16_4_ * auVar17._16_4_;
            auVar71._20_4_ = auVar302._20_4_ * auVar17._20_4_;
            auVar71._24_4_ = auVar302._24_4_ * auVar17._24_4_;
            auVar71._28_4_ = auVar227._28_4_;
            auVar212 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar193._4_4_ * auVar17._4_4_;
            auVar72._0_4_ = auVar193._0_4_ * auVar17._0_4_;
            auVar72._8_4_ = auVar193._8_4_ * auVar17._8_4_;
            auVar72._12_4_ = auVar193._12_4_ * auVar17._12_4_;
            auVar72._16_4_ = auVar193._16_4_ * auVar17._16_4_;
            auVar72._20_4_ = auVar193._20_4_ * auVar17._20_4_;
            auVar72._24_4_ = auVar193._24_4_ * auVar17._24_4_;
            auVar72._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar312,auVar193);
            auVar73._4_4_ = auVar21._4_4_ * auVar17._4_4_;
            auVar73._0_4_ = auVar21._0_4_ * auVar17._0_4_;
            auVar73._8_4_ = auVar21._8_4_ * auVar17._8_4_;
            auVar73._12_4_ = auVar21._12_4_ * auVar17._12_4_;
            auVar73._16_4_ = auVar21._16_4_ * auVar17._16_4_;
            auVar73._20_4_ = auVar21._20_4_ * auVar17._20_4_;
            auVar73._24_4_ = auVar21._24_4_ * auVar17._24_4_;
            auVar73._28_4_ = auVar19._28_4_;
            auVar226 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar302._4_4_ * auVar17._4_4_;
            auVar74._0_4_ = auVar302._0_4_ * auVar17._0_4_;
            auVar74._8_4_ = auVar302._8_4_ * auVar17._8_4_;
            auVar74._12_4_ = auVar302._12_4_ * auVar17._12_4_;
            auVar74._16_4_ = auVar302._16_4_ * auVar17._16_4_;
            auVar74._20_4_ = auVar302._20_4_ * auVar17._20_4_;
            auVar74._24_4_ = auVar302._24_4_ * auVar17._24_4_;
            auVar74._28_4_ = auVar19._28_4_;
            auVar75._4_4_ = auVar193._4_4_ * auVar325._4_4_;
            auVar75._0_4_ = auVar193._0_4_ * auVar325._0_4_;
            auVar75._8_4_ = auVar193._8_4_ * auVar325._8_4_;
            auVar75._12_4_ = auVar193._12_4_ * auVar325._12_4_;
            auVar75._16_4_ = auVar193._16_4_ * auVar325._16_4_;
            auVar75._20_4_ = auVar193._20_4_ * auVar325._20_4_;
            auVar75._24_4_ = auVar193._24_4_ * auVar325._24_4_;
            auVar75._28_4_ = auVar325._28_4_;
            auVar19 = vsubps_avx(auVar75,auVar74);
            auVar163._0_4_ = auVar212._0_4_ * 0.0 + auVar19._0_4_ + auVar226._0_4_ * 0.0;
            auVar163._4_4_ = auVar212._4_4_ * 0.0 + auVar19._4_4_ + auVar226._4_4_ * 0.0;
            auVar163._8_4_ = auVar212._8_4_ * 0.0 + auVar19._8_4_ + auVar226._8_4_ * 0.0;
            auVar163._12_4_ = auVar212._12_4_ * 0.0 + auVar19._12_4_ + auVar226._12_4_ * 0.0;
            auVar163._16_4_ = auVar212._16_4_ * 0.0 + auVar19._16_4_ + auVar226._16_4_ * 0.0;
            auVar163._20_4_ = auVar212._20_4_ * 0.0 + auVar19._20_4_ + auVar226._20_4_ * 0.0;
            auVar163._24_4_ = auVar212._24_4_ * 0.0 + auVar19._24_4_ + auVar226._24_4_ * 0.0;
            auVar163._28_4_ = auVar212._28_4_ + auVar19._28_4_ + auVar226._28_4_;
            auVar264 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,2);
            auVar198 = vblendvps_avx(auVar198,_local_700,auVar264);
            auVar19 = vblendvps_avx(auVar289,_local_620,auVar264);
            auVar289 = vblendvps_avx(auVar24,auVar324,auVar264);
            auVar24 = vblendvps_avx(auVar193,auVar312,auVar264);
            auVar325 = vblendvps_avx(auVar302,auVar216,auVar264);
            auVar17 = vblendvps_avx(auVar21,auVar280,auVar264);
            auVar193 = vblendvps_avx(auVar312,auVar193,auVar264);
            auVar212 = vblendvps_avx(auVar216,auVar302,auVar264);
            auVar226 = vblendvps_avx(auVar280,auVar21,auVar264);
            _local_7a0 = vandps_avx(auVar137,auVar186);
            auVar193 = vsubps_avx(auVar193,auVar198);
            auVar22 = vsubps_avx(auVar212,auVar19);
            auVar226 = vsubps_avx(auVar226,auVar289);
            auVar23 = vsubps_avx(auVar19,auVar325);
            fVar220 = auVar22._0_4_;
            fVar172 = auVar289._0_4_;
            fVar202 = auVar22._4_4_;
            fVar173 = auVar289._4_4_;
            auVar76._4_4_ = fVar173 * fVar202;
            auVar76._0_4_ = fVar172 * fVar220;
            fVar152 = auVar22._8_4_;
            fVar207 = auVar289._8_4_;
            auVar76._8_4_ = fVar207 * fVar152;
            fVar271 = auVar22._12_4_;
            fVar217 = auVar289._12_4_;
            auVar76._12_4_ = fVar217 * fVar271;
            fVar153 = auVar22._16_4_;
            fVar218 = auVar289._16_4_;
            auVar76._16_4_ = fVar218 * fVar153;
            fVar143 = auVar22._20_4_;
            fVar219 = auVar289._20_4_;
            auVar76._20_4_ = fVar219 * fVar143;
            fVar315 = auVar22._24_4_;
            fVar221 = auVar289._24_4_;
            auVar76._24_4_ = fVar221 * fVar315;
            auVar76._28_4_ = auVar212._28_4_;
            fVar189 = auVar19._0_4_;
            fVar230 = auVar226._0_4_;
            fVar235 = auVar19._4_4_;
            fVar232 = auVar226._4_4_;
            auVar77._4_4_ = fVar232 * fVar235;
            auVar77._0_4_ = fVar230 * fVar189;
            fVar154 = auVar19._8_4_;
            fVar234 = auVar226._8_4_;
            auVar77._8_4_ = fVar234 * fVar154;
            fVar204 = auVar19._12_4_;
            fVar236 = auVar226._12_4_;
            auVar77._12_4_ = fVar236 * fVar204;
            fVar248 = auVar19._16_4_;
            fVar243 = auVar226._16_4_;
            auVar77._16_4_ = fVar243 * fVar248;
            fVar145 = auVar19._20_4_;
            fVar245 = auVar226._20_4_;
            auVar77._20_4_ = fVar245 * fVar145;
            fVar155 = auVar19._24_4_;
            fVar247 = auVar226._24_4_;
            uVar8 = auVar302._28_4_;
            auVar77._24_4_ = fVar247 * fVar155;
            auVar77._28_4_ = uVar8;
            auVar212 = vsubps_avx(auVar77,auVar76);
            fVar229 = auVar198._0_4_;
            fVar242 = auVar198._4_4_;
            auVar78._4_4_ = fVar232 * fVar242;
            auVar78._0_4_ = fVar230 * fVar229;
            fVar268 = auVar198._8_4_;
            auVar78._8_4_ = fVar234 * fVar268;
            fVar260 = auVar198._12_4_;
            auVar78._12_4_ = fVar236 * fVar260;
            fVar206 = auVar198._16_4_;
            auVar78._16_4_ = fVar243 * fVar206;
            fVar147 = auVar198._20_4_;
            auVar78._20_4_ = fVar245 * fVar147;
            fVar167 = auVar198._24_4_;
            auVar78._24_4_ = fVar247 * fVar167;
            auVar78._28_4_ = uVar8;
            fVar200 = auVar193._0_4_;
            fVar244 = auVar193._4_4_;
            auVar79._4_4_ = fVar173 * fVar244;
            auVar79._0_4_ = fVar172 * fVar200;
            fVar269 = auVar193._8_4_;
            auVar79._8_4_ = fVar207 * fVar269;
            fVar272 = auVar193._12_4_;
            auVar79._12_4_ = fVar217 * fVar272;
            fVar298 = auVar193._16_4_;
            auVar79._16_4_ = fVar218 * fVar298;
            fVar150 = auVar193._20_4_;
            auVar79._20_4_ = fVar219 * fVar150;
            fVar168 = auVar193._24_4_;
            auVar79._24_4_ = fVar221 * fVar168;
            auVar79._28_4_ = auVar312._28_4_;
            auVar302 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = fVar235 * fVar244;
            auVar80._0_4_ = fVar189 * fVar200;
            auVar80._8_4_ = fVar154 * fVar269;
            auVar80._12_4_ = fVar204 * fVar272;
            auVar80._16_4_ = fVar248 * fVar298;
            auVar80._20_4_ = fVar145 * fVar150;
            auVar80._24_4_ = fVar155 * fVar168;
            auVar80._28_4_ = uVar8;
            auVar81._4_4_ = fVar242 * fVar202;
            auVar81._0_4_ = fVar229 * fVar220;
            auVar81._8_4_ = fVar268 * fVar152;
            auVar81._12_4_ = fVar260 * fVar271;
            auVar81._16_4_ = fVar206 * fVar153;
            auVar81._20_4_ = fVar147 * fVar143;
            auVar81._24_4_ = fVar167 * fVar315;
            auVar81._28_4_ = auVar21._28_4_;
            auVar21 = vsubps_avx(auVar81,auVar80);
            auVar289 = vsubps_avx(auVar289,auVar17);
            fVar201 = auVar21._28_4_ + auVar302._28_4_;
            auVar291._0_4_ = auVar21._0_4_ + auVar302._0_4_ * 0.0 + auVar212._0_4_ * 0.0;
            auVar291._4_4_ = auVar21._4_4_ + auVar302._4_4_ * 0.0 + auVar212._4_4_ * 0.0;
            auVar291._8_4_ = auVar21._8_4_ + auVar302._8_4_ * 0.0 + auVar212._8_4_ * 0.0;
            auVar291._12_4_ = auVar21._12_4_ + auVar302._12_4_ * 0.0 + auVar212._12_4_ * 0.0;
            auVar291._16_4_ = auVar21._16_4_ + auVar302._16_4_ * 0.0 + auVar212._16_4_ * 0.0;
            auVar291._20_4_ = auVar21._20_4_ + auVar302._20_4_ * 0.0 + auVar212._20_4_ * 0.0;
            auVar291._24_4_ = auVar21._24_4_ + auVar302._24_4_ * 0.0 + auVar212._24_4_ * 0.0;
            auVar291._28_4_ = fVar201 + auVar212._28_4_;
            fVar231 = auVar23._0_4_;
            fVar246 = auVar23._4_4_;
            auVar82._4_4_ = auVar17._4_4_ * fVar246;
            auVar82._0_4_ = auVar17._0_4_ * fVar231;
            fVar203 = auVar23._8_4_;
            auVar82._8_4_ = auVar17._8_4_ * fVar203;
            fVar273 = auVar23._12_4_;
            auVar82._12_4_ = auVar17._12_4_ * fVar273;
            fVar121 = auVar23._16_4_;
            auVar82._16_4_ = auVar17._16_4_ * fVar121;
            fVar307 = auVar23._20_4_;
            auVar82._20_4_ = auVar17._20_4_ * fVar307;
            fVar169 = auVar23._24_4_;
            auVar82._24_4_ = auVar17._24_4_ * fVar169;
            auVar82._28_4_ = fVar201;
            fVar201 = auVar289._0_4_;
            fVar300 = auVar289._4_4_;
            auVar83._4_4_ = auVar325._4_4_ * fVar300;
            auVar83._0_4_ = auVar325._0_4_ * fVar201;
            fVar259 = auVar289._8_4_;
            auVar83._8_4_ = auVar325._8_4_ * fVar259;
            fVar205 = auVar289._12_4_;
            auVar83._12_4_ = auVar325._12_4_ * fVar205;
            fVar140 = auVar289._16_4_;
            auVar83._16_4_ = auVar325._16_4_ * fVar140;
            fVar313 = auVar289._20_4_;
            auVar83._20_4_ = auVar325._20_4_ * fVar313;
            fVar170 = auVar289._24_4_;
            auVar83._24_4_ = auVar325._24_4_ * fVar170;
            auVar83._28_4_ = auVar21._28_4_;
            auVar302 = vsubps_avx(auVar83,auVar82);
            auVar198 = vsubps_avx(auVar198,auVar24);
            fVar233 = auVar198._0_4_;
            fVar149 = auVar198._4_4_;
            auVar84._4_4_ = auVar17._4_4_ * fVar149;
            auVar84._0_4_ = auVar17._0_4_ * fVar233;
            fVar270 = auVar198._8_4_;
            auVar84._8_4_ = auVar17._8_4_ * fVar270;
            fVar261 = auVar198._12_4_;
            auVar84._12_4_ = auVar17._12_4_ * fVar261;
            fVar141 = auVar198._16_4_;
            auVar84._16_4_ = auVar17._16_4_ * fVar141;
            fVar314 = auVar198._20_4_;
            auVar84._20_4_ = auVar17._20_4_ * fVar314;
            fVar171 = auVar198._24_4_;
            auVar84._24_4_ = auVar17._24_4_ * fVar171;
            auVar84._28_4_ = auVar17._28_4_;
            auVar85._4_4_ = fVar300 * auVar24._4_4_;
            auVar85._0_4_ = fVar201 * auVar24._0_4_;
            auVar85._8_4_ = fVar259 * auVar24._8_4_;
            auVar85._12_4_ = fVar205 * auVar24._12_4_;
            auVar85._16_4_ = fVar140 * auVar24._16_4_;
            auVar85._20_4_ = fVar313 * auVar24._20_4_;
            auVar85._24_4_ = fVar170 * auVar24._24_4_;
            auVar85._28_4_ = auVar212._28_4_;
            auVar198 = vsubps_avx(auVar84,auVar85);
            auVar318 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar86._4_4_ = auVar325._4_4_ * fVar149;
            auVar86._0_4_ = auVar325._0_4_ * fVar233;
            auVar86._8_4_ = auVar325._8_4_ * fVar270;
            auVar86._12_4_ = auVar325._12_4_ * fVar261;
            auVar86._16_4_ = auVar325._16_4_ * fVar141;
            auVar86._20_4_ = auVar325._20_4_ * fVar314;
            auVar86._24_4_ = auVar325._24_4_ * fVar171;
            auVar86._28_4_ = auVar325._28_4_;
            auVar87._4_4_ = fVar246 * auVar24._4_4_;
            auVar87._0_4_ = fVar231 * auVar24._0_4_;
            auVar87._8_4_ = fVar203 * auVar24._8_4_;
            auVar87._12_4_ = fVar273 * auVar24._12_4_;
            auVar87._16_4_ = fVar121 * auVar24._16_4_;
            auVar87._20_4_ = fVar307 * auVar24._20_4_;
            auVar87._24_4_ = fVar169 * auVar24._24_4_;
            auVar87._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar87,auVar86);
            auVar325 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar135._0_4_ = auVar302._0_4_ * 0.0 + auVar24._0_4_ + auVar198._0_4_ * 0.0;
            auVar135._4_4_ = auVar302._4_4_ * 0.0 + auVar24._4_4_ + auVar198._4_4_ * 0.0;
            auVar135._8_4_ = auVar302._8_4_ * 0.0 + auVar24._8_4_ + auVar198._8_4_ * 0.0;
            auVar135._12_4_ = auVar302._12_4_ * 0.0 + auVar24._12_4_ + auVar198._12_4_ * 0.0;
            auVar135._16_4_ = auVar302._16_4_ * 0.0 + auVar24._16_4_ + auVar198._16_4_ * 0.0;
            auVar135._20_4_ = auVar302._20_4_ * 0.0 + auVar24._20_4_ + auVar198._20_4_ * 0.0;
            auVar135._24_4_ = auVar302._24_4_ * 0.0 + auVar24._24_4_ + auVar198._24_4_ * 0.0;
            auVar135._28_4_ = auVar198._28_4_ + auVar24._28_4_ + auVar198._28_4_;
            auVar139 = ZEXT3264(auVar135);
            auVar198 = vmaxps_avx(auVar291,auVar135);
            auVar198 = vcmpps_avx(auVar198,auVar325,2);
            auVar24 = _local_7a0 & auVar198;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0x7f,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0xbf,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar24[0x1f]) {
LAB_00ed50ae:
              auVar199 = ZEXT3264(CONCAT824(uStack_588,
                                            CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
              auVar299._4_4_ = fVar187;
              auVar299._0_4_ = fVar122;
              auVar299._8_4_ = fVar142;
              auVar299._12_4_ = fVar144;
              auVar299._16_4_ = fVar146;
              auVar299._20_4_ = fVar148;
              auVar299._24_4_ = fVar151;
              auVar299._28_4_ = fVar188;
            }
            else {
              auVar24 = vandps_avx(auVar198,_local_7a0);
              auVar88._4_4_ = fVar300 * fVar202;
              auVar88._0_4_ = fVar201 * fVar220;
              auVar88._8_4_ = fVar259 * fVar152;
              auVar88._12_4_ = fVar205 * fVar271;
              auVar88._16_4_ = fVar140 * fVar153;
              auVar88._20_4_ = fVar313 * fVar143;
              auVar88._24_4_ = fVar170 * fVar315;
              auVar88._28_4_ = local_7a0._28_4_;
              auVar89._4_4_ = fVar246 * fVar232;
              auVar89._0_4_ = fVar231 * fVar230;
              auVar89._8_4_ = fVar203 * fVar234;
              auVar89._12_4_ = fVar273 * fVar236;
              auVar89._16_4_ = fVar121 * fVar243;
              auVar89._20_4_ = fVar307 * fVar245;
              auVar89._24_4_ = fVar169 * fVar247;
              auVar89._28_4_ = auVar198._28_4_;
              auVar17 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar149 * fVar232;
              auVar90._0_4_ = fVar233 * fVar230;
              auVar90._8_4_ = fVar270 * fVar234;
              auVar90._12_4_ = fVar261 * fVar236;
              auVar90._16_4_ = fVar141 * fVar243;
              auVar90._20_4_ = fVar314 * fVar245;
              auVar90._24_4_ = fVar171 * fVar247;
              auVar90._28_4_ = auVar226._28_4_;
              auVar91._4_4_ = fVar300 * fVar244;
              auVar91._0_4_ = fVar201 * fVar200;
              auVar91._8_4_ = fVar259 * fVar269;
              auVar91._12_4_ = fVar205 * fVar272;
              auVar91._16_4_ = fVar140 * fVar298;
              auVar91._20_4_ = fVar313 * fVar150;
              auVar91._24_4_ = fVar170 * fVar168;
              auVar91._28_4_ = auVar289._28_4_;
              auVar212 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar246 * fVar244;
              auVar92._0_4_ = fVar231 * fVar200;
              auVar92._8_4_ = fVar203 * fVar269;
              auVar92._12_4_ = fVar273 * fVar272;
              auVar92._16_4_ = fVar121 * fVar298;
              auVar92._20_4_ = fVar307 * fVar150;
              auVar92._24_4_ = fVar169 * fVar168;
              auVar92._28_4_ = auVar193._28_4_;
              auVar93._4_4_ = fVar149 * fVar202;
              auVar93._0_4_ = fVar233 * fVar220;
              auVar93._8_4_ = fVar270 * fVar152;
              auVar93._12_4_ = fVar261 * fVar271;
              auVar93._16_4_ = fVar141 * fVar153;
              auVar93._20_4_ = fVar314 * fVar143;
              auVar93._24_4_ = fVar171 * fVar315;
              auVar93._28_4_ = auVar22._28_4_;
              auVar226 = vsubps_avx(auVar93,auVar92);
              auVar266._0_4_ = auVar17._0_4_ * 0.0 + auVar226._0_4_ + auVar212._0_4_ * 0.0;
              auVar266._4_4_ = auVar17._4_4_ * 0.0 + auVar226._4_4_ + auVar212._4_4_ * 0.0;
              auVar266._8_4_ = auVar17._8_4_ * 0.0 + auVar226._8_4_ + auVar212._8_4_ * 0.0;
              auVar266._12_4_ = auVar17._12_4_ * 0.0 + auVar226._12_4_ + auVar212._12_4_ * 0.0;
              auVar266._16_4_ = auVar17._16_4_ * 0.0 + auVar226._16_4_ + auVar212._16_4_ * 0.0;
              auVar266._20_4_ = auVar17._20_4_ * 0.0 + auVar226._20_4_ + auVar212._20_4_ * 0.0;
              auVar266._24_4_ = auVar17._24_4_ * 0.0 + auVar226._24_4_ + auVar212._24_4_ * 0.0;
              auVar266._28_4_ = auVar23._28_4_ + auVar226._28_4_ + auVar193._28_4_;
              auVar198 = vrcpps_avx(auVar266);
              fVar220 = auVar198._0_4_;
              fVar200 = auVar198._4_4_;
              auVar94._4_4_ = auVar266._4_4_ * fVar200;
              auVar94._0_4_ = auVar266._0_4_ * fVar220;
              fVar231 = auVar198._8_4_;
              auVar94._8_4_ = auVar266._8_4_ * fVar231;
              fVar201 = auVar198._12_4_;
              auVar94._12_4_ = auVar266._12_4_ * fVar201;
              fVar233 = auVar198._16_4_;
              auVar94._16_4_ = auVar266._16_4_ * fVar233;
              fVar202 = auVar198._20_4_;
              auVar94._20_4_ = auVar266._20_4_ * fVar202;
              fVar244 = auVar198._24_4_;
              auVar94._24_4_ = auVar266._24_4_ * fVar244;
              auVar94._28_4_ = auVar289._28_4_;
              auVar306._8_4_ = 0x3f800000;
              auVar306._0_8_ = 0x3f8000003f800000;
              auVar306._12_4_ = 0x3f800000;
              auVar306._16_4_ = 0x3f800000;
              auVar306._20_4_ = 0x3f800000;
              auVar306._24_4_ = 0x3f800000;
              auVar306._28_4_ = 0x3f800000;
              auVar198 = vsubps_avx(auVar306,auVar94);
              fVar220 = auVar198._0_4_ * fVar220 + fVar220;
              fVar200 = auVar198._4_4_ * fVar200 + fVar200;
              fVar231 = auVar198._8_4_ * fVar231 + fVar231;
              fVar201 = auVar198._12_4_ * fVar201 + fVar201;
              fVar233 = auVar198._16_4_ * fVar233 + fVar233;
              fVar202 = auVar198._20_4_ * fVar202 + fVar202;
              fVar244 = auVar198._24_4_ * fVar244 + fVar244;
              auVar95._4_4_ =
                   (fVar242 * auVar17._4_4_ + auVar212._4_4_ * fVar235 + fVar173 * auVar226._4_4_) *
                   fVar200;
              auVar95._0_4_ =
                   (fVar229 * auVar17._0_4_ + auVar212._0_4_ * fVar189 + fVar172 * auVar226._0_4_) *
                   fVar220;
              auVar95._8_4_ =
                   (fVar268 * auVar17._8_4_ + auVar212._8_4_ * fVar154 + fVar207 * auVar226._8_4_) *
                   fVar231;
              auVar95._12_4_ =
                   (fVar260 * auVar17._12_4_ + auVar212._12_4_ * fVar204 + fVar217 * auVar226._12_4_
                   ) * fVar201;
              auVar95._16_4_ =
                   (fVar206 * auVar17._16_4_ + auVar212._16_4_ * fVar248 + fVar218 * auVar226._16_4_
                   ) * fVar233;
              auVar95._20_4_ =
                   (fVar147 * auVar17._20_4_ + auVar212._20_4_ * fVar145 + fVar219 * auVar226._20_4_
                   ) * fVar202;
              auVar95._24_4_ =
                   (fVar167 * auVar17._24_4_ + auVar212._24_4_ * fVar155 + fVar221 * auVar226._24_4_
                   ) * fVar244;
              auVar95._28_4_ = auVar19._28_4_ + auVar226._28_4_;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar197._4_4_ = uVar8;
              auVar197._0_4_ = uVar8;
              auVar197._8_4_ = uVar8;
              auVar197._12_4_ = uVar8;
              auVar197._16_4_ = uVar8;
              auVar197._20_4_ = uVar8;
              auVar197._24_4_ = uVar8;
              auVar197._28_4_ = uVar8;
              auVar19 = vcmpps_avx(local_e0,auVar95,2);
              auVar198 = vcmpps_avx(auVar95,auVar197,2);
              auVar198 = vandps_avx(auVar19,auVar198);
              auVar289 = auVar24 & auVar198;
              if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar289 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar289 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar289 >> 0x7f,0) == '\0') &&
                    (auVar289 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar289 >> 0xbf,0) == '\0') &&
                  (auVar289 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar289[0x1f]) goto LAB_00ed50ae;
              auVar198 = vandps_avx(auVar24,auVar198);
              auVar289 = vcmpps_avx(auVar266,auVar325,4);
              auVar24 = auVar198 & auVar289;
              auVar199 = ZEXT3264(CONCAT824(uStack_588,
                                            CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
              auVar299._4_4_ = fVar187;
              auVar299._0_4_ = fVar122;
              auVar299._8_4_ = fVar142;
              auVar299._12_4_ = fVar144;
              auVar299._16_4_ = fVar146;
              auVar299._20_4_ = fVar148;
              auVar299._24_4_ = fVar151;
              auVar299._28_4_ = fVar188;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar198 = vandps_avx(auVar289,auVar198);
                auVar199 = ZEXT3264(auVar198);
                auVar96._4_4_ = auVar291._4_4_ * fVar200;
                auVar96._0_4_ = auVar291._0_4_ * fVar220;
                auVar96._8_4_ = auVar291._8_4_ * fVar231;
                auVar96._12_4_ = auVar291._12_4_ * fVar201;
                auVar96._16_4_ = auVar291._16_4_ * fVar233;
                auVar96._20_4_ = auVar291._20_4_ * fVar202;
                auVar96._24_4_ = auVar291._24_4_ * fVar244;
                auVar96._28_4_ = auVar19._28_4_;
                auVar97._4_4_ = auVar135._4_4_ * fVar200;
                auVar97._0_4_ = auVar135._0_4_ * fVar220;
                auVar97._8_4_ = auVar135._8_4_ * fVar231;
                auVar97._12_4_ = auVar135._12_4_ * fVar201;
                auVar97._16_4_ = auVar135._16_4_ * fVar233;
                auVar97._20_4_ = auVar135._20_4_ * fVar202;
                auVar97._24_4_ = auVar135._24_4_ * fVar244;
                auVar97._28_4_ = auVar135._28_4_;
                auVar241._8_4_ = 0x3f800000;
                auVar241._0_8_ = 0x3f8000003f800000;
                auVar241._12_4_ = 0x3f800000;
                auVar241._16_4_ = 0x3f800000;
                auVar241._20_4_ = 0x3f800000;
                auVar241._24_4_ = 0x3f800000;
                auVar241._28_4_ = 0x3f800000;
                auVar198 = vsubps_avx(auVar241,auVar96);
                _local_c0 = vblendvps_avx(auVar198,auVar96,auVar264);
                auVar198 = vsubps_avx(auVar241,auVar97);
                _local_3a0 = vblendvps_avx(auVar198,auVar97,auVar264);
                auVar139 = ZEXT3264(_local_3a0);
                local_520 = auVar95;
              }
            }
            auVar267 = ZEXT1664(auVar16);
            auVar198 = auVar199._0_32_;
            auVar292 = ZEXT3264(_local_540);
            fVar220 = (float)local_6c0._0_4_;
            fVar189 = (float)local_6c0._4_4_;
            fVar200 = fStack_6b8;
            fVar233 = fStack_6b4;
            fVar202 = fStack_6b0;
            fVar235 = fStack_6ac;
            fVar242 = fStack_6a8;
            if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar198 >> 0x7f,0) != '\0') ||
                  (auVar199 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar198 >> 0xbf,0) != '\0') ||
                (auVar199 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar199[0x1f] < '\0') {
              auVar19 = vsubps_avx(_local_580,auVar299);
              fVar231 = auVar299._0_4_ + auVar19._0_4_ * (float)local_c0._0_4_;
              fVar201 = auVar299._4_4_ + auVar19._4_4_ * (float)local_c0._4_4_;
              fVar244 = auVar299._8_4_ + auVar19._8_4_ * fStack_b8;
              fVar246 = auVar299._12_4_ + auVar19._12_4_ * fStack_b4;
              fVar300 = auVar299._16_4_ + auVar19._16_4_ * fStack_b0;
              fVar149 = auVar299._20_4_ + auVar19._20_4_ * fStack_ac;
              fVar152 = auVar299._24_4_ + auVar19._24_4_ * fStack_a8;
              fVar154 = auVar299._28_4_ + auVar19._28_4_;
              fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar98._4_4_ = (fVar201 + fVar201) * fVar229;
              auVar98._0_4_ = (fVar231 + fVar231) * fVar229;
              auVar98._8_4_ = (fVar244 + fVar244) * fVar229;
              auVar98._12_4_ = (fVar246 + fVar246) * fVar229;
              auVar98._16_4_ = (fVar300 + fVar300) * fVar229;
              auVar98._20_4_ = (fVar149 + fVar149) * fVar229;
              auVar98._24_4_ = (fVar152 + fVar152) * fVar229;
              auVar98._28_4_ = fVar154 + fVar154;
              auVar19 = vcmpps_avx(local_520,auVar98,6);
              auVar139 = ZEXT3264(auVar19);
              auVar289 = auVar198 & auVar19;
              if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar289 >> 0x7f,0) != '\0') ||
                    (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar289 >> 0xbf,0) != '\0') ||
                  (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar289[0x1f] < '\0') {
                local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
                local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
                uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
                uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
                uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
                uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
                uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
                uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
                local_2e0 = _local_c0;
                auVar110 = _local_3a0;
                auVar289 = _local_3a0;
                local_2c0 = (float)local_3a0._0_4_;
                fStack_2bc = (float)local_3a0._4_4_;
                fStack_2b8 = (float)uStack_398;
                fStack_2b4 = uStack_398._4_4_;
                fStack_2b0 = (float)uStack_390;
                fStack_2ac = uStack_390._4_4_;
                fStack_2a8 = (float)uStack_388;
                fStack_2a4 = uStack_388._4_4_;
                local_2a0 = local_520;
                local_27c = uVar11;
                local_270 = auVar16;
                local_260 = uVar99;
                uStack_258 = uVar100;
                local_250 = uVar111;
                uStack_248 = uVar112;
                local_240 = uVar113;
                uStack_238 = uVar114;
                pGVar118 = (context->scene->geometries).items[uVar115].ptr;
                _local_3a0 = auVar289;
                if ((pGVar118->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5e0 = vandps_avx(auVar19,auVar198);
                  auVar180._0_4_ = (float)(int)local_280;
                  auVar180._4_8_ = SUB128(ZEXT812(0),4);
                  auVar180._12_4_ = 0;
                  auVar225 = vshufps_avx(auVar180,auVar180,0);
                  local_200[0] = (auVar225._0_4_ + (float)local_c0._0_4_ + 0.0) *
                                 (float)local_100._0_4_;
                  local_200[1] = (auVar225._4_4_ + (float)local_c0._4_4_ + 1.0) *
                                 (float)local_100._4_4_;
                  local_200[2] = (auVar225._8_4_ + fStack_b8 + 2.0) * fStack_f8;
                  local_200[3] = (auVar225._12_4_ + fStack_b4 + 3.0) * fStack_f4;
                  fStack_1f0 = (auVar225._0_4_ + fStack_b0 + 4.0) * fStack_f0;
                  fStack_1ec = (auVar225._4_4_ + fStack_ac + 5.0) * fStack_ec;
                  fStack_1e8 = (auVar225._8_4_ + fStack_a8 + 6.0) * fStack_e8;
                  fStack_1e4 = auVar225._12_4_ + fStack_a4 + 7.0;
                  uStack_390 = auVar110._16_8_;
                  uStack_388 = auVar289._24_8_;
                  local_1e0 = local_3a0;
                  uStack_1d8 = uStack_398;
                  uStack_1d0 = uStack_390;
                  uStack_1c8 = uStack_388;
                  local_1c0 = local_520;
                  auVar164._8_4_ = 0x7f800000;
                  auVar164._0_8_ = 0x7f8000007f800000;
                  auVar164._12_4_ = 0x7f800000;
                  auVar164._16_4_ = 0x7f800000;
                  auVar164._20_4_ = 0x7f800000;
                  auVar164._24_4_ = 0x7f800000;
                  auVar164._28_4_ = 0x7f800000;
                  auVar198 = vblendvps_avx(auVar164,local_520,local_5e0);
                  auVar19 = vshufps_avx(auVar198,auVar198,0xb1);
                  auVar19 = vminps_avx(auVar198,auVar19);
                  auVar289 = vshufpd_avx(auVar19,auVar19,5);
                  auVar19 = vminps_avx(auVar19,auVar289);
                  auVar289 = vperm2f128_avx(auVar19,auVar19,1);
                  auVar19 = vminps_avx(auVar19,auVar289);
                  auVar19 = vcmpps_avx(auVar198,auVar19,0);
                  auVar289 = local_5e0 & auVar19;
                  auVar198 = local_5e0;
                  if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar289 >> 0x7f,0) != '\0') ||
                        (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar289 >> 0xbf,0) != '\0') ||
                      (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar289[0x1f] < '\0') {
                    auVar198 = vandps_avx(auVar19,local_5e0);
                  }
                  uVar116 = vmovmskps_avx(auVar198);
                  uVar14 = 0;
                  if (uVar116 != 0) {
                    for (; (uVar116 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  uVar117 = (ulong)uVar14;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar118->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_680._16_16_ = auVar196._16_16_;
                    local_680._0_16_ = *local_770;
                    _local_7a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    stack0xfffffffffffff848 = auVar227._8_24_;
                    local_7c0._0_8_ = pGVar118;
                    local_778 = context;
                    _local_740 = auVar310;
                    _local_720 = auVar137;
                    _local_640 = auVar186;
                    _local_500 = auVar132;
                    while( true ) {
                      local_400 = local_200[uVar117];
                      local_3f0 = *(undefined4 *)((long)&local_1e0 + uVar117 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar117 * 4)
                      ;
                      fVar189 = 1.0 - local_400;
                      fVar220 = local_400 * fVar189 * 4.0;
                      auVar225 = ZEXT416((uint)(local_400 * local_400 * 0.5));
                      auVar225 = vshufps_avx(auVar225,auVar225,0);
                      auVar181 = ZEXT416((uint)((fVar189 * fVar189 + fVar220) * 0.5));
                      auVar181 = vshufps_avx(auVar181,auVar181,0);
                      auVar211 = ZEXT416((uint)((-local_400 * local_400 - fVar220) * 0.5));
                      auVar211 = vshufps_avx(auVar211,auVar211,0);
                      local_7f0.context = context->user;
                      auVar192 = ZEXT416((uint)(fVar189 * -fVar189 * 0.5));
                      auVar192 = vshufps_avx(auVar192,auVar192,0);
                      auVar183._0_4_ =
                           local_8c0 * auVar192._0_4_ +
                           auVar211._0_4_ * local_850 +
                           auVar225._0_4_ * local_870 + auVar181._0_4_ * local_860;
                      auVar183._4_4_ =
                           fStack_8bc * auVar192._4_4_ +
                           auVar211._4_4_ * fStack_84c +
                           auVar225._4_4_ * fStack_86c + auVar181._4_4_ * fStack_85c;
                      auVar183._8_4_ =
                           fStack_8b8 * auVar192._8_4_ +
                           auVar211._8_4_ * fStack_848 +
                           auVar225._8_4_ * fStack_868 + auVar181._8_4_ * fStack_858;
                      auVar183._12_4_ =
                           fStack_8b4 * auVar192._12_4_ +
                           auVar211._12_4_ * fStack_844 +
                           auVar225._12_4_ * fStack_864 + auVar181._12_4_ * fStack_854;
                      auVar225 = vshufps_avx(auVar183,auVar183,0);
                      local_430[0] = (RTCHitN)auVar225[0];
                      local_430[1] = (RTCHitN)auVar225[1];
                      local_430[2] = (RTCHitN)auVar225[2];
                      local_430[3] = (RTCHitN)auVar225[3];
                      local_430[4] = (RTCHitN)auVar225[4];
                      local_430[5] = (RTCHitN)auVar225[5];
                      local_430[6] = (RTCHitN)auVar225[6];
                      local_430[7] = (RTCHitN)auVar225[7];
                      local_430[8] = (RTCHitN)auVar225[8];
                      local_430[9] = (RTCHitN)auVar225[9];
                      local_430[10] = (RTCHitN)auVar225[10];
                      local_430[0xb] = (RTCHitN)auVar225[0xb];
                      local_430[0xc] = (RTCHitN)auVar225[0xc];
                      local_430[0xd] = (RTCHitN)auVar225[0xd];
                      local_430[0xe] = (RTCHitN)auVar225[0xe];
                      local_430[0xf] = (RTCHitN)auVar225[0xf];
                      auVar225 = vshufps_avx(auVar183,auVar183,0x55);
                      local_420 = auVar225;
                      local_410 = vshufps_avx(auVar183,auVar183,0xaa);
                      fStack_3fc = local_400;
                      fStack_3f8 = local_400;
                      fStack_3f4 = local_400;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      local_3e0 = local_310._0_8_;
                      uStack_3d8 = local_310._8_8_;
                      local_3d0 = local_300._0_8_;
                      uStack_3c8 = local_300._8_8_;
                      vcmpps_avx(auVar318._0_32_,auVar318._0_32_,0xf);
                      uStack_3bc = (local_7f0.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_7f0.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_840 = local_680._0_16_;
                      local_7f0.valid = (int *)local_840;
                      local_7f0.geometryUserPtr = pGVar118->userPtr;
                      local_7f0.hit = local_430;
                      local_7f0.N = 4;
                      local_7f0.ray = (RTCRayN *)ray;
                      if (pGVar118->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar118->intersectionFilterN)(&local_7f0);
                        auVar318 = ZEXT1664(ZEXT816(0) << 0x40);
                        context = local_778;
                        pGVar118 = (Geometry *)local_7c0._0_8_;
                      }
                      if (local_840 == (undefined1  [16])0x0) {
                        auVar225 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar225 = auVar225 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar118->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_7f0);
                          auVar318 = ZEXT1664(ZEXT816(0) << 0x40);
                          context = local_778;
                          pGVar118 = (Geometry *)local_7c0._0_8_;
                        }
                        auVar181 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                        auVar211 = vpcmpeqd_avx(auVar225,auVar225);
                        auVar225 = auVar181 ^ auVar211;
                        if (local_840 != (undefined1  [16])0x0) {
                          auVar181 = auVar181 ^ auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])local_7f0.hit);
                          *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar211;
                          auVar211 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar211;
                          auVar181 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar181;
                        }
                      }
                      auVar196 = local_520;
                      auVar267 = ZEXT1664(auVar16);
                      auVar159._8_8_ = 0x100000001;
                      auVar159._0_8_ = 0x100000001;
                      if ((auVar159 & auVar225) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                        auVar225 = _local_7a0;
                      }
                      else {
                        auVar225 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_5e0 + uVar117 * 4) = 0;
                      _local_7a0 = auVar225;
                      auVar225 = vshufps_avx(auVar225,auVar225,0);
                      auVar136._16_16_ = auVar225;
                      auVar136._0_16_ = auVar225;
                      auVar137 = vcmpps_avx(auVar196,auVar136,2);
                      auVar132 = vandps_avx(auVar137,local_5e0);
                      local_5e0 = local_5e0 & auVar137;
                      prim = local_828;
                      pre = local_830;
                      auVar289 = _local_540;
                      if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_5e0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_5e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_5e0 >> 0x7f,0) == '\0') &&
                            (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_5e0 >> 0xbf,0) == '\0') &&
                          (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_5e0[0x1f]) break;
                      auVar165._8_4_ = 0x7f800000;
                      auVar165._0_8_ = 0x7f8000007f800000;
                      auVar165._12_4_ = 0x7f800000;
                      auVar165._16_4_ = 0x7f800000;
                      auVar165._20_4_ = 0x7f800000;
                      auVar165._24_4_ = 0x7f800000;
                      auVar165._28_4_ = 0x7f800000;
                      auVar137 = vblendvps_avx(auVar165,auVar196,auVar132);
                      auVar198 = vshufps_avx(auVar137,auVar137,0xb1);
                      auVar198 = vminps_avx(auVar137,auVar198);
                      auVar19 = vshufpd_avx(auVar198,auVar198,5);
                      auVar198 = vminps_avx(auVar198,auVar19);
                      auVar19 = vperm2f128_avx(auVar198,auVar198,1);
                      auVar198 = vminps_avx(auVar198,auVar19);
                      auVar198 = vcmpps_avx(auVar137,auVar198,0);
                      auVar19 = auVar132 & auVar198;
                      auVar137 = auVar132;
                      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar19 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar19 >> 0x7f,0) != '\0') ||
                            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0xbf,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar19[0x1f] < '\0') {
                        auVar137 = vandps_avx(auVar198,auVar132);
                      }
                      uVar116 = vmovmskps_avx(auVar137);
                      uVar14 = 0;
                      if (uVar116 != 0) {
                        for (; (uVar116 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                        }
                      }
                      uVar117 = (ulong)uVar14;
                      local_5e0 = auVar132;
                    }
                    goto LAB_00ed4728;
                  }
                  fVar229 = local_200[uVar117];
                  auVar139 = ZEXT464((uint)fVar229);
                  uVar8 = *(undefined4 *)((long)&local_1e0 + uVar117 * 4);
                  fVar201 = 1.0 - fVar229;
                  fVar231 = fVar229 * fVar201 * 4.0;
                  auVar225 = ZEXT416((uint)(fVar229 * fVar229 * 0.5));
                  auVar225 = vshufps_avx(auVar225,auVar225,0);
                  auVar181 = ZEXT416((uint)((fVar201 * fVar201 + fVar231) * 0.5));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar211 = ZEXT416((uint)((-fVar229 * fVar229 - fVar231) * 0.5));
                  auVar211 = vshufps_avx(auVar211,auVar211,0);
                  auVar192 = ZEXT416((uint)(fVar201 * -fVar201 * 0.5));
                  auVar192 = vshufps_avx(auVar192,auVar192,0);
                  auVar182._0_4_ =
                       local_8c0 * auVar192._0_4_ +
                       auVar211._0_4_ * local_850 +
                       auVar225._0_4_ * local_870 + auVar181._0_4_ * local_860;
                  auVar182._4_4_ =
                       fStack_8bc * auVar192._4_4_ +
                       auVar211._4_4_ * fStack_84c +
                       auVar225._4_4_ * fStack_86c + auVar181._4_4_ * fStack_85c;
                  auVar182._8_4_ =
                       fStack_8b8 * auVar192._8_4_ +
                       auVar211._8_4_ * fStack_848 +
                       auVar225._8_4_ * fStack_868 + auVar181._8_4_ * fStack_858;
                  auVar182._12_4_ =
                       fStack_8b4 * auVar192._12_4_ +
                       auVar211._12_4_ * fStack_844 +
                       auVar225._12_4_ * fStack_864 + auVar181._12_4_ * fStack_854;
                  auVar199 = ZEXT464(*(uint *)(local_1c0 + uVar117 * 4));
                  *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1c0 + uVar117 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = auVar182._0_4_;
                  uVar12 = vextractps_avx(auVar182,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
                  uVar12 = vextractps_avx(auVar182,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
                  *(float *)(ray + k * 4 + 0xf0) = fVar229;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                  *(uint *)(ray + k * 4 + 0x110) = uVar10;
                  *(uint *)(ray + k * 4 + 0x120) = uVar115;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
          lVar119 = lVar119 + 8;
          auVar318 = ZEXT3264(local_660);
          auVar255 = ZEXT3264(_local_6a0);
          fVar307 = (float)local_6e0._0_4_;
          fVar313 = (float)local_6e0._4_4_;
          fVar314 = fStack_6d8;
          fVar315 = fStack_6d4;
          fVar229 = fStack_6d0;
          fVar231 = fStack_6cc;
          fVar201 = fStack_6c8;
        } while ((int)lVar119 < (int)uVar11);
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar126._4_4_ = uVar8;
      auVar126._0_4_ = uVar8;
      auVar126._8_4_ = uVar8;
      auVar126._12_4_ = uVar8;
      auVar16 = vcmpps_avx(local_2f0,auVar126,2);
      uVar115 = vmovmskps_avx(auVar16);
      uVar115 = (uint)uVar120 & uVar115;
    } while (uVar115 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }